

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  long lVar22;
  long lVar23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  bool bVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar85;
  uint uVar86;
  ulong uVar87;
  uint uVar88;
  long lVar90;
  ulong uVar91;
  long lVar92;
  undefined1 auVar93 [8];
  long lVar94;
  float t1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar146;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vfloat4 a0_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  float fVar169;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar170;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar171;
  float fVar202;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar172;
  float fVar203;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar200;
  float fVar201;
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar226;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar225;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar230;
  float fVar242;
  float fVar243;
  vfloat4 b0;
  undefined1 auVar231 [16];
  float fVar244;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar241 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar253 [16];
  float fVar260;
  float fVar262;
  undefined1 auVar258 [32];
  float fVar261;
  undefined1 auVar259 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar301 [16];
  undefined1 auVar314 [32];
  __m128 a;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar320 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  float fVar341;
  float fVar342;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar343;
  float fVar355;
  undefined1 auVar348 [16];
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float in_register_0000151c;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar362;
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar369;
  float fVar370;
  undefined1 auVar368 [32];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  float fVar371;
  undefined1 auVar375 [16];
  float fVar377;
  float fVar378;
  float in_register_0000159c;
  undefined1 auVar376 [32];
  vfloat4 a0;
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  int local_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 auStack_4a8 [16];
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float fStack_480;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 auStack_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 auStack_428 [16];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  ulong local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 auStack_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  Primitive *local_2e8;
  ulong local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  uint auStack_278 [4];
  undefined8 local_268;
  float local_260;
  undefined8 local_25c;
  uint local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [32];
  float afStack_198 [8];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar89;
  undefined1 auVar199 [32];
  undefined1 auVar385 [32];
  
  PVar19 = prim[1];
  uVar87 = (ulong)(byte)PVar19;
  lVar90 = uVar87 * 0x25;
  fVar171 = *(float *)(prim + lVar90 + 0x12);
  auVar318 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar90 + 6));
  auVar231._0_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar231._4_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar231._8_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar231._12_4_ = fVar171 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar118._0_4_ = fVar171 * auVar318._0_4_;
  auVar118._4_4_ = fVar171 * auVar318._4_4_;
  auVar118._8_4_ = fVar171 * auVar318._8_4_;
  auVar118._12_4_ = fVar171 * auVar318._12_4_;
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 10)));
  auVar110._16_16_ = auVar318;
  auVar110._0_16_ = auVar131;
  auVar110 = vcvtdq2ps_avx(auVar110);
  lVar1 = uVar87 * 5;
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar163._16_16_ = auVar318;
  auVar163._0_16_ = auVar131;
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 10)));
  auVar26 = vcvtdq2ps_avx(auVar163);
  auVar192._16_16_ = auVar318;
  auVar192._0_16_ = auVar131;
  auVar27 = vcvtdq2ps_avx(auVar192);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xf + 6)));
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xf + 10)));
  auVar193._16_16_ = auVar318;
  auVar193._0_16_ = auVar131;
  auVar28 = vcvtdq2ps_avx(auVar193);
  lVar92 = (ulong)(byte)PVar19 * 0x10;
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar92 + 6)));
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar92 + 10)));
  auVar258._16_16_ = auVar318;
  auVar258._0_16_ = auVar131;
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar92 + uVar87 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar258);
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar92 + uVar87 + 10)));
  auVar274._16_16_ = auVar318;
  auVar274._0_16_ = auVar131;
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1a + 6)));
  auVar30 = vcvtdq2ps_avx(auVar274);
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1a + 10)));
  auVar275._16_16_ = auVar318;
  auVar275._0_16_ = auVar131;
  auVar31 = vcvtdq2ps_avx(auVar275);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1b + 6)));
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1b + 10)));
  auVar310._16_16_ = auVar318;
  auVar310._0_16_ = auVar131;
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1c + 6)));
  auVar318 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1c + 10)));
  auVar32 = vcvtdq2ps_avx(auVar310);
  auVar325._16_16_ = auVar318;
  auVar325._0_16_ = auVar131;
  auVar33 = vcvtdq2ps_avx(auVar325);
  auVar131 = vshufps_avx(auVar231,auVar231,0);
  auVar318 = vshufps_avx(auVar231,auVar231,0x55);
  auVar34 = vshufps_avx(auVar231,auVar231,0xaa);
  fVar171 = auVar34._0_4_;
  fVar208 = auVar34._4_4_;
  fVar146 = auVar34._8_4_;
  fVar200 = auVar34._12_4_;
  fVar169 = auVar318._0_4_;
  fVar172 = auVar318._4_4_;
  fVar201 = auVar318._8_4_;
  fVar225 = auVar318._12_4_;
  fVar203 = auVar131._0_4_;
  fVar202 = auVar131._4_4_;
  fVar226 = auVar131._8_4_;
  fVar170 = auVar131._12_4_;
  auVar349._0_4_ = fVar203 * auVar110._0_4_ + fVar169 * auVar26._0_4_ + fVar171 * auVar27._0_4_;
  auVar349._4_4_ = fVar202 * auVar110._4_4_ + fVar172 * auVar26._4_4_ + fVar208 * auVar27._4_4_;
  auVar349._8_4_ = fVar226 * auVar110._8_4_ + fVar201 * auVar26._8_4_ + fVar146 * auVar27._8_4_;
  auVar349._12_4_ = fVar170 * auVar110._12_4_ + fVar225 * auVar26._12_4_ + fVar200 * auVar27._12_4_;
  auVar349._16_4_ = fVar203 * auVar110._16_4_ + fVar169 * auVar26._16_4_ + fVar171 * auVar27._16_4_;
  auVar349._20_4_ = fVar202 * auVar110._20_4_ + fVar172 * auVar26._20_4_ + fVar208 * auVar27._20_4_;
  auVar349._24_4_ = fVar226 * auVar110._24_4_ + fVar201 * auVar26._24_4_ + fVar146 * auVar27._24_4_;
  auVar349._28_4_ = fVar225 + in_register_000015dc + in_register_0000151c;
  auVar336._0_4_ = fVar203 * auVar28._0_4_ + fVar169 * auVar29._0_4_ + auVar30._0_4_ * fVar171;
  auVar336._4_4_ = fVar202 * auVar28._4_4_ + fVar172 * auVar29._4_4_ + auVar30._4_4_ * fVar208;
  auVar336._8_4_ = fVar226 * auVar28._8_4_ + fVar201 * auVar29._8_4_ + auVar30._8_4_ * fVar146;
  auVar336._12_4_ = fVar170 * auVar28._12_4_ + fVar225 * auVar29._12_4_ + auVar30._12_4_ * fVar200;
  auVar336._16_4_ = fVar203 * auVar28._16_4_ + fVar169 * auVar29._16_4_ + auVar30._16_4_ * fVar171;
  auVar336._20_4_ = fVar202 * auVar28._20_4_ + fVar172 * auVar29._20_4_ + auVar30._20_4_ * fVar208;
  auVar336._24_4_ = fVar226 * auVar28._24_4_ + fVar201 * auVar29._24_4_ + auVar30._24_4_ * fVar146;
  auVar336._28_4_ = fVar225 + in_register_000015dc + in_register_0000159c;
  auVar241._0_4_ = fVar203 * auVar31._0_4_ + fVar169 * auVar32._0_4_ + auVar33._0_4_ * fVar171;
  auVar241._4_4_ = fVar202 * auVar31._4_4_ + fVar172 * auVar32._4_4_ + auVar33._4_4_ * fVar208;
  auVar241._8_4_ = fVar226 * auVar31._8_4_ + fVar201 * auVar32._8_4_ + auVar33._8_4_ * fVar146;
  auVar241._12_4_ = fVar170 * auVar31._12_4_ + fVar225 * auVar32._12_4_ + auVar33._12_4_ * fVar200;
  auVar241._16_4_ = fVar203 * auVar31._16_4_ + fVar169 * auVar32._16_4_ + auVar33._16_4_ * fVar171;
  auVar241._20_4_ = fVar202 * auVar31._20_4_ + fVar172 * auVar32._20_4_ + auVar33._20_4_ * fVar208;
  auVar241._24_4_ = fVar226 * auVar31._24_4_ + fVar201 * auVar32._24_4_ + auVar33._24_4_ * fVar146;
  auVar241._28_4_ = fVar170 + fVar225 + fVar200;
  auVar131 = vshufps_avx(auVar118,auVar118,0);
  auVar318 = vshufps_avx(auVar118,auVar118,0x55);
  auVar34 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar171 = auVar34._0_4_;
  fVar208 = auVar34._4_4_;
  fVar146 = auVar34._8_4_;
  fVar200 = auVar34._12_4_;
  fVar202 = auVar318._0_4_;
  fVar226 = auVar318._4_4_;
  fVar170 = auVar318._8_4_;
  fVar204 = auVar318._12_4_;
  fVar169 = auVar26._28_4_ + auVar27._28_4_;
  fVar172 = auVar131._0_4_;
  fVar201 = auVar131._4_4_;
  fVar225 = auVar131._8_4_;
  fVar203 = auVar131._12_4_;
  auVar141._0_4_ = fVar172 * auVar110._0_4_ + fVar202 * auVar26._0_4_ + fVar171 * auVar27._0_4_;
  auVar141._4_4_ = fVar201 * auVar110._4_4_ + fVar226 * auVar26._4_4_ + fVar208 * auVar27._4_4_;
  auVar141._8_4_ = fVar225 * auVar110._8_4_ + fVar170 * auVar26._8_4_ + fVar146 * auVar27._8_4_;
  auVar141._12_4_ = fVar203 * auVar110._12_4_ + fVar204 * auVar26._12_4_ + fVar200 * auVar27._12_4_;
  auVar141._16_4_ = fVar172 * auVar110._16_4_ + fVar202 * auVar26._16_4_ + fVar171 * auVar27._16_4_;
  auVar141._20_4_ = fVar201 * auVar110._20_4_ + fVar226 * auVar26._20_4_ + fVar208 * auVar27._20_4_;
  auVar141._24_4_ = fVar225 * auVar110._24_4_ + fVar170 * auVar26._24_4_ + fVar146 * auVar27._24_4_;
  auVar141._28_4_ = auVar110._28_4_ + fVar169;
  auVar111._0_4_ = fVar172 * auVar28._0_4_ + auVar30._0_4_ * fVar171 + fVar202 * auVar29._0_4_;
  auVar111._4_4_ = fVar201 * auVar28._4_4_ + auVar30._4_4_ * fVar208 + fVar226 * auVar29._4_4_;
  auVar111._8_4_ = fVar225 * auVar28._8_4_ + auVar30._8_4_ * fVar146 + fVar170 * auVar29._8_4_;
  auVar111._12_4_ = fVar203 * auVar28._12_4_ + auVar30._12_4_ * fVar200 + fVar204 * auVar29._12_4_;
  auVar111._16_4_ = fVar172 * auVar28._16_4_ + auVar30._16_4_ * fVar171 + fVar202 * auVar29._16_4_;
  auVar111._20_4_ = fVar201 * auVar28._20_4_ + auVar30._20_4_ * fVar208 + fVar226 * auVar29._20_4_;
  auVar111._24_4_ = fVar225 * auVar28._24_4_ + auVar30._24_4_ * fVar146 + fVar170 * auVar29._24_4_;
  auVar111._28_4_ = auVar110._28_4_ + auVar30._28_4_ + auVar27._28_4_;
  auVar194._8_4_ = 0x7fffffff;
  auVar194._0_8_ = 0x7fffffff7fffffff;
  auVar194._12_4_ = 0x7fffffff;
  auVar194._16_4_ = 0x7fffffff;
  auVar194._20_4_ = 0x7fffffff;
  auVar194._24_4_ = 0x7fffffff;
  auVar194._28_4_ = 0x7fffffff;
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  auVar221._16_4_ = 0x219392ef;
  auVar221._20_4_ = 0x219392ef;
  auVar221._24_4_ = 0x219392ef;
  auVar221._28_4_ = 0x219392ef;
  auVar110 = vandps_avx(auVar349,auVar194);
  auVar110 = vcmpps_avx(auVar110,auVar221,1);
  auVar26 = vblendvps_avx(auVar349,auVar221,auVar110);
  auVar110 = vandps_avx(auVar336,auVar194);
  auVar110 = vcmpps_avx(auVar110,auVar221,1);
  auVar27 = vblendvps_avx(auVar336,auVar221,auVar110);
  auVar110 = vandps_avx(auVar241,auVar194);
  auVar110 = vcmpps_avx(auVar110,auVar221,1);
  auVar110 = vblendvps_avx(auVar241,auVar221,auVar110);
  auVar164._0_4_ = fVar172 * auVar31._0_4_ + fVar202 * auVar32._0_4_ + auVar33._0_4_ * fVar171;
  auVar164._4_4_ = fVar201 * auVar31._4_4_ + fVar226 * auVar32._4_4_ + auVar33._4_4_ * fVar208;
  auVar164._8_4_ = fVar225 * auVar31._8_4_ + fVar170 * auVar32._8_4_ + auVar33._8_4_ * fVar146;
  auVar164._12_4_ = fVar203 * auVar31._12_4_ + fVar204 * auVar32._12_4_ + auVar33._12_4_ * fVar200;
  auVar164._16_4_ = fVar172 * auVar31._16_4_ + fVar202 * auVar32._16_4_ + auVar33._16_4_ * fVar171;
  auVar164._20_4_ = fVar201 * auVar31._20_4_ + fVar226 * auVar32._20_4_ + auVar33._20_4_ * fVar208;
  auVar164._24_4_ = fVar225 * auVar31._24_4_ + fVar170 * auVar32._24_4_ + auVar33._24_4_ * fVar146;
  auVar164._28_4_ = fVar169 + auVar29._28_4_ + fVar200;
  auVar28 = vrcpps_avx(auVar26);
  fVar171 = auVar28._0_4_;
  fVar200 = auVar28._4_4_;
  auVar29._4_4_ = auVar26._4_4_ * fVar200;
  auVar29._0_4_ = auVar26._0_4_ * fVar171;
  fVar201 = auVar28._8_4_;
  auVar29._8_4_ = auVar26._8_4_ * fVar201;
  fVar202 = auVar28._12_4_;
  auVar29._12_4_ = auVar26._12_4_ * fVar202;
  fVar204 = auVar28._16_4_;
  auVar29._16_4_ = auVar26._16_4_ * fVar204;
  fVar206 = auVar28._20_4_;
  auVar29._20_4_ = auVar26._20_4_ * fVar206;
  fVar207 = auVar28._24_4_;
  auVar29._24_4_ = auVar26._24_4_ * fVar207;
  auVar29._28_4_ = 0x219392ef;
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = &DAT_3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar276._16_4_ = 0x3f800000;
  auVar276._20_4_ = 0x3f800000;
  auVar276._24_4_ = 0x3f800000;
  auVar276._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar276,auVar29);
  auVar29 = vrcpps_avx(auVar27);
  fVar171 = fVar171 + fVar171 * auVar30._0_4_;
  fVar200 = fVar200 + fVar200 * auVar30._4_4_;
  fVar201 = fVar201 + fVar201 * auVar30._8_4_;
  fVar202 = fVar202 + fVar202 * auVar30._12_4_;
  fVar204 = fVar204 + fVar204 * auVar30._16_4_;
  fVar206 = fVar206 + fVar206 * auVar30._20_4_;
  fVar207 = fVar207 + fVar207 * auVar30._24_4_;
  fVar208 = auVar29._0_4_;
  fVar169 = auVar29._4_4_;
  auVar26._4_4_ = auVar27._4_4_ * fVar169;
  auVar26._0_4_ = auVar27._0_4_ * fVar208;
  fVar225 = auVar29._8_4_;
  auVar26._8_4_ = auVar27._8_4_ * fVar225;
  fVar226 = auVar29._12_4_;
  auVar26._12_4_ = auVar27._12_4_ * fVar226;
  fVar227 = auVar29._16_4_;
  auVar26._16_4_ = auVar27._16_4_ * fVar227;
  fVar228 = auVar29._20_4_;
  auVar26._20_4_ = auVar27._20_4_ * fVar228;
  fVar229 = auVar29._24_4_;
  auVar26._24_4_ = auVar27._24_4_ * fVar229;
  auVar26._28_4_ = auVar30._28_4_;
  auVar27 = vsubps_avx(auVar276,auVar26);
  fVar208 = fVar208 + fVar208 * auVar27._0_4_;
  fVar169 = fVar169 + fVar169 * auVar27._4_4_;
  fVar225 = fVar225 + fVar225 * auVar27._8_4_;
  fVar226 = fVar226 + fVar226 * auVar27._12_4_;
  fVar227 = fVar227 + fVar227 * auVar27._16_4_;
  fVar228 = fVar228 + fVar228 * auVar27._20_4_;
  fVar229 = fVar229 + fVar229 * auVar27._24_4_;
  auVar26 = vrcpps_avx(auVar110);
  fVar230 = auVar26._0_4_;
  fVar242 = auVar26._4_4_;
  auVar31._4_4_ = fVar242 * auVar110._4_4_;
  auVar31._0_4_ = fVar230 * auVar110._0_4_;
  fVar243 = auVar26._8_4_;
  auVar31._8_4_ = fVar243 * auVar110._8_4_;
  fVar244 = auVar26._12_4_;
  auVar31._12_4_ = fVar244 * auVar110._12_4_;
  fVar245 = auVar26._16_4_;
  auVar31._16_4_ = fVar245 * auVar110._16_4_;
  fVar246 = auVar26._20_4_;
  auVar31._20_4_ = fVar246 * auVar110._20_4_;
  fVar247 = auVar26._24_4_;
  auVar31._24_4_ = fVar247 * auVar110._24_4_;
  auVar31._28_4_ = auVar110._28_4_;
  auVar110 = vsubps_avx(auVar276,auVar31);
  fVar230 = fVar230 + fVar230 * auVar110._0_4_;
  fVar242 = fVar242 + fVar242 * auVar110._4_4_;
  fVar243 = fVar243 + fVar243 * auVar110._8_4_;
  fVar244 = fVar244 + fVar244 * auVar110._12_4_;
  fVar245 = fVar245 + fVar245 * auVar110._16_4_;
  fVar246 = fVar246 + fVar246 * auVar110._20_4_;
  fVar247 = fVar247 + fVar247 * auVar110._24_4_;
  auVar131 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar90 + 0x16)) * *(float *)(prim + lVar90 + 0x1a)));
  auVar188 = vshufps_avx(auVar131,auVar131,0);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar131 = vpmovsxwd_avx(auVar131);
  auVar318._8_8_ = 0;
  auVar318._0_8_ = *(ulong *)(prim + uVar87 * 7 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar318);
  auVar277._16_16_ = auVar318;
  auVar277._0_16_ = auVar131;
  auVar110 = vcvtdq2ps_avx(auVar277);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar131 = vpmovsxwd_avx(auVar34);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 0xe);
  auVar318 = vpmovsxwd_avx(auVar130);
  auVar294._16_16_ = auVar318;
  auVar294._0_16_ = auVar131;
  auVar26 = vcvtdq2ps_avx(auVar294);
  auVar26 = vsubps_avx(auVar26,auVar110);
  fVar146 = auVar188._0_4_;
  fVar172 = auVar188._4_4_;
  fVar203 = auVar188._8_4_;
  fVar170 = auVar188._12_4_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar131 = vpmovsxwd_avx(auVar188);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar87 * 9 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar138);
  auVar278._0_4_ = auVar26._0_4_ * fVar146 + auVar110._0_4_;
  auVar278._4_4_ = auVar26._4_4_ * fVar172 + auVar110._4_4_;
  auVar278._8_4_ = auVar26._8_4_ * fVar203 + auVar110._8_4_;
  auVar278._12_4_ = auVar26._12_4_ * fVar170 + auVar110._12_4_;
  auVar278._16_4_ = auVar26._16_4_ * fVar146 + auVar110._16_4_;
  auVar278._20_4_ = auVar26._20_4_ * fVar172 + auVar110._20_4_;
  auVar278._24_4_ = auVar26._24_4_ * fVar203 + auVar110._24_4_;
  auVar278._28_4_ = auVar26._28_4_ + auVar110._28_4_;
  auVar295._16_16_ = auVar318;
  auVar295._0_16_ = auVar131;
  auVar110 = vcvtdq2ps_avx(auVar295);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 6);
  auVar131 = vpmovsxwd_avx(auVar129);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 0xe);
  auVar318 = vpmovsxwd_avx(auVar108);
  auVar311._16_16_ = auVar318;
  auVar311._0_16_ = auVar131;
  auVar26 = vcvtdq2ps_avx(auVar311);
  auVar26 = vsubps_avx(auVar26,auVar110);
  auVar374._8_8_ = 0;
  auVar374._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 6);
  auVar131 = vpmovsxwd_avx(auVar374);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar205);
  auVar296._0_4_ = auVar110._0_4_ + auVar26._0_4_ * fVar146;
  auVar296._4_4_ = auVar110._4_4_ + auVar26._4_4_ * fVar172;
  auVar296._8_4_ = auVar110._8_4_ + auVar26._8_4_ * fVar203;
  auVar296._12_4_ = auVar110._12_4_ + auVar26._12_4_ * fVar170;
  auVar296._16_4_ = auVar110._16_4_ + auVar26._16_4_ * fVar146;
  auVar296._20_4_ = auVar110._20_4_ + auVar26._20_4_ * fVar172;
  auVar296._24_4_ = auVar110._24_4_ + auVar26._24_4_ * fVar203;
  auVar296._28_4_ = auVar110._28_4_ + auVar26._28_4_;
  auVar312._16_16_ = auVar318;
  auVar312._0_16_ = auVar131;
  auVar110 = vcvtdq2ps_avx(auVar312);
  uVar91 = (ulong)(uint)((int)lVar1 << 2);
  lVar90 = uVar87 * 2 + uVar91;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar131 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar7);
  auVar326._16_16_ = auVar318;
  auVar326._0_16_ = auVar131;
  auVar26 = vcvtdq2ps_avx(auVar326);
  auVar26 = vsubps_avx(auVar26,auVar110);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *(ulong *)(prim + uVar91 + 6);
  auVar131 = vpmovsxwd_avx(auVar270);
  auVar313._0_4_ = auVar110._0_4_ + auVar26._0_4_ * fVar146;
  auVar313._4_4_ = auVar110._4_4_ + auVar26._4_4_ * fVar172;
  auVar313._8_4_ = auVar110._8_4_ + auVar26._8_4_ * fVar203;
  auVar313._12_4_ = auVar110._12_4_ + auVar26._12_4_ * fVar170;
  auVar313._16_4_ = auVar110._16_4_ + auVar26._16_4_ * fVar146;
  auVar313._20_4_ = auVar110._20_4_ + auVar26._20_4_ * fVar172;
  auVar313._24_4_ = auVar110._24_4_ + auVar26._24_4_ * fVar203;
  auVar313._28_4_ = auVar110._28_4_ + auVar26._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar91 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar8);
  auVar327._16_16_ = auVar318;
  auVar327._0_16_ = auVar131;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar87 * 0x18 + 6);
  auVar131 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar87 * 0x18 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar10);
  auVar110 = vcvtdq2ps_avx(auVar327);
  auVar337._16_16_ = auVar318;
  auVar337._0_16_ = auVar131;
  auVar26 = vcvtdq2ps_avx(auVar337);
  auVar26 = vsubps_avx(auVar26,auVar110);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar87 * 0x1d + 6);
  auVar131 = vpmovsxwd_avx(auVar11);
  auVar328._0_4_ = auVar110._0_4_ + auVar26._0_4_ * fVar146;
  auVar328._4_4_ = auVar110._4_4_ + auVar26._4_4_ * fVar172;
  auVar328._8_4_ = auVar110._8_4_ + auVar26._8_4_ * fVar203;
  auVar328._12_4_ = auVar110._12_4_ + auVar26._12_4_ * fVar170;
  auVar328._16_4_ = auVar110._16_4_ + auVar26._16_4_ * fVar146;
  auVar328._20_4_ = auVar110._20_4_ + auVar26._20_4_ * fVar172;
  auVar328._24_4_ = auVar110._24_4_ + auVar26._24_4_ * fVar203;
  auVar328._28_4_ = auVar110._28_4_ + auVar26._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar87 * 0x1d + 0xe);
  auVar318 = vpmovsxwd_avx(auVar12);
  auVar338._16_16_ = auVar318;
  auVar338._0_16_ = auVar131;
  auVar110 = vcvtdq2ps_avx(auVar338);
  lVar90 = uVar87 + (ulong)(byte)PVar19 * 0x20;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar131 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar14);
  auVar350._16_16_ = auVar318;
  auVar350._0_16_ = auVar131;
  auVar26 = vcvtdq2ps_avx(auVar350);
  auVar26 = vsubps_avx(auVar26,auVar110);
  auVar339._0_4_ = auVar110._0_4_ + auVar26._0_4_ * fVar146;
  auVar339._4_4_ = auVar110._4_4_ + auVar26._4_4_ * fVar172;
  auVar339._8_4_ = auVar110._8_4_ + auVar26._8_4_ * fVar203;
  auVar339._12_4_ = auVar110._12_4_ + auVar26._12_4_ * fVar170;
  auVar339._16_4_ = auVar110._16_4_ + auVar26._16_4_ * fVar146;
  auVar339._20_4_ = auVar110._20_4_ + auVar26._20_4_ * fVar172;
  auVar339._24_4_ = auVar110._24_4_ + auVar26._24_4_ * fVar203;
  auVar339._28_4_ = auVar110._28_4_ + auVar26._28_4_;
  lVar90 = (ulong)(byte)PVar19 * 0x20 - uVar87;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar131 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar16);
  auVar351._16_16_ = auVar318;
  auVar351._0_16_ = auVar131;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar87 * 0x23 + 6);
  auVar131 = vpmovsxwd_avx(auVar17);
  local_2e8 = prim;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar87 * 0x23 + 0xe);
  auVar318 = vpmovsxwd_avx(auVar18);
  auVar110 = vcvtdq2ps_avx(auVar351);
  auVar366._16_16_ = auVar318;
  auVar366._0_16_ = auVar131;
  auVar26 = vcvtdq2ps_avx(auVar366);
  auVar26 = vsubps_avx(auVar26,auVar110);
  auVar352._0_4_ = auVar110._0_4_ + auVar26._0_4_ * fVar146;
  auVar352._4_4_ = auVar110._4_4_ + auVar26._4_4_ * fVar172;
  auVar352._8_4_ = auVar110._8_4_ + auVar26._8_4_ * fVar203;
  auVar352._12_4_ = auVar110._12_4_ + auVar26._12_4_ * fVar170;
  auVar352._16_4_ = auVar110._16_4_ + auVar26._16_4_ * fVar146;
  auVar352._20_4_ = auVar110._20_4_ + auVar26._20_4_ * fVar172;
  auVar352._24_4_ = auVar110._24_4_ + auVar26._24_4_ * fVar203;
  auVar352._28_4_ = auVar110._28_4_ + fVar170;
  auVar110 = vsubps_avx(auVar278,auVar141);
  auVar248._0_4_ = fVar171 * auVar110._0_4_;
  auVar248._4_4_ = fVar200 * auVar110._4_4_;
  auVar248._8_4_ = fVar201 * auVar110._8_4_;
  auVar248._12_4_ = fVar202 * auVar110._12_4_;
  auVar32._16_4_ = fVar204 * auVar110._16_4_;
  auVar32._0_16_ = auVar248;
  auVar32._20_4_ = fVar206 * auVar110._20_4_;
  auVar32._24_4_ = fVar207 * auVar110._24_4_;
  auVar32._28_4_ = auVar110._28_4_;
  auVar110 = vsubps_avx(auVar296,auVar141);
  auVar173._0_4_ = fVar171 * auVar110._0_4_;
  auVar173._4_4_ = fVar200 * auVar110._4_4_;
  auVar173._8_4_ = fVar201 * auVar110._8_4_;
  auVar173._12_4_ = fVar202 * auVar110._12_4_;
  auVar33._16_4_ = fVar204 * auVar110._16_4_;
  auVar33._0_16_ = auVar173;
  auVar33._20_4_ = fVar206 * auVar110._20_4_;
  auVar33._24_4_ = fVar207 * auVar110._24_4_;
  auVar33._28_4_ = auVar28._28_4_ + auVar30._28_4_;
  auVar110 = vsubps_avx(auVar313,auVar111);
  auVar119._0_4_ = fVar208 * auVar110._0_4_;
  auVar119._4_4_ = fVar169 * auVar110._4_4_;
  auVar119._8_4_ = fVar225 * auVar110._8_4_;
  auVar119._12_4_ = fVar226 * auVar110._12_4_;
  auVar28._16_4_ = fVar227 * auVar110._16_4_;
  auVar28._0_16_ = auVar119;
  auVar28._20_4_ = fVar228 * auVar110._20_4_;
  auVar28._24_4_ = fVar229 * auVar110._24_4_;
  auVar28._28_4_ = auVar110._28_4_;
  auVar110 = vsubps_avx(auVar328,auVar111);
  auVar209._0_4_ = fVar208 * auVar110._0_4_;
  auVar209._4_4_ = fVar169 * auVar110._4_4_;
  auVar209._8_4_ = fVar225 * auVar110._8_4_;
  auVar209._12_4_ = fVar226 * auVar110._12_4_;
  auVar30._16_4_ = fVar227 * auVar110._16_4_;
  auVar30._0_16_ = auVar209;
  auVar30._20_4_ = fVar228 * auVar110._20_4_;
  auVar30._24_4_ = fVar229 * auVar110._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar27._28_4_;
  auVar110 = vsubps_avx(auVar339,auVar164);
  auVar95._0_4_ = fVar230 * auVar110._0_4_;
  auVar95._4_4_ = fVar242 * auVar110._4_4_;
  auVar95._8_4_ = fVar243 * auVar110._8_4_;
  auVar95._12_4_ = fVar244 * auVar110._12_4_;
  auVar27._16_4_ = fVar245 * auVar110._16_4_;
  auVar27._0_16_ = auVar95;
  auVar27._20_4_ = fVar246 * auVar110._20_4_;
  auVar27._24_4_ = fVar247 * auVar110._24_4_;
  auVar27._28_4_ = auVar110._28_4_;
  auVar110 = vsubps_avx(auVar352,auVar164);
  auVar147._0_4_ = fVar230 * auVar110._0_4_;
  auVar147._4_4_ = fVar242 * auVar110._4_4_;
  auVar147._8_4_ = fVar243 * auVar110._8_4_;
  auVar147._12_4_ = fVar244 * auVar110._12_4_;
  auVar35._16_4_ = fVar245 * auVar110._16_4_;
  auVar35._0_16_ = auVar147;
  auVar35._20_4_ = fVar246 * auVar110._20_4_;
  auVar35._24_4_ = fVar247 * auVar110._24_4_;
  auVar35._28_4_ = auVar110._28_4_;
  auVar131 = vpminsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar318 = vpminsd_avx(auVar248,auVar173);
  auVar297._16_16_ = auVar131;
  auVar297._0_16_ = auVar318;
  auVar131 = vpminsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar318 = vpminsd_avx(auVar119,auVar209);
  auVar340._16_16_ = auVar131;
  auVar340._0_16_ = auVar318;
  auVar110 = vmaxps_avx(auVar297,auVar340);
  auVar131 = vpminsd_avx(auVar27._16_16_,auVar35._16_16_);
  auVar318 = vpminsd_avx(auVar95,auVar147);
  auVar367._16_16_ = auVar131;
  auVar367._0_16_ = auVar318;
  uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar376._4_4_ = uVar3;
  auVar376._0_4_ = uVar3;
  auVar376._8_4_ = uVar3;
  auVar376._12_4_ = uVar3;
  auVar376._16_4_ = uVar3;
  auVar376._20_4_ = uVar3;
  auVar376._24_4_ = uVar3;
  auVar376._28_4_ = uVar3;
  auVar26 = vmaxps_avx(auVar367,auVar376);
  auVar110 = vmaxps_avx(auVar110,auVar26);
  local_178._4_4_ = auVar110._4_4_ * 0.99999964;
  local_178._0_4_ = auVar110._0_4_ * 0.99999964;
  local_178._8_4_ = auVar110._8_4_ * 0.99999964;
  local_178._12_4_ = auVar110._12_4_ * 0.99999964;
  local_178._16_4_ = auVar110._16_4_ * 0.99999964;
  local_178._20_4_ = auVar110._20_4_ * 0.99999964;
  local_178._24_4_ = auVar110._24_4_ * 0.99999964;
  local_178._28_4_ = auVar110._28_4_;
  auVar131 = vpmaxsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar318 = vpmaxsd_avx(auVar248,auVar173);
  auVar195._16_16_ = auVar131;
  auVar195._0_16_ = auVar318;
  auVar131 = vpmaxsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar318 = vpmaxsd_avx(auVar119,auVar209);
  auVar142._16_16_ = auVar131;
  auVar142._0_16_ = auVar318;
  auVar110 = vminps_avx(auVar195,auVar142);
  auVar131 = vpmaxsd_avx(auVar27._16_16_,auVar35._16_16_);
  auVar318 = vpmaxsd_avx(auVar95,auVar147);
  fVar171 = (ray->super_RayK<1>).tfar;
  auVar165._4_4_ = fVar171;
  auVar165._0_4_ = fVar171;
  auVar165._8_4_ = fVar171;
  auVar165._12_4_ = fVar171;
  auVar165._16_4_ = fVar171;
  auVar165._20_4_ = fVar171;
  auVar165._24_4_ = fVar171;
  auVar165._28_4_ = fVar171;
  auVar112._16_16_ = auVar131;
  auVar112._0_16_ = auVar318;
  auVar26 = vminps_avx(auVar112,auVar165);
  auVar110 = vminps_avx(auVar110,auVar26);
  auVar36._4_4_ = auVar110._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar110._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar110._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar110._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar110._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar110._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar110._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar110._28_4_;
  auVar110 = vcmpps_avx(local_178,auVar36,2);
  auVar131 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar143._16_16_ = auVar131;
  auVar143._0_16_ = auVar131;
  auVar26 = vcvtdq2ps_avx(auVar143);
  auVar26 = vcmpps_avx(_DAT_02020f40,auVar26,1);
  auVar110 = vandps_avx(auVar110,auVar26);
  uVar85 = vmovmskps_avx(auVar110);
  if (uVar85 == 0) {
    return;
  }
  auVar113._16_16_ = mm_lookupmask_ps._240_16_;
  auVar113._0_16_ = mm_lookupmask_ps._240_16_;
  uVar85 = uVar85 & 0xff;
  local_1b8 = vblendps_avx(auVar113,ZEXT832(0) << 0x20,0x80);
LAB_0129a532:
  lVar90 = 0;
  if ((ulong)uVar85 != 0) {
    for (; (uVar85 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
    }
  }
  auVar93 = (undefined1  [8])(ulong)*(uint *)(local_2e8 + 2);
  pGVar20 = (context->scene->geometries).items[(long)auVar93].ptr;
  fVar171 = (pGVar20->time_range).lower;
  fVar171 = pGVar20->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar171) /
            ((pGVar20->time_range).upper - fVar171));
  auVar131 = vroundss_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),9);
  auVar131 = vminss_avx(auVar131,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
  auVar131 = vmaxss_avx(ZEXT816(0) << 0x20,auVar131);
  local_3d0 = (ulong)*(uint *)(local_2e8 + lVar90 * 4 + 6);
  uVar87 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                           (ulong)*(uint *)(local_2e8 + lVar90 * 4 + 6) *
                           pGVar20[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar94 = (long)(int)auVar131._0_4_ * 0x38;
  lVar22 = *(long *)(_Var21 + lVar94);
  lVar23 = *(long *)(_Var21 + 0x10 + lVar94);
  pfVar2 = (float *)(lVar22 + lVar23 * uVar87);
  fVar208 = *pfVar2;
  fVar146 = pfVar2[1];
  fVar200 = pfVar2[2];
  fVar169 = pfVar2[3];
  lVar90 = uVar87 + 1;
  pfVar2 = (float *)(lVar22 + lVar23 * lVar90);
  fVar172 = *pfVar2;
  fVar201 = pfVar2[1];
  fVar225 = pfVar2[2];
  fVar203 = pfVar2[3];
  lVar1 = uVar87 + 2;
  pfVar2 = (float *)(lVar22 + lVar23 * lVar1);
  fVar202 = *pfVar2;
  fVar226 = pfVar2[1];
  fVar170 = pfVar2[2];
  fVar204 = pfVar2[3];
  lVar92 = uVar87 + 3;
  pfVar2 = (float *)(lVar22 + lVar23 * lVar92);
  fVar227 = *pfVar2;
  fVar206 = pfVar2[1];
  fVar228 = pfVar2[2];
  fVar207 = pfVar2[3];
  lVar22 = *(long *)&pGVar20[4].fnumTimeSegments;
  lVar23 = *(long *)(lVar22 + lVar94);
  lVar24 = *(long *)(lVar22 + 0x10 + lVar94);
  pfVar2 = (float *)(lVar23 + lVar24 * uVar87);
  fVar229 = *pfVar2;
  fVar230 = pfVar2[1];
  fVar242 = pfVar2[2];
  fVar243 = pfVar2[3];
  pfVar2 = (float *)(lVar23 + lVar24 * lVar90);
  fVar244 = *pfVar2;
  fVar245 = pfVar2[1];
  fVar246 = pfVar2[2];
  fVar247 = pfVar2[3];
  pfVar2 = (float *)(lVar23 + lVar24 * lVar1);
  fVar341 = *pfVar2;
  fVar342 = pfVar2[1];
  fVar260 = pfVar2[2];
  fVar343 = pfVar2[3];
  fVar171 = fVar171 - auVar131._0_4_;
  pfVar2 = (float *)(lVar23 + lVar24 * lVar92);
  fVar261 = *pfVar2;
  fVar353 = pfVar2[1];
  fVar262 = pfVar2[2];
  fVar354 = pfVar2[3];
  auVar96._0_4_ = fVar172 * 0.0 + fVar202 * 0.5 + fVar227 * 0.0;
  auVar96._4_4_ = fVar201 * 0.0 + fVar226 * 0.5 + fVar206 * 0.0;
  auVar96._8_4_ = fVar225 * 0.0 + fVar170 * 0.5 + fVar228 * 0.0;
  auVar96._12_4_ = fVar203 * 0.0 + fVar204 * 0.5 + fVar207 * 0.0;
  auVar148._0_4_ = fVar208 * 0.5;
  auVar148._4_4_ = fVar146 * 0.5;
  auVar148._8_4_ = fVar200 * 0.5;
  auVar148._12_4_ = fVar169 * 0.5;
  auVar129 = vsubps_avx(auVar96,auVar148);
  auVar97._0_4_ = fVar244 * 0.0 + fVar341 * 0.5 + fVar261 * 0.0;
  auVar97._4_4_ = fVar245 * 0.0 + fVar342 * 0.5 + fVar353 * 0.0;
  auVar97._8_4_ = fVar246 * 0.0 + fVar260 * 0.5 + fVar262 * 0.0;
  auVar97._12_4_ = fVar247 * 0.0 + fVar343 * 0.5 + fVar354 * 0.0;
  auVar372._0_4_ = fVar229 * 0.5;
  auVar372._4_4_ = fVar230 * 0.5;
  auVar372._8_4_ = fVar242 * 0.5;
  auVar372._12_4_ = fVar243 * 0.5;
  auVar130 = vsubps_avx(auVar97,auVar372);
  local_4d8._0_4_ = fVar208 * -0.0 + fVar202 * 0.0 + fVar227 * -0.0 + fVar172;
  local_4d8._4_4_ = fVar146 * -0.0 + fVar226 * 0.0 + fVar206 * -0.0 + fVar201;
  fStack_4d0 = fVar200 * -0.0 + fVar170 * 0.0 + fVar228 * -0.0 + fVar225;
  fStack_4cc = fVar169 * -0.0 + fVar204 * 0.0 + fVar207 * -0.0 + fVar203;
  local_4b8._0_4_ = fVar208 * -0.0 + fVar172 * 0.0 + fVar202 + fVar227 * -0.0;
  local_4b8._4_4_ = fVar146 * -0.0 + fVar201 * 0.0 + fVar226 + fVar206 * -0.0;
  fStack_4b0 = fVar200 * -0.0 + fVar225 * 0.0 + fVar170 + fVar228 * -0.0;
  fStack_4ac = fVar169 * -0.0 + fVar203 * 0.0 + fVar204 + fVar207 * -0.0;
  auVar280._0_4_ = fVar202 * 0.0 + fVar227 * 0.5;
  auVar280._4_4_ = fVar226 * 0.0 + fVar206 * 0.5;
  auVar280._8_4_ = fVar170 * 0.0 + fVar228 * 0.5;
  auVar280._12_4_ = fVar204 * 0.0 + fVar207 * 0.5;
  auVar210._0_4_ = fVar172 * 0.5;
  auVar210._4_4_ = fVar201 * 0.5;
  auVar210._8_4_ = fVar225 * 0.5;
  auVar210._12_4_ = fVar203 * 0.5;
  auVar131 = vsubps_avx(auVar280,auVar210);
  auVar379._0_4_ = fVar229 * -0.0 + fVar341 * 0.0 + fVar261 * -0.0 + fVar244;
  auVar379._4_4_ = fVar230 * -0.0 + fVar342 * 0.0 + fVar353 * -0.0 + fVar245;
  auVar379._8_4_ = fVar242 * -0.0 + fVar260 * 0.0 + fVar262 * -0.0 + fVar246;
  auVar379._12_4_ = fVar243 * -0.0 + fVar343 * 0.0 + fVar354 * -0.0 + fVar247;
  auVar300._0_4_ = fVar208 * 0.0 + auVar131._0_4_;
  auVar300._4_4_ = fVar146 * 0.0 + auVar131._4_4_;
  auVar300._8_4_ = fVar200 * 0.0 + auVar131._8_4_;
  auVar300._12_4_ = fVar169 * 0.0 + auVar131._12_4_;
  auVar174._0_4_ = fVar229 * -0.0 + fVar244 * 0.0 + fVar341 + fVar261 * -0.0;
  auVar174._4_4_ = fVar230 * -0.0 + fVar245 * 0.0 + fVar342 + fVar353 * -0.0;
  auVar174._8_4_ = fVar242 * -0.0 + fVar246 * 0.0 + fVar260 + fVar262 * -0.0;
  auVar174._12_4_ = fVar243 * -0.0 + fVar247 * 0.0 + fVar343 + fVar354 * -0.0;
  auVar211._0_4_ = fVar341 * 0.0 + fVar261 * 0.5;
  auVar211._4_4_ = fVar342 * 0.0 + fVar353 * 0.5;
  auVar211._8_4_ = fVar260 * 0.0 + fVar262 * 0.5;
  auVar211._12_4_ = fVar343 * 0.0 + fVar354 * 0.5;
  auVar263._0_4_ = fVar244 * 0.5;
  auVar263._4_4_ = fVar245 * 0.5;
  auVar263._8_4_ = fVar246 * 0.5;
  auVar263._12_4_ = fVar247 * 0.5;
  auVar131 = vsubps_avx(auVar211,auVar263);
  auVar212._0_4_ = fVar229 * 0.0 + auVar131._0_4_;
  auVar212._4_4_ = fVar230 * 0.0 + auVar131._4_4_;
  auVar212._8_4_ = fVar242 * 0.0 + auVar131._8_4_;
  auVar212._12_4_ = fVar243 * 0.0 + auVar131._12_4_;
  auVar131 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar318 = vshufps_avx(auVar379,auVar379,0xc9);
  fVar355 = auVar129._0_4_;
  auVar264._0_4_ = fVar355 * auVar318._0_4_;
  fVar356 = auVar129._4_4_;
  auVar264._4_4_ = fVar356 * auVar318._4_4_;
  fVar358 = auVar129._8_4_;
  auVar264._8_4_ = fVar358 * auVar318._8_4_;
  fVar362 = auVar129._12_4_;
  auVar264._12_4_ = fVar362 * auVar318._12_4_;
  auVar281._0_4_ = auVar379._0_4_ * auVar131._0_4_;
  auVar281._4_4_ = auVar379._4_4_ * auVar131._4_4_;
  auVar281._8_4_ = auVar379._8_4_ * auVar131._8_4_;
  auVar281._12_4_ = auVar379._12_4_ * auVar131._12_4_;
  auVar318 = vsubps_avx(auVar281,auVar264);
  auVar34 = vshufps_avx(auVar318,auVar318,0xc9);
  auVar318 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar282._0_4_ = auVar318._0_4_ * fVar355;
  auVar282._4_4_ = auVar318._4_4_ * fVar356;
  auVar282._8_4_ = auVar318._8_4_ * fVar358;
  auVar282._12_4_ = auVar318._12_4_ * fVar362;
  auVar98._0_4_ = auVar131._0_4_ * auVar130._0_4_;
  auVar98._4_4_ = auVar131._4_4_ * auVar130._4_4_;
  auVar98._8_4_ = auVar131._8_4_ * auVar130._8_4_;
  auVar98._12_4_ = auVar131._12_4_ * auVar130._12_4_;
  auVar131 = vsubps_avx(auVar98,auVar282);
  auVar130 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar131 = vshufps_avx(auVar300,auVar300,0xc9);
  auVar318 = vshufps_avx(auVar174,auVar174,0xc9);
  auVar283._0_4_ = auVar300._0_4_ * auVar318._0_4_;
  auVar283._4_4_ = auVar300._4_4_ * auVar318._4_4_;
  auVar283._8_4_ = auVar300._8_4_ * auVar318._8_4_;
  auVar283._12_4_ = auVar300._12_4_ * auVar318._12_4_;
  auVar175._0_4_ = auVar131._0_4_ * auVar174._0_4_;
  auVar175._4_4_ = auVar131._4_4_ * auVar174._4_4_;
  auVar175._8_4_ = auVar131._8_4_ * auVar174._8_4_;
  auVar175._12_4_ = auVar131._12_4_ * auVar174._12_4_;
  auVar318 = vsubps_avx(auVar175,auVar283);
  auVar188 = vshufps_avx(auVar318,auVar318,0xc9);
  auVar318 = vshufps_avx(auVar212,auVar212,0xc9);
  auVar284._0_4_ = auVar300._0_4_ * auVar318._0_4_;
  auVar284._4_4_ = auVar300._4_4_ * auVar318._4_4_;
  auVar284._8_4_ = auVar300._8_4_ * auVar318._8_4_;
  auVar284._12_4_ = auVar300._12_4_ * auVar318._12_4_;
  auVar213._0_4_ = auVar131._0_4_ * auVar212._0_4_;
  auVar213._4_4_ = auVar131._4_4_ * auVar212._4_4_;
  auVar213._8_4_ = auVar131._8_4_ * auVar212._8_4_;
  auVar213._12_4_ = auVar131._12_4_ * auVar212._12_4_;
  auVar108 = vsubps_avx(auVar213,auVar284);
  auVar131 = vdpps_avx(auVar34,auVar34,0x7f);
  fVar146 = auVar131._0_4_;
  auVar205 = ZEXT416((uint)fVar146);
  auVar318 = vrsqrtss_avx(auVar205,auVar205);
  fVar208 = auVar318._0_4_;
  auVar318 = vdpps_avx(auVar34,auVar130,0x7f);
  auVar138 = ZEXT416((uint)(fVar208 * 1.5 - fVar146 * 0.5 * fVar208 * fVar208 * fVar208));
  auVar138 = vshufps_avx(auVar138,auVar138,0);
  fVar244 = auVar138._0_4_ * auVar34._0_4_;
  fVar245 = auVar138._4_4_ * auVar34._4_4_;
  fVar246 = auVar138._8_4_ * auVar34._8_4_;
  fVar247 = auVar138._12_4_ * auVar34._12_4_;
  auVar131 = vshufps_avx(auVar131,auVar131,0);
  auVar99._0_4_ = auVar131._0_4_ * auVar130._0_4_;
  auVar99._4_4_ = auVar131._4_4_ * auVar130._4_4_;
  auVar99._8_4_ = auVar131._8_4_ * auVar130._8_4_;
  auVar99._12_4_ = auVar131._12_4_ * auVar130._12_4_;
  auVar131 = vshufps_avx(auVar318,auVar318,0);
  auVar265._0_4_ = auVar131._0_4_ * auVar34._0_4_;
  auVar265._4_4_ = auVar131._4_4_ * auVar34._4_4_;
  auVar265._8_4_ = auVar131._8_4_ * auVar34._8_4_;
  auVar265._12_4_ = auVar131._12_4_ * auVar34._12_4_;
  auVar374 = vsubps_avx(auVar99,auVar265);
  auVar131 = vrcpss_avx(auVar205,auVar205);
  auVar131 = ZEXT416((uint)((2.0 - fVar146 * auVar131._0_4_) * auVar131._0_4_));
  auVar34 = vshufps_avx(auVar131,auVar131,0);
  auVar131 = vdpps_avx(auVar188,auVar188,0x7f);
  fVar341 = auVar131._0_4_;
  auVar130 = ZEXT416((uint)fVar341);
  auVar318 = vrsqrtss_avx(auVar130,auVar130);
  fVar229 = auVar318._0_4_;
  lVar23 = *(long *)(_Var21 + 0x38 + lVar94);
  lVar24 = *(long *)(_Var21 + 0x48 + lVar94);
  pfVar2 = (float *)(lVar23 + lVar24 * uVar87);
  fVar208 = *pfVar2;
  fVar146 = pfVar2[1];
  fVar200 = pfVar2[2];
  fVar169 = pfVar2[3];
  pfVar2 = (float *)(lVar23 + lVar24 * lVar90);
  fVar172 = *pfVar2;
  fVar201 = pfVar2[1];
  fVar225 = pfVar2[2];
  fVar203 = pfVar2[3];
  pfVar2 = (float *)(lVar23 + lVar24 * lVar1);
  fVar202 = *pfVar2;
  fVar226 = pfVar2[1];
  fVar170 = pfVar2[2];
  fVar204 = pfVar2[3];
  auVar318 = vshufps_avx(auVar108,auVar108,0xc9);
  auVar131 = vshufps_avx(auVar131,auVar131,0);
  auVar373._0_4_ = auVar131._0_4_ * auVar318._0_4_;
  auVar373._4_4_ = auVar131._4_4_ * auVar318._4_4_;
  auVar373._8_4_ = auVar131._8_4_ * auVar318._8_4_;
  auVar373._12_4_ = auVar131._12_4_ * auVar318._12_4_;
  auVar131 = vdpps_avx(auVar188,auVar318,0x7f);
  auVar131 = vshufps_avx(auVar131,auVar131,0);
  auVar100._0_4_ = auVar131._0_4_ * auVar188._0_4_;
  auVar100._4_4_ = auVar131._4_4_ * auVar188._4_4_;
  auVar100._8_4_ = auVar131._8_4_ * auVar188._8_4_;
  auVar100._12_4_ = auVar131._12_4_ * auVar188._12_4_;
  auVar108 = vsubps_avx(auVar373,auVar100);
  pfVar2 = (float *)(lVar23 + lVar24 * lVar92);
  fVar227 = *pfVar2;
  fVar206 = pfVar2[1];
  fVar228 = pfVar2[2];
  fVar207 = pfVar2[3];
  lVar23 = *(long *)(lVar22 + 0x38 + lVar94);
  lVar22 = *(long *)(lVar22 + 0x48 + lVar94);
  auVar131 = ZEXT416((uint)(fVar229 * 1.5 - fVar229 * fVar229 * fVar229 * fVar341 * 0.5));
  auVar318 = vshufps_avx(auVar131,auVar131,0);
  fVar229 = auVar188._0_4_ * auVar318._0_4_;
  fVar230 = auVar188._4_4_ * auVar318._4_4_;
  fVar242 = auVar188._8_4_ * auVar318._8_4_;
  fVar243 = auVar188._12_4_ * auVar318._12_4_;
  auVar131 = vrcpss_avx(auVar130,auVar130);
  auVar131 = ZEXT416((uint)(auVar131._0_4_ * (2.0 - fVar341 * auVar131._0_4_)));
  auVar131 = vshufps_avx(auVar131,auVar131,0);
  auVar130 = vshufps_avx(_local_4d8,_local_4d8,0xff);
  auVar344._0_4_ = auVar130._0_4_ * fVar244;
  auVar344._4_4_ = auVar130._4_4_ * fVar245;
  auVar344._8_4_ = auVar130._8_4_ * fVar246;
  auVar344._12_4_ = auVar130._12_4_ * fVar247;
  auVar188 = vshufps_avx(auVar129,auVar129,0xff);
  auVar205 = vsubps_avx(_local_4d8,auVar344);
  auVar266._0_4_ =
       auVar188._0_4_ * fVar244 + auVar130._0_4_ * auVar138._0_4_ * auVar374._0_4_ * auVar34._0_4_;
  auVar266._4_4_ =
       auVar188._4_4_ * fVar245 + auVar130._4_4_ * auVar138._4_4_ * auVar374._4_4_ * auVar34._4_4_;
  auVar266._8_4_ =
       auVar188._8_4_ * fVar246 + auVar130._8_4_ * auVar138._8_4_ * auVar374._8_4_ * auVar34._8_4_;
  auVar266._12_4_ =
       auVar188._12_4_ * fVar247 +
       auVar130._12_4_ * auVar138._12_4_ * auVar374._12_4_ * auVar34._12_4_;
  auVar374 = vsubps_avx(auVar129,auVar266);
  local_4d8._0_4_ = auVar344._0_4_ + (float)local_4d8._0_4_;
  local_4d8._4_4_ = auVar344._4_4_ + (float)local_4d8._4_4_;
  fStack_4d0 = auVar344._8_4_ + fStack_4d0;
  fStack_4cc = auVar344._12_4_ + fStack_4cc;
  auVar34 = vshufps_avx(_local_4b8,_local_4b8,0xff);
  auVar149._0_4_ = auVar34._0_4_ * fVar229;
  auVar149._4_4_ = auVar34._4_4_ * fVar230;
  auVar149._8_4_ = auVar34._8_4_ * fVar242;
  auVar149._12_4_ = auVar34._12_4_ * fVar243;
  auVar130 = vshufps_avx(auVar300,auVar300,0xff);
  auVar6 = vsubps_avx(_local_4b8,auVar149);
  auVar101._0_4_ =
       auVar130._0_4_ * fVar229 + auVar34._0_4_ * auVar318._0_4_ * auVar131._0_4_ * auVar108._0_4_;
  auVar101._4_4_ =
       auVar130._4_4_ * fVar230 + auVar34._4_4_ * auVar318._4_4_ * auVar131._4_4_ * auVar108._4_4_;
  auVar101._8_4_ =
       auVar130._8_4_ * fVar242 + auVar34._8_4_ * auVar318._8_4_ * auVar131._8_4_ * auVar108._8_4_;
  auVar101._12_4_ =
       auVar130._12_4_ * fVar243 +
       auVar34._12_4_ * auVar318._12_4_ * auVar131._12_4_ * auVar108._12_4_;
  auVar7 = vsubps_avx(auVar300,auVar101);
  local_4b8._0_4_ = (float)local_4b8._0_4_ + auVar149._0_4_;
  local_4b8._4_4_ = (float)local_4b8._4_4_ + auVar149._4_4_;
  fStack_4b0 = fStack_4b0 + auVar149._8_4_;
  fStack_4ac = fStack_4ac + auVar149._12_4_;
  auVar102._0_4_ = fVar172 * 0.0 + fVar202 * 0.5 + fVar227 * 0.0;
  auVar102._4_4_ = fVar201 * 0.0 + fVar226 * 0.5 + fVar206 * 0.0;
  auVar102._8_4_ = fVar225 * 0.0 + fVar170 * 0.5 + fVar228 * 0.0;
  auVar102._12_4_ = fVar203 * 0.0 + fVar204 * 0.5 + fVar207 * 0.0;
  auVar120._0_4_ = fVar208 * 0.5;
  auVar120._4_4_ = fVar146 * 0.5;
  auVar120._8_4_ = fVar200 * 0.5;
  auVar120._12_4_ = fVar169 * 0.5;
  auVar270 = vsubps_avx(auVar102,auVar120);
  pfVar2 = (float *)(lVar23 + lVar1 * lVar22);
  fVar229 = *pfVar2;
  fVar230 = pfVar2[1];
  fVar242 = pfVar2[2];
  fVar243 = pfVar2[3];
  auVar131 = *(undefined1 (*) [16])(lVar23 + lVar22 * lVar92);
  fVar261 = auVar131._0_4_;
  fVar353 = auVar131._4_4_;
  fVar262 = auVar131._8_4_;
  fVar354 = auVar131._12_4_;
  pfVar2 = (float *)(lVar23 + lVar90 * lVar22);
  fVar244 = *pfVar2;
  fVar245 = pfVar2[1];
  fVar246 = pfVar2[2];
  fVar247 = pfVar2[3];
  auVar249._0_4_ = fVar244 * 0.0 + fVar261 * 0.0 + fVar229 * 0.5;
  auVar249._4_4_ = fVar245 * 0.0 + fVar353 * 0.0 + fVar230 * 0.5;
  auVar249._8_4_ = fVar246 * 0.0 + fVar262 * 0.0 + fVar242 * 0.5;
  auVar249._12_4_ = fVar247 * 0.0 + fVar354 * 0.0 + fVar243 * 0.5;
  pfVar2 = (float *)(lVar23 + uVar87 * lVar22);
  fVar341 = *pfVar2;
  fVar342 = pfVar2[1];
  fVar260 = pfVar2[2];
  fVar343 = pfVar2[3];
  auVar285._0_4_ = fVar341 * 0.5;
  auVar285._4_4_ = fVar342 * 0.5;
  auVar285._8_4_ = fVar260 * 0.5;
  auVar285._12_4_ = fVar343 * 0.5;
  auVar318 = vsubps_avx(auVar249,auVar285);
  auVar286._0_4_ = fVar208 * -0.0 + fVar172 + fVar202 * 0.0 + fVar227 * -0.0;
  auVar286._4_4_ = fVar146 * -0.0 + fVar201 + fVar226 * 0.0 + fVar206 * -0.0;
  auVar286._8_4_ = fVar200 * -0.0 + fVar225 + fVar170 * 0.0 + fVar228 * -0.0;
  auVar286._12_4_ = fVar169 * -0.0 + fVar203 + fVar204 * 0.0 + fVar207 * -0.0;
  auVar267._0_4_ = fVar208 * -0.0 + fVar172 * 0.0 + fVar202 + fVar227 * -0.0;
  auVar267._4_4_ = fVar146 * -0.0 + fVar201 * 0.0 + fVar226 + fVar206 * -0.0;
  auVar267._8_4_ = fVar200 * -0.0 + fVar225 * 0.0 + fVar170 + fVar228 * -0.0;
  auVar267._12_4_ = fVar169 * -0.0 + fVar203 * 0.0 + fVar204 + fVar207 * -0.0;
  auVar315._0_4_ = fVar202 * 0.0 + fVar227 * 0.5;
  auVar315._4_4_ = fVar226 * 0.0 + fVar206 * 0.5;
  auVar315._8_4_ = fVar170 * 0.0 + fVar228 * 0.5;
  auVar315._12_4_ = fVar204 * 0.0 + fVar207 * 0.5;
  auVar345._0_4_ = fVar172 * 0.5;
  auVar345._4_4_ = fVar201 * 0.5;
  auVar345._8_4_ = fVar225 * 0.5;
  auVar345._12_4_ = fVar203 * 0.5;
  auVar131 = vsubps_avx(auVar315,auVar345);
  auVar330._0_4_ = fVar208 * 0.0 + auVar131._0_4_;
  auVar330._4_4_ = fVar146 * 0.0 + auVar131._4_4_;
  auVar330._8_4_ = fVar200 * 0.0 + auVar131._8_4_;
  auVar330._12_4_ = fVar169 * 0.0 + auVar131._12_4_;
  auVar316._0_4_ = fVar341 * -0.0 + fVar244 + fVar261 * -0.0 + fVar229 * 0.0;
  auVar316._4_4_ = fVar342 * -0.0 + fVar245 + fVar353 * -0.0 + fVar230 * 0.0;
  auVar316._8_4_ = fVar260 * -0.0 + fVar246 + fVar262 * -0.0 + fVar242 * 0.0;
  auVar316._12_4_ = fVar343 * -0.0 + fVar247 + fVar354 * -0.0 + fVar243 * 0.0;
  auVar121._0_4_ = fVar341 * -0.0 + fVar261 * -0.0 + fVar229 + fVar244 * 0.0;
  auVar121._4_4_ = fVar342 * -0.0 + fVar353 * -0.0 + fVar230 + fVar245 * 0.0;
  auVar121._8_4_ = fVar260 * -0.0 + fVar262 * -0.0 + fVar242 + fVar246 * 0.0;
  auVar121._12_4_ = fVar343 * -0.0 + fVar354 * -0.0 + fVar243 + fVar247 * 0.0;
  auVar150._0_4_ = fVar229 * 0.0 + fVar261 * 0.5;
  auVar150._4_4_ = fVar230 * 0.0 + fVar353 * 0.5;
  auVar150._8_4_ = fVar242 * 0.0 + fVar262 * 0.5;
  auVar150._12_4_ = fVar243 * 0.0 + fVar354 * 0.5;
  auVar176._0_4_ = fVar244 * 0.5;
  auVar176._4_4_ = fVar245 * 0.5;
  auVar176._8_4_ = fVar246 * 0.5;
  auVar176._12_4_ = fVar247 * 0.5;
  auVar131 = vsubps_avx(auVar150,auVar176);
  auVar103._0_4_ = fVar341 * 0.0 + auVar131._0_4_;
  auVar103._4_4_ = fVar342 * 0.0 + auVar131._4_4_;
  auVar103._8_4_ = fVar260 * 0.0 + auVar131._8_4_;
  auVar103._12_4_ = fVar343 * 0.0 + auVar131._12_4_;
  auVar131 = vshufps_avx(auVar316,auVar316,0xc9);
  fVar202 = auVar270._0_4_;
  auVar151._0_4_ = fVar202 * auVar131._0_4_;
  fVar226 = auVar270._4_4_;
  auVar151._4_4_ = fVar226 * auVar131._4_4_;
  fVar170 = auVar270._8_4_;
  auVar151._8_4_ = fVar170 * auVar131._8_4_;
  fVar204 = auVar270._12_4_;
  auVar151._12_4_ = fVar204 * auVar131._12_4_;
  auVar131 = vshufps_avx(auVar270,auVar270,0xc9);
  auVar317._0_4_ = auVar316._0_4_ * auVar131._0_4_;
  auVar317._4_4_ = auVar316._4_4_ * auVar131._4_4_;
  auVar317._8_4_ = auVar316._8_4_ * auVar131._8_4_;
  auVar317._12_4_ = auVar316._12_4_ * auVar131._12_4_;
  auVar34 = vsubps_avx(auVar317,auVar151);
  auVar177._0_4_ = auVar131._0_4_ * auVar318._0_4_;
  auVar177._4_4_ = auVar131._4_4_ * auVar318._4_4_;
  auVar177._8_4_ = auVar131._8_4_ * auVar318._8_4_;
  auVar177._12_4_ = auVar131._12_4_ * auVar318._12_4_;
  auVar131 = vshufps_avx(auVar318,auVar318,0xc9);
  auVar250._0_4_ = fVar202 * auVar131._0_4_;
  auVar250._4_4_ = fVar226 * auVar131._4_4_;
  auVar250._8_4_ = fVar170 * auVar131._8_4_;
  auVar250._12_4_ = fVar204 * auVar131._12_4_;
  auVar130 = vsubps_avx(auVar177,auVar250);
  auVar131 = vshufps_avx(auVar121,auVar121,0xc9);
  auVar251._0_4_ = auVar330._0_4_ * auVar131._0_4_;
  auVar251._4_4_ = auVar330._4_4_ * auVar131._4_4_;
  auVar251._8_4_ = auVar330._8_4_ * auVar131._8_4_;
  auVar251._12_4_ = auVar330._12_4_ * auVar131._12_4_;
  auVar131 = vshufps_avx(auVar330,auVar330,0xc9);
  auVar122._0_4_ = auVar131._0_4_ * auVar121._0_4_;
  auVar122._4_4_ = auVar131._4_4_ * auVar121._4_4_;
  auVar122._8_4_ = auVar131._8_4_ * auVar121._8_4_;
  auVar122._12_4_ = auVar131._12_4_ * auVar121._12_4_;
  auVar188 = vsubps_avx(auVar122,auVar251);
  auVar34 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar152._0_4_ = auVar131._0_4_ * auVar103._0_4_;
  auVar152._4_4_ = auVar131._4_4_ * auVar103._4_4_;
  auVar152._8_4_ = auVar131._8_4_ * auVar103._8_4_;
  auVar152._12_4_ = auVar131._12_4_ * auVar103._12_4_;
  auVar131 = vdpps_avx(auVar34,auVar34,0x7f);
  auVar318 = vshufps_avx(auVar103,auVar103,0xc9);
  auVar104._0_4_ = auVar330._0_4_ * auVar318._0_4_;
  auVar104._4_4_ = auVar330._4_4_ * auVar318._4_4_;
  auVar104._8_4_ = auVar330._8_4_ * auVar318._8_4_;
  auVar104._12_4_ = auVar330._12_4_ * auVar318._12_4_;
  auVar129 = vsubps_avx(auVar152,auVar104);
  fVar208 = auVar131._0_4_;
  auVar138 = ZEXT416((uint)fVar208);
  auVar318 = vrsqrtss_avx(auVar138,auVar138);
  fVar146 = auVar318._0_4_;
  auVar130 = vshufps_avx(auVar130,auVar130,0xc9);
  auVar318 = vdpps_avx(auVar34,auVar130,0x7f);
  auVar131 = vshufps_avx(auVar131,auVar131,0);
  auVar178._0_4_ = auVar131._0_4_ * auVar130._0_4_;
  auVar178._4_4_ = auVar131._4_4_ * auVar130._4_4_;
  auVar178._8_4_ = auVar131._8_4_ * auVar130._8_4_;
  auVar178._12_4_ = auVar131._12_4_ * auVar130._12_4_;
  auVar131 = vshufps_avx(auVar318,auVar318,0);
  auVar346._0_4_ = auVar131._0_4_ * auVar34._0_4_;
  auVar346._4_4_ = auVar131._4_4_ * auVar34._4_4_;
  auVar346._8_4_ = auVar131._8_4_ * auVar34._8_4_;
  auVar346._12_4_ = auVar131._12_4_ * auVar34._12_4_;
  auVar8 = vsubps_avx(auVar178,auVar346);
  auVar131 = vrcpss_avx(auVar138,auVar138);
  auVar131 = ZEXT416((uint)(auVar131._0_4_ * (2.0 - fVar208 * auVar131._0_4_)));
  auVar130 = vshufps_avx(auVar131,auVar131,0);
  auVar188 = vshufps_avx(auVar188,auVar188,0xc9);
  auVar318 = vdpps_avx(auVar188,auVar188,0x7f);
  auVar131 = ZEXT416((uint)(fVar146 * 1.5 - fVar208 * 0.5 * fVar146 * fVar146 * fVar146));
  auVar138 = vshufps_avx(auVar131,auVar131,0);
  fVar208 = auVar34._0_4_ * auVar138._0_4_;
  fVar146 = auVar34._4_4_ * auVar138._4_4_;
  fVar200 = auVar34._8_4_ * auVar138._8_4_;
  fVar169 = auVar34._12_4_ * auVar138._12_4_;
  auVar131 = vblendps_avx(auVar318,_DAT_01feba10,0xe);
  auVar34 = vrsqrtss_avx(auVar131,auVar131);
  fVar172 = auVar34._0_4_;
  auVar129 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar34 = vdpps_avx(auVar188,auVar129,0x7f);
  auVar108 = vshufps_avx(auVar318,auVar318,0);
  auVar105._0_4_ = auVar108._0_4_ * auVar129._0_4_;
  auVar105._4_4_ = auVar108._4_4_ * auVar129._4_4_;
  auVar105._8_4_ = auVar108._8_4_ * auVar129._8_4_;
  auVar105._12_4_ = auVar108._12_4_ * auVar129._12_4_;
  auVar34 = vshufps_avx(auVar34,auVar34,0);
  auVar347._0_4_ = auVar34._0_4_ * auVar188._0_4_;
  auVar347._4_4_ = auVar34._4_4_ * auVar188._4_4_;
  auVar347._8_4_ = auVar34._8_4_ * auVar188._8_4_;
  auVar347._12_4_ = auVar34._12_4_ * auVar188._12_4_;
  auVar129 = vsubps_avx(auVar105,auVar347);
  auVar131 = vrcpss_avx(auVar131,auVar131);
  auVar131 = ZEXT416((uint)(auVar131._0_4_ * (2.0 - auVar318._0_4_ * auVar131._0_4_)));
  auVar131 = vshufps_avx(auVar131,auVar131,0);
  auVar318 = ZEXT416((uint)(fVar172 * 1.5 - auVar318._0_4_ * 0.5 * fVar172 * fVar172 * fVar172));
  auVar318 = vshufps_avx(auVar318,auVar318,0);
  fVar172 = auVar188._0_4_ * auVar318._0_4_;
  fVar201 = auVar188._4_4_ * auVar318._4_4_;
  fVar225 = auVar188._8_4_ * auVar318._8_4_;
  fVar203 = auVar188._12_4_ * auVar318._12_4_;
  auVar34 = vshufps_avx(auVar270,auVar270,0xff);
  auVar188 = vshufps_avx(auVar286,auVar286,0xff);
  auVar123._0_4_ = auVar188._0_4_ * fVar208;
  auVar123._4_4_ = auVar188._4_4_ * fVar146;
  auVar123._8_4_ = auVar188._8_4_ * fVar200;
  auVar123._12_4_ = auVar188._12_4_ * fVar169;
  auVar153._0_4_ =
       auVar34._0_4_ * fVar208 + auVar138._0_4_ * auVar8._0_4_ * auVar130._0_4_ * auVar188._0_4_;
  auVar153._4_4_ =
       auVar34._4_4_ * fVar146 + auVar138._4_4_ * auVar8._4_4_ * auVar130._4_4_ * auVar188._4_4_;
  auVar153._8_4_ =
       auVar34._8_4_ * fVar200 + auVar138._8_4_ * auVar8._8_4_ * auVar130._8_4_ * auVar188._8_4_;
  auVar153._12_4_ =
       auVar34._12_4_ * fVar169 +
       auVar138._12_4_ * auVar8._12_4_ * auVar130._12_4_ * auVar188._12_4_;
  auVar188 = vsubps_avx(auVar286,auVar123);
  auVar138 = vsubps_avx(auVar270,auVar153);
  auVar34 = vshufps_avx(auVar330,auVar330,0xff);
  auVar130 = vshufps_avx(auVar267,auVar267,0xff);
  auVar179._0_4_ = auVar130._0_4_ * fVar172;
  auVar179._4_4_ = auVar130._4_4_ * fVar201;
  auVar179._8_4_ = auVar130._8_4_ * fVar225;
  auVar179._12_4_ = auVar130._12_4_ * fVar203;
  auVar154._0_4_ =
       auVar34._0_4_ * fVar172 + auVar130._0_4_ * auVar318._0_4_ * auVar129._0_4_ * auVar131._0_4_;
  auVar154._4_4_ =
       auVar34._4_4_ * fVar201 + auVar130._4_4_ * auVar318._4_4_ * auVar129._4_4_ * auVar131._4_4_;
  auVar154._8_4_ =
       auVar34._8_4_ * fVar225 + auVar130._8_4_ * auVar318._8_4_ * auVar129._8_4_ * auVar131._8_4_;
  auVar154._12_4_ =
       auVar34._12_4_ * fVar203 +
       auVar130._12_4_ * auVar318._12_4_ * auVar129._12_4_ * auVar131._12_4_;
  auVar34 = vsubps_avx(auVar267,auVar179);
  local_458._4_4_ = auVar267._4_4_ + auVar179._4_4_;
  local_458._0_4_ = auVar267._0_4_ + auVar179._0_4_;
  fStack_450 = auVar267._8_4_ + auVar179._8_4_;
  fStack_44c = auVar267._12_4_ + auVar179._12_4_;
  auVar130 = vsubps_avx(auVar330,auVar154);
  local_398._0_4_ = auVar374._0_4_;
  local_398._4_4_ = auVar374._4_4_;
  fStack_390 = auVar374._8_4_;
  fStack_38c = auVar374._12_4_;
  local_478._0_4_ = auVar205._0_4_;
  local_478._4_4_ = auVar205._4_4_;
  fStack_470 = auVar205._8_4_;
  fStack_46c = auVar205._12_4_;
  auVar131 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
  auVar318 = vshufps_avx(ZEXT416((uint)(1.0 - fVar171)),ZEXT416((uint)(1.0 - fVar171)),0);
  fVar169 = auVar131._0_4_;
  fVar172 = auVar131._4_4_;
  fVar201 = auVar131._8_4_;
  fVar225 = auVar131._12_4_;
  fVar171 = auVar318._0_4_;
  fVar208 = auVar318._4_4_;
  fVar146 = auVar318._8_4_;
  fVar200 = auVar318._12_4_;
  local_348._0_4_ = fVar171 * (float)local_478._0_4_ + fVar169 * auVar188._0_4_;
  local_348._4_4_ = fVar208 * (float)local_478._4_4_ + fVar172 * auVar188._4_4_;
  fStack_340 = fVar146 * fStack_470 + fVar201 * auVar188._8_4_;
  fStack_33c = fVar200 * fStack_46c + fVar225 * auVar188._12_4_;
  local_3a8 = fVar171 * ((float)local_478._0_4_ + (float)local_398._0_4_ * 0.33333334) +
              fVar169 * (auVar188._0_4_ + auVar138._0_4_ * 0.33333334);
  fStack_3a4 = fVar208 * ((float)local_478._4_4_ + (float)local_398._4_4_ * 0.33333334) +
               fVar172 * (auVar188._4_4_ + auVar138._4_4_ * 0.33333334);
  fStack_3a0 = fVar146 * (fStack_470 + fStack_390 * 0.33333334) +
               fVar201 * (auVar188._8_4_ + auVar138._8_4_ * 0.33333334);
  fStack_39c = fVar200 * (fStack_46c + fStack_38c * 0.33333334) +
               fVar225 * (auVar188._12_4_ + auVar138._12_4_ * 0.33333334);
  local_418._0_4_ = auVar7._0_4_;
  local_418._4_4_ = auVar7._4_4_;
  fStack_410 = auVar7._8_4_;
  fStack_40c = auVar7._12_4_;
  auVar155._0_4_ = (float)local_418._0_4_ * 0.33333334;
  auVar155._4_4_ = (float)local_418._4_4_ * 0.33333334;
  auVar155._8_4_ = fStack_410 * 0.33333334;
  auVar155._12_4_ = fStack_40c * 0.33333334;
  auVar131 = vsubps_avx(auVar6,auVar155);
  auVar252._0_4_ = (auVar300._0_4_ + auVar101._0_4_) * 0.33333334;
  auVar252._4_4_ = (auVar300._4_4_ + auVar101._4_4_) * 0.33333334;
  auVar252._8_4_ = (auVar300._8_4_ + auVar101._8_4_) * 0.33333334;
  auVar252._12_4_ = (auVar300._12_4_ + auVar101._12_4_) * 0.33333334;
  auVar318 = vsubps_avx(_local_4b8,auVar252);
  auVar180._0_4_ = auVar130._0_4_ * 0.33333334;
  auVar180._4_4_ = auVar130._4_4_ * 0.33333334;
  auVar180._8_4_ = auVar130._8_4_ * 0.33333334;
  auVar180._12_4_ = auVar130._12_4_ * 0.33333334;
  auVar130 = vsubps_avx(auVar34,auVar180);
  auVar319._0_4_ = (auVar330._0_4_ + auVar154._0_4_) * 0.33333334;
  auVar319._4_4_ = (auVar330._4_4_ + auVar154._4_4_) * 0.33333334;
  auVar319._8_4_ = (auVar330._8_4_ + auVar154._8_4_) * 0.33333334;
  auVar319._12_4_ = (auVar330._12_4_ + auVar154._12_4_) * 0.33333334;
  auVar188 = vsubps_avx(_local_458,auVar319);
  local_358._0_4_ = fVar169 * auVar130._0_4_ + auVar131._0_4_ * fVar171;
  local_358._4_4_ = fVar172 * auVar130._4_4_ + auVar131._4_4_ * fVar208;
  fStack_350 = fVar201 * auVar130._8_4_ + auVar131._8_4_ * fVar146;
  fStack_34c = fVar225 * auVar130._12_4_ + auVar131._12_4_ * fVar200;
  local_3b8 = fVar169 * auVar34._0_4_ + fVar171 * auVar6._0_4_;
  fStack_3b4 = fVar172 * auVar34._4_4_ + fVar208 * auVar6._4_4_;
  fStack_3b0 = fVar201 * auVar34._8_4_ + fVar146 * auVar6._8_4_;
  fStack_3ac = fVar225 * auVar34._12_4_ + fVar200 * auVar6._12_4_;
  local_368._0_4_ = (float)local_4d8._0_4_ * fVar171 + fVar169 * (auVar286._0_4_ + auVar123._0_4_);
  local_368._4_4_ = (float)local_4d8._4_4_ * fVar208 + fVar172 * (auVar286._4_4_ + auVar123._4_4_);
  fStack_360 = fStack_4d0 * fVar146 + fVar201 * (auVar286._8_4_ + auVar123._8_4_);
  fStack_35c = fStack_4cc * fVar200 + fVar225 * (auVar286._12_4_ + auVar123._12_4_);
  local_378._0_4_ =
       fVar171 * ((float)local_4d8._0_4_ + (fVar355 + auVar266._0_4_) * 0.33333334) +
       fVar169 * (auVar286._0_4_ + auVar123._0_4_ + (fVar202 + auVar153._0_4_) * 0.33333334);
  local_378._4_4_ =
       fVar208 * ((float)local_4d8._4_4_ + (fVar356 + auVar266._4_4_) * 0.33333334) +
       fVar172 * (auVar286._4_4_ + auVar123._4_4_ + (fVar226 + auVar153._4_4_) * 0.33333334);
  fStack_370 = fVar146 * (fStack_4d0 + (fVar358 + auVar266._8_4_) * 0.33333334) +
               fVar201 * (auVar286._8_4_ + auVar123._8_4_ + (fVar170 + auVar153._8_4_) * 0.33333334)
  ;
  fStack_36c = fVar200 * (fStack_4cc + (fVar362 + auVar266._12_4_) * 0.33333334) +
               fVar225 * (auVar286._12_4_ + auVar123._12_4_ +
                         (fVar204 + auVar153._12_4_) * 0.33333334);
  local_3c8 = fVar171 * auVar318._0_4_ + fVar169 * auVar188._0_4_;
  fStack_3c4 = fVar208 * auVar318._4_4_ + fVar172 * auVar188._4_4_;
  fStack_3c0 = fVar146 * auVar318._8_4_ + fVar201 * auVar188._8_4_;
  fStack_3bc = fVar200 * auVar318._12_4_ + fVar225 * auVar188._12_4_;
  local_2a8._0_4_ = (float)local_4b8._0_4_ * fVar171 + fVar169 * (auVar267._0_4_ + auVar179._0_4_);
  local_2a8._4_4_ = (float)local_4b8._4_4_ * fVar208 + fVar172 * (auVar267._4_4_ + auVar179._4_4_);
  fStack_2a0 = fStack_4b0 * fVar146 + fVar201 * (auVar267._8_4_ + auVar179._8_4_);
  fStack_29c = fStack_4ac * fVar200 + fVar225 * (auVar267._12_4_ + auVar179._12_4_);
  aVar5 = (ray->super_RayK<1>).org.field_0;
  auVar34 = vsubps_avx(_local_348,(undefined1  [16])aVar5);
  auVar318 = vmovsldup_avx(auVar34);
  auVar131 = vmovshdup_avx(auVar34);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  fVar171 = (pre->ray_space).vx.field_0.m128[0];
  fVar208 = (pre->ray_space).vx.field_0.m128[1];
  fVar146 = (pre->ray_space).vx.field_0.m128[2];
  fVar200 = (pre->ray_space).vx.field_0.m128[3];
  fVar169 = (pre->ray_space).vy.field_0.m128[0];
  fVar172 = (pre->ray_space).vy.field_0.m128[1];
  fVar201 = (pre->ray_space).vy.field_0.m128[2];
  fVar225 = (pre->ray_space).vy.field_0.m128[3];
  fVar203 = (pre->ray_space).vz.field_0.m128[0];
  fVar202 = (pre->ray_space).vz.field_0.m128[1];
  fVar226 = (pre->ray_space).vz.field_0.m128[2];
  fVar170 = (pre->ray_space).vz.field_0.m128[3];
  local_3e8._4_4_ = fVar208 * auVar318._4_4_ + fVar172 * auVar131._4_4_ + fVar202 * auVar34._4_4_;
  local_3e8._0_4_ = fVar171 * auVar318._0_4_ + fVar169 * auVar131._0_4_ + fVar203 * auVar34._0_4_;
  fStack_3e0 = fVar146 * auVar318._8_4_ + fVar201 * auVar131._8_4_ + fVar226 * auVar34._8_4_;
  fStack_3dc = fVar200 * auVar318._12_4_ + fVar225 * auVar131._12_4_ + fVar170 * auVar34._12_4_;
  auVar82._4_4_ = fStack_3a4;
  auVar82._0_4_ = local_3a8;
  auVar82._8_4_ = fStack_3a0;
  auVar82._12_4_ = fStack_39c;
  auVar34 = vsubps_avx(auVar82,(undefined1  [16])aVar5);
  auVar318 = vmovsldup_avx(auVar34);
  auVar131 = vmovshdup_avx(auVar34);
  auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
  local_4d8._4_4_ = fVar208 * auVar318._4_4_ + fVar172 * auVar131._4_4_ + fVar202 * auVar34._4_4_;
  local_4d8._0_4_ = fVar171 * auVar318._0_4_ + fVar169 * auVar131._0_4_ + fVar203 * auVar34._0_4_;
  fStack_4d0 = fVar146 * auVar318._8_4_ + fVar201 * auVar131._8_4_ + fVar226 * auVar34._8_4_;
  fStack_4cc = fVar200 * auVar318._12_4_ + fVar225 * auVar131._12_4_ + fVar170 * auVar34._12_4_;
  auVar318 = vsubps_avx(_local_358,(undefined1  [16])aVar5);
  auVar34 = vshufps_avx(auVar318,auVar318,0xaa);
  auVar131 = vmovshdup_avx(auVar318);
  auVar318 = vmovsldup_avx(auVar318);
  auVar124._0_8_ =
       CONCAT44(fVar208 * auVar318._4_4_ + auVar131._4_4_ * fVar172 + fVar202 * auVar34._4_4_,
                fVar171 * auVar318._0_4_ + auVar131._0_4_ * fVar169 + fVar203 * auVar34._0_4_);
  auVar124._8_4_ = fVar146 * auVar318._8_4_ + auVar131._8_4_ * fVar201 + fVar226 * auVar34._8_4_;
  auVar124._12_4_ = fVar200 * auVar318._12_4_ + auVar131._12_4_ * fVar225 + fVar170 * auVar34._12_4_
  ;
  auVar79._4_4_ = fStack_3b4;
  auVar79._0_4_ = local_3b8;
  auVar79._8_4_ = fStack_3b0;
  auVar79._12_4_ = fStack_3ac;
  auVar318 = vsubps_avx(auVar79,(undefined1  [16])aVar5);
  auVar34 = vshufps_avx(auVar318,auVar318,0xaa);
  auVar131 = vmovshdup_avx(auVar318);
  auVar318 = vmovsldup_avx(auVar318);
  auVar268._0_8_ =
       CONCAT44(auVar131._4_4_ * fVar172 + auVar34._4_4_ * fVar202 + fVar208 * auVar318._4_4_,
                auVar131._0_4_ * fVar169 + auVar34._0_4_ * fVar203 + fVar171 * auVar318._0_4_);
  auVar268._8_4_ = auVar131._8_4_ * fVar201 + auVar34._8_4_ * fVar226 + fVar146 * auVar318._8_4_;
  auVar268._12_4_ = auVar131._12_4_ * fVar225 + auVar34._12_4_ * fVar170 + fVar200 * auVar318._12_4_
  ;
  auVar318 = vsubps_avx(_local_368,(undefined1  [16])aVar5);
  auVar34 = vshufps_avx(auVar318,auVar318,0xaa);
  auVar131 = vmovshdup_avx(auVar318);
  auVar318 = vmovsldup_avx(auVar318);
  auVar181._0_8_ =
       CONCAT44(auVar318._4_4_ * fVar208 + auVar131._4_4_ * fVar172 + auVar34._4_4_ * fVar202,
                auVar318._0_4_ * fVar171 + auVar131._0_4_ * fVar169 + auVar34._0_4_ * fVar203);
  auVar181._8_4_ = auVar318._8_4_ * fVar146 + auVar131._8_4_ * fVar201 + auVar34._8_4_ * fVar226;
  auVar181._12_4_ = auVar318._12_4_ * fVar200 + auVar131._12_4_ * fVar225 + auVar34._12_4_ * fVar170
  ;
  auVar318 = vsubps_avx(_local_378,(undefined1  [16])aVar5);
  auVar34 = vshufps_avx(auVar318,auVar318,0xaa);
  auVar131 = vmovshdup_avx(auVar318);
  auVar318 = vmovsldup_avx(auVar318);
  auVar301._0_8_ =
       CONCAT44(auVar318._4_4_ * fVar208 + auVar131._4_4_ * fVar172 + auVar34._4_4_ * fVar202,
                auVar318._0_4_ * fVar171 + auVar131._0_4_ * fVar169 + auVar34._0_4_ * fVar203);
  auVar301._8_4_ = auVar318._8_4_ * fVar146 + auVar131._8_4_ * fVar201 + auVar34._8_4_ * fVar226;
  auVar301._12_4_ = auVar318._12_4_ * fVar200 + auVar131._12_4_ * fVar225 + auVar34._12_4_ * fVar170
  ;
  auVar76._4_4_ = fStack_3c4;
  auVar76._0_4_ = local_3c8;
  auVar76._8_4_ = fStack_3c0;
  auVar76._12_4_ = fStack_3bc;
  auVar318 = vsubps_avx(auVar76,(undefined1  [16])aVar5);
  auVar34 = vshufps_avx(auVar318,auVar318,0xaa);
  auVar131 = vmovshdup_avx(auVar318);
  auVar318 = vmovsldup_avx(auVar318);
  auVar320._0_8_ =
       CONCAT44(auVar318._4_4_ * fVar208 + auVar131._4_4_ * fVar172 + auVar34._4_4_ * fVar202,
                auVar318._0_4_ * fVar171 + auVar131._0_4_ * fVar169 + auVar34._0_4_ * fVar203);
  auVar320._8_4_ = auVar318._8_4_ * fVar146 + auVar131._8_4_ * fVar201 + auVar34._8_4_ * fVar226;
  auVar320._12_4_ = auVar318._12_4_ * fVar200 + auVar131._12_4_ * fVar225 + auVar34._12_4_ * fVar170
  ;
  auVar318 = vsubps_avx(_local_2a8,(undefined1  [16])aVar5);
  auVar34 = vshufps_avx(auVar318,auVar318,0xaa);
  auVar131 = vmovshdup_avx(auVar318);
  auVar318 = vmovsldup_avx(auVar318);
  auVar106._0_8_ =
       CONCAT44(fVar208 * auVar318._4_4_ + auVar131._4_4_ * fVar172 + auVar34._4_4_ * fVar202,
                fVar171 * auVar318._0_4_ + auVar131._0_4_ * fVar169 + auVar34._0_4_ * fVar203);
  auVar106._8_4_ = fVar146 * auVar318._8_4_ + auVar131._8_4_ * fVar201 + auVar34._8_4_ * fVar226;
  auVar106._12_4_ = fVar200 * auVar318._12_4_ + auVar131._12_4_ * fVar225 + auVar34._12_4_ * fVar170
  ;
  _local_3f8 = vmovlhps_avx(_local_3e8,auVar181);
  _local_408 = vmovlhps_avx(_local_4d8,auVar301);
  _local_418 = vmovlhps_avx(auVar124,auVar320);
  _local_298 = vmovlhps_avx(auVar268,auVar106);
  auVar131 = vminps_avx(_local_3f8,_local_408);
  auVar318 = vminps_avx(_local_418,_local_298);
  auVar34 = vminps_avx(auVar131,auVar318);
  auVar131 = vmaxps_avx(_local_3f8,_local_408);
  auVar318 = vmaxps_avx(_local_418,_local_298);
  auVar131 = vmaxps_avx(auVar131,auVar318);
  auVar318 = vshufpd_avx(auVar34,auVar34,3);
  auVar34 = vminps_avx(auVar34,auVar318);
  auVar318 = vshufpd_avx(auVar131,auVar131,3);
  auVar318 = vmaxps_avx(auVar131,auVar318);
  auVar253._8_4_ = 0x7fffffff;
  auVar253._0_8_ = 0x7fffffff7fffffff;
  auVar253._12_4_ = 0x7fffffff;
  auVar131 = vandps_avx(auVar34,auVar253);
  auVar318 = vandps_avx(auVar318,auVar253);
  auVar131 = vmaxps_avx(auVar131,auVar318);
  auVar318 = vmovshdup_avx(auVar131);
  auVar131 = vmaxss_avx(auVar318,auVar131);
  local_2e0 = (ulong)uVar85;
  fVar171 = auVar131._0_4_ * 9.536743e-07;
  register0x00001388 = local_3e8;
  local_448 = local_3e8;
  register0x00001548 = local_4d8;
  local_288 = local_4d8;
  register0x00001588 = auVar124._0_8_;
  local_458 = (undefined1  [8])auVar124._0_8_;
  register0x00001408 = auVar268._0_8_;
  local_2f8 = auVar268._0_8_;
  register0x00001348 = auVar181._0_8_;
  local_308 = auVar181._0_8_;
  register0x000013c8 = auVar301._0_8_;
  local_318 = auVar301._0_8_;
  register0x00001448 = auVar320._0_8_;
  local_328 = auVar320._0_8_;
  register0x00001488 = auVar106._0_8_;
  local_338 = auVar106._0_8_;
  _local_3e8 = ZEXT416((uint)fVar171);
  auVar131 = vshufps_avx(ZEXT416((uint)fVar171),ZEXT416((uint)fVar171),0);
  local_138._16_16_ = auVar131;
  local_138._0_16_ = auVar131;
  auVar107._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
  auVar107._8_4_ = auVar131._8_4_ ^ 0x80000000;
  auVar107._12_4_ = auVar131._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar107;
  local_158._0_16_ = auVar107;
  uVar87 = 0;
  _local_1c8 = vsubps_avx(_local_408,_local_3f8);
  _local_1d8 = vsubps_avx(_local_418,_local_408);
  _local_1e8 = vsubps_avx(_local_298,_local_418);
  _local_208 = vsubps_avx(_local_368,_local_348);
  auVar83._4_4_ = fStack_3a4;
  auVar83._0_4_ = local_3a8;
  auVar83._8_4_ = fStack_3a0;
  auVar83._12_4_ = fStack_39c;
  _local_218 = vsubps_avx(_local_378,auVar83);
  auVar77._4_4_ = fStack_3c4;
  auVar77._0_4_ = local_3c8;
  auVar77._8_4_ = fStack_3c0;
  auVar77._12_4_ = fStack_3bc;
  _local_228 = vsubps_avx(auVar77,_local_358);
  auVar80._4_4_ = fStack_3b4;
  auVar80._0_4_ = local_3b8;
  auVar80._8_4_ = fStack_3b0;
  auVar80._12_4_ = fStack_3ac;
  _local_238 = vsubps_avx(_local_2a8,auVar80);
  _local_4d8 = ZEXT816(0x3f80000000000000);
  local_1f8 = _local_4d8;
  do {
    auVar131 = vshufps_avx(_local_4d8,_local_4d8,0x50);
    auVar380._8_4_ = 0x3f800000;
    auVar380._0_8_ = &DAT_3f8000003f800000;
    auVar380._12_4_ = 0x3f800000;
    auVar385._16_4_ = 0x3f800000;
    auVar385._0_16_ = auVar380;
    auVar385._20_4_ = 0x3f800000;
    auVar385._24_4_ = 0x3f800000;
    auVar385._28_4_ = 0x3f800000;
    auVar318 = vsubps_avx(auVar380,auVar131);
    fVar171 = auVar131._0_4_;
    fVar208 = auVar131._4_4_;
    fVar146 = auVar131._8_4_;
    fVar200 = auVar131._12_4_;
    fVar169 = auVar318._0_4_;
    fVar172 = auVar318._4_4_;
    fVar201 = auVar318._8_4_;
    fVar225 = auVar318._12_4_;
    auVar156._0_4_ = local_308._0_4_ * fVar171 + fVar169 * local_448._0_4_;
    auVar156._4_4_ = local_308._4_4_ * fVar208 + fVar172 * local_448._4_4_;
    auVar156._8_4_ = local_308._8_4_ * fVar146 + fVar201 * local_448._8_4_;
    auVar156._12_4_ = local_308._12_4_ * fVar200 + fVar225 * local_448._12_4_;
    auVar125._0_4_ = local_318._0_4_ * fVar171 + local_288._0_4_ * fVar169;
    auVar125._4_4_ = local_318._4_4_ * fVar208 + local_288._4_4_ * fVar172;
    auVar125._8_4_ = local_318._8_4_ * fVar146 + local_288._8_4_ * fVar201;
    auVar125._12_4_ = local_318._12_4_ * fVar200 + local_288._12_4_ * fVar225;
    auVar269._0_4_ = local_328._0_4_ * fVar171 + local_458._0_4_ * fVar169;
    auVar269._4_4_ = local_328._4_4_ * fVar208 + local_458._4_4_ * fVar172;
    auVar269._8_4_ = local_328._8_4_ * fVar146 + local_458._8_4_ * fVar201;
    auVar269._12_4_ = local_328._12_4_ * fVar200 + local_458._12_4_ * fVar225;
    auVar182._0_4_ = local_338._0_4_ * fVar171 + local_2f8._0_4_ * fVar169;
    auVar182._4_4_ = local_338._4_4_ * fVar208 + local_2f8._4_4_ * fVar172;
    auVar182._8_4_ = local_338._8_4_ * fVar146 + local_2f8._8_4_ * fVar201;
    auVar182._12_4_ = local_338._12_4_ * fVar200 + local_2f8._12_4_ * fVar225;
    auVar131 = vmovshdup_avx(local_1f8);
    auVar318 = vshufps_avx(local_1f8,local_1f8,0);
    auVar298._16_16_ = auVar318;
    auVar298._0_16_ = auVar318;
    auVar34 = vshufps_avx(local_1f8,local_1f8,0x55);
    auVar114._16_16_ = auVar34;
    auVar114._0_16_ = auVar34;
    auVar110 = vsubps_avx(auVar114,auVar298);
    auVar34 = vshufps_avx(auVar156,auVar156,0);
    auVar130 = vshufps_avx(auVar156,auVar156,0x55);
    auVar188 = vshufps_avx(auVar125,auVar125,0);
    auVar138 = vshufps_avx(auVar125,auVar125,0x55);
    auVar129 = vshufps_avx(auVar269,auVar269,0);
    auVar108 = vshufps_avx(auVar269,auVar269,0x55);
    auVar374 = vshufps_avx(auVar182,auVar182,0);
    auVar205 = vshufps_avx(auVar182,auVar182,0x55);
    auVar131 = ZEXT416((uint)((auVar131._0_4_ - local_1f8._0_4_) * 0.04761905));
    auVar131 = vshufps_avx(auVar131,auVar131,0);
    auVar314._0_4_ = auVar318._0_4_ + auVar110._0_4_ * 0.0;
    auVar314._4_4_ = auVar318._4_4_ + auVar110._4_4_ * 0.14285715;
    auVar314._8_4_ = auVar318._8_4_ + auVar110._8_4_ * 0.2857143;
    auVar314._12_4_ = auVar318._12_4_ + auVar110._12_4_ * 0.42857146;
    auVar314._16_4_ = auVar318._0_4_ + auVar110._16_4_ * 0.5714286;
    auVar314._20_4_ = auVar318._4_4_ + auVar110._20_4_ * 0.71428573;
    auVar314._24_4_ = auVar318._8_4_ + auVar110._24_4_ * 0.8571429;
    auVar314._28_4_ = auVar318._12_4_ + auVar110._28_4_;
    auVar26 = vsubps_avx(auVar385,auVar314);
    fVar227 = auVar188._0_4_;
    fVar228 = auVar188._4_4_;
    fVar243 = auVar188._8_4_;
    fVar245 = auVar188._12_4_;
    fVar171 = auVar26._0_4_;
    fVar169 = auVar26._4_4_;
    fVar203 = auVar26._8_4_;
    fVar204 = auVar26._12_4_;
    fVar369 = auVar34._12_4_;
    fVar207 = auVar26._16_4_;
    fVar229 = auVar26._20_4_;
    fVar230 = auVar26._24_4_;
    fVar260 = auVar138._0_4_;
    fVar261 = auVar138._4_4_;
    fVar262 = auVar138._8_4_;
    fVar362 = auVar138._12_4_;
    local_498._0_4_ = auVar130._0_4_;
    local_498._4_4_ = auVar130._4_4_;
    fStack_490 = auVar130._8_4_;
    fStack_48c = auVar130._12_4_;
    fVar208 = auVar129._0_4_;
    fVar200 = auVar129._4_4_;
    fVar201 = auVar129._8_4_;
    fVar202 = auVar129._12_4_;
    fVar206 = auVar314._0_4_ * fVar208 + fVar227 * fVar171;
    fVar242 = auVar314._4_4_ * fVar200 + fVar228 * fVar169;
    fVar244 = auVar314._8_4_ * fVar201 + fVar243 * fVar203;
    fVar246 = auVar314._12_4_ * fVar202 + fVar245 * fVar204;
    fVar247 = auVar314._16_4_ * fVar208 + fVar227 * fVar207;
    fVar341 = auVar314._20_4_ * fVar200 + fVar228 * fVar229;
    fVar342 = auVar314._24_4_ * fVar201 + fVar243 * fVar230;
    fVar146 = auVar108._0_4_;
    fVar172 = auVar108._4_4_;
    fVar225 = auVar108._8_4_;
    fVar226 = auVar108._12_4_;
    fVar343 = auVar314._0_4_ * fVar146 + fVar260 * fVar171;
    fVar353 = auVar314._4_4_ * fVar172 + fVar261 * fVar169;
    fVar354 = auVar314._8_4_ * fVar225 + fVar262 * fVar203;
    fVar355 = auVar314._12_4_ * fVar226 + fVar362 * fVar204;
    fVar356 = auVar314._16_4_ * fVar146 + fVar260 * fVar207;
    fVar358 = auVar314._20_4_ * fVar172 + fVar261 * fVar229;
    fVar360 = auVar314._24_4_ * fVar225 + fVar262 * fVar230;
    auVar318 = vshufps_avx(auVar156,auVar156,0xaa);
    auVar130 = vshufps_avx(auVar156,auVar156,0xff);
    fVar170 = fVar202 + 0.0;
    auVar188 = vshufps_avx(auVar125,auVar125,0xaa);
    auVar138 = vshufps_avx(auVar125,auVar125,0xff);
    auVar115._0_4_ =
         fVar171 * (fVar227 * auVar314._0_4_ + auVar34._0_4_ * fVar171) + auVar314._0_4_ * fVar206;
    auVar115._4_4_ =
         fVar169 * (fVar228 * auVar314._4_4_ + auVar34._4_4_ * fVar169) + auVar314._4_4_ * fVar242;
    auVar115._8_4_ =
         fVar203 * (fVar243 * auVar314._8_4_ + auVar34._8_4_ * fVar203) + auVar314._8_4_ * fVar244;
    auVar115._12_4_ =
         fVar204 * (fVar245 * auVar314._12_4_ + fVar369 * fVar204) + auVar314._12_4_ * fVar246;
    auVar115._16_4_ =
         fVar207 * (fVar227 * auVar314._16_4_ + auVar34._0_4_ * fVar207) + auVar314._16_4_ * fVar247
    ;
    auVar115._20_4_ =
         fVar229 * (fVar228 * auVar314._20_4_ + auVar34._4_4_ * fVar229) + auVar314._20_4_ * fVar341
    ;
    auVar115._24_4_ =
         fVar230 * (fVar243 * auVar314._24_4_ + auVar34._8_4_ * fVar230) + auVar314._24_4_ * fVar342
    ;
    auVar115._28_4_ = fVar369 + 1.0 + fVar226;
    auVar196._0_4_ =
         fVar171 * (fVar260 * auVar314._0_4_ + fVar171 * (float)local_498._0_4_) +
         auVar314._0_4_ * fVar343;
    auVar196._4_4_ =
         fVar169 * (fVar261 * auVar314._4_4_ + fVar169 * (float)local_498._4_4_) +
         auVar314._4_4_ * fVar353;
    auVar196._8_4_ =
         fVar203 * (fVar262 * auVar314._8_4_ + fVar203 * fStack_490) + auVar314._8_4_ * fVar354;
    auVar196._12_4_ =
         fVar204 * (fVar362 * auVar314._12_4_ + fVar204 * fStack_48c) + auVar314._12_4_ * fVar355;
    auVar196._16_4_ =
         fVar207 * (fVar260 * auVar314._16_4_ + fVar207 * (float)local_498._0_4_) +
         auVar314._16_4_ * fVar356;
    auVar196._20_4_ =
         fVar229 * (fVar261 * auVar314._20_4_ + fVar229 * (float)local_498._4_4_) +
         auVar314._20_4_ * fVar358;
    auVar196._24_4_ =
         fVar230 * (fVar262 * auVar314._24_4_ + fVar230 * fStack_490) + auVar314._24_4_ * fVar360;
    auVar196._28_4_ = fVar369 + 1.0 + fVar226;
    auVar222._0_4_ =
         fVar171 * fVar206 + auVar314._0_4_ * (auVar374._0_4_ * auVar314._0_4_ + fVar171 * fVar208);
    auVar222._4_4_ =
         fVar169 * fVar242 + auVar314._4_4_ * (auVar374._4_4_ * auVar314._4_4_ + fVar169 * fVar200);
    auVar222._8_4_ =
         fVar203 * fVar244 + auVar314._8_4_ * (auVar374._8_4_ * auVar314._8_4_ + fVar203 * fVar201);
    auVar222._12_4_ =
         fVar204 * fVar246 +
         auVar314._12_4_ * (auVar374._12_4_ * auVar314._12_4_ + fVar204 * fVar202);
    auVar222._16_4_ =
         fVar207 * fVar247 +
         auVar314._16_4_ * (auVar374._0_4_ * auVar314._16_4_ + fVar207 * fVar208);
    auVar222._20_4_ =
         fVar229 * fVar341 +
         auVar314._20_4_ * (auVar374._4_4_ * auVar314._20_4_ + fVar229 * fVar200);
    auVar222._24_4_ =
         fVar230 * fVar342 +
         auVar314._24_4_ * (auVar374._8_4_ * auVar314._24_4_ + fVar230 * fVar201);
    auVar222._28_4_ = fVar226 + fVar170;
    auVar329._0_4_ =
         fVar171 * fVar343 + auVar314._0_4_ * (auVar205._0_4_ * auVar314._0_4_ + fVar171 * fVar146);
    auVar329._4_4_ =
         fVar169 * fVar353 + auVar314._4_4_ * (auVar205._4_4_ * auVar314._4_4_ + fVar169 * fVar172);
    auVar329._8_4_ =
         fVar203 * fVar354 + auVar314._8_4_ * (auVar205._8_4_ * auVar314._8_4_ + fVar203 * fVar225);
    auVar329._12_4_ =
         fVar204 * fVar355 +
         auVar314._12_4_ * (auVar205._12_4_ * auVar314._12_4_ + fVar204 * fVar226);
    auVar329._16_4_ =
         fVar207 * fVar356 +
         auVar314._16_4_ * (auVar205._0_4_ * auVar314._16_4_ + fVar207 * fVar146);
    auVar329._20_4_ =
         fVar229 * fVar358 +
         auVar314._20_4_ * (auVar205._4_4_ * auVar314._20_4_ + fVar229 * fVar172);
    auVar329._24_4_ =
         fVar230 * fVar360 +
         auVar314._24_4_ * (auVar205._8_4_ * auVar314._24_4_ + fVar230 * fVar225);
    auVar329._28_4_ = fVar170 + fVar226 + 0.0;
    local_78._0_4_ = fVar171 * auVar115._0_4_ + auVar314._0_4_ * auVar222._0_4_;
    local_78._4_4_ = fVar169 * auVar115._4_4_ + auVar314._4_4_ * auVar222._4_4_;
    local_78._8_4_ = fVar203 * auVar115._8_4_ + auVar314._8_4_ * auVar222._8_4_;
    local_78._12_4_ = fVar204 * auVar115._12_4_ + auVar314._12_4_ * auVar222._12_4_;
    local_78._16_4_ = fVar207 * auVar115._16_4_ + auVar314._16_4_ * auVar222._16_4_;
    local_78._20_4_ = fVar229 * auVar115._20_4_ + auVar314._20_4_ * auVar222._20_4_;
    local_78._24_4_ = fVar230 * auVar115._24_4_ + auVar314._24_4_ * auVar222._24_4_;
    local_78._28_4_ = fVar369 + fVar245 + fVar226 + 0.0;
    local_98._0_4_ = fVar171 * auVar196._0_4_ + auVar314._0_4_ * auVar329._0_4_;
    local_98._4_4_ = fVar169 * auVar196._4_4_ + auVar314._4_4_ * auVar329._4_4_;
    local_98._8_4_ = fVar203 * auVar196._8_4_ + auVar314._8_4_ * auVar329._8_4_;
    local_98._12_4_ = fVar204 * auVar196._12_4_ + auVar314._12_4_ * auVar329._12_4_;
    local_98._16_4_ = fVar207 * auVar196._16_4_ + auVar314._16_4_ * auVar329._16_4_;
    local_98._20_4_ = fVar229 * auVar196._20_4_ + auVar314._20_4_ * auVar329._20_4_;
    local_98._24_4_ = fVar230 * auVar196._24_4_ + auVar314._24_4_ * auVar329._24_4_;
    local_98._28_4_ = fVar369 + fVar245 + fVar170;
    auVar27 = vsubps_avx(auVar222,auVar115);
    auVar110 = vsubps_avx(auVar329,auVar196);
    local_438._0_4_ = auVar131._0_4_;
    local_438._4_4_ = auVar131._4_4_;
    fStack_430 = auVar131._8_4_;
    fStack_42c = auVar131._12_4_;
    local_d8 = (float)local_438._0_4_ * auVar27._0_4_ * 3.0;
    fStack_d4 = (float)local_438._4_4_ * auVar27._4_4_ * 3.0;
    auVar37._4_4_ = fStack_d4;
    auVar37._0_4_ = local_d8;
    fStack_d0 = fStack_430 * auVar27._8_4_ * 3.0;
    auVar37._8_4_ = fStack_d0;
    fStack_cc = fStack_42c * auVar27._12_4_ * 3.0;
    auVar37._12_4_ = fStack_cc;
    fStack_c8 = (float)local_438._0_4_ * auVar27._16_4_ * 3.0;
    auVar37._16_4_ = fStack_c8;
    fStack_c4 = (float)local_438._4_4_ * auVar27._20_4_ * 3.0;
    auVar37._20_4_ = fStack_c4;
    fStack_c0 = fStack_430 * auVar27._24_4_ * 3.0;
    auVar37._24_4_ = fStack_c0;
    auVar37._28_4_ = auVar27._28_4_;
    fVar242 = (float)local_438._0_4_ * auVar110._0_4_ * 3.0;
    fVar243 = (float)local_438._4_4_ * auVar110._4_4_ * 3.0;
    auVar38._4_4_ = fVar243;
    auVar38._0_4_ = fVar242;
    fVar244 = fStack_430 * auVar110._8_4_ * 3.0;
    auVar38._8_4_ = fVar244;
    fVar245 = fStack_42c * auVar110._12_4_ * 3.0;
    auVar38._12_4_ = fVar245;
    fVar246 = (float)local_438._0_4_ * auVar110._16_4_ * 3.0;
    auVar38._16_4_ = fVar246;
    fVar247 = (float)local_438._4_4_ * auVar110._20_4_ * 3.0;
    auVar38._20_4_ = fVar247;
    fVar341 = fStack_430 * auVar110._24_4_ * 3.0;
    auVar38._24_4_ = fVar341;
    auVar38._28_4_ = auVar222._28_4_;
    auVar28 = vsubps_avx(local_78,auVar37);
    auVar110 = vperm2f128_avx(auVar28,auVar28,1);
    auVar110 = vshufps_avx(auVar110,auVar28,0x30);
    _local_498 = vshufps_avx(auVar28,auVar110,0x29);
    auVar28 = vsubps_avx(local_98,auVar38);
    auVar110 = vperm2f128_avx(auVar28,auVar28,1);
    auVar110 = vshufps_avx(auVar110,auVar28,0x30);
    _local_478 = vshufps_avx(auVar28,auVar110,0x29);
    fVar371 = auVar188._0_4_;
    fVar377 = auVar188._4_4_;
    fVar378 = auVar188._8_4_;
    fVar208 = auVar138._0_4_;
    fVar172 = auVar138._4_4_;
    fVar202 = auVar138._8_4_;
    fVar227 = auVar138._12_4_;
    fVar370 = auVar130._12_4_;
    auVar131 = vshufps_avx(auVar269,auVar269,0xaa);
    fVar146 = auVar131._0_4_;
    fVar201 = auVar131._4_4_;
    fVar226 = auVar131._8_4_;
    fVar206 = auVar131._12_4_;
    fVar355 = auVar314._0_4_ * fVar146 + fVar371 * fVar171;
    fVar356 = auVar314._4_4_ * fVar201 + fVar377 * fVar169;
    fVar358 = auVar314._8_4_ * fVar226 + fVar378 * fVar203;
    fVar360 = auVar314._12_4_ * fVar206 + auVar188._12_4_ * fVar204;
    fVar357 = auVar314._16_4_ * fVar146 + fVar371 * fVar207;
    fVar359 = auVar314._20_4_ * fVar201 + fVar377 * fVar229;
    fVar361 = auVar314._24_4_ * fVar226 + fVar378 * fVar230;
    fVar362 = fVar370 + fVar369 + fVar362;
    auVar131 = vshufps_avx(auVar269,auVar269,0xff);
    fVar200 = auVar131._0_4_;
    fVar225 = auVar131._4_4_;
    fVar170 = auVar131._8_4_;
    fVar228 = auVar131._12_4_;
    fVar342 = auVar314._0_4_ * fVar200 + fVar171 * fVar208;
    fVar260 = auVar314._4_4_ * fVar225 + fVar169 * fVar172;
    fVar343 = auVar314._8_4_ * fVar170 + fVar203 * fVar202;
    fVar261 = auVar314._12_4_ * fVar228 + fVar204 * fVar227;
    fVar353 = auVar314._16_4_ * fVar200 + fVar207 * fVar208;
    fVar262 = auVar314._20_4_ * fVar225 + fVar229 * fVar172;
    fVar354 = auVar314._24_4_ * fVar170 + fVar230 * fVar202;
    auVar131 = vshufps_avx(auVar182,auVar182,0xaa);
    auVar34 = vshufps_avx(auVar182,auVar182,0xff);
    fVar369 = auVar34._12_4_;
    auVar116._0_4_ =
         auVar314._0_4_ * fVar355 + fVar171 * (fVar371 * auVar314._0_4_ + auVar318._0_4_ * fVar171);
    auVar116._4_4_ =
         auVar314._4_4_ * fVar356 + fVar169 * (fVar377 * auVar314._4_4_ + auVar318._4_4_ * fVar169);
    auVar116._8_4_ =
         auVar314._8_4_ * fVar358 + fVar203 * (fVar378 * auVar314._8_4_ + auVar318._8_4_ * fVar203);
    auVar116._12_4_ =
         auVar314._12_4_ * fVar360 +
         fVar204 * (auVar188._12_4_ * auVar314._12_4_ + auVar318._12_4_ * fVar204);
    auVar116._16_4_ =
         auVar314._16_4_ * fVar357 +
         fVar207 * (fVar371 * auVar314._16_4_ + auVar318._0_4_ * fVar207);
    auVar116._20_4_ =
         auVar314._20_4_ * fVar359 +
         fVar229 * (fVar377 * auVar314._20_4_ + auVar318._4_4_ * fVar229);
    auVar116._24_4_ =
         auVar314._24_4_ * fVar361 +
         fVar230 * (fVar378 * auVar314._24_4_ + auVar318._8_4_ * fVar230);
    auVar116._28_4_ = fVar369 + auVar28._28_4_ + auVar110._28_4_;
    auVar368._0_4_ =
         auVar314._0_4_ * fVar342 + fVar171 * (auVar314._0_4_ * fVar208 + auVar130._0_4_ * fVar171);
    auVar368._4_4_ =
         auVar314._4_4_ * fVar260 + fVar169 * (auVar314._4_4_ * fVar172 + auVar130._4_4_ * fVar169);
    auVar368._8_4_ =
         auVar314._8_4_ * fVar343 + fVar203 * (auVar314._8_4_ * fVar202 + auVar130._8_4_ * fVar203);
    auVar368._12_4_ =
         auVar314._12_4_ * fVar261 + fVar204 * (auVar314._12_4_ * fVar227 + fVar370 * fVar204);
    auVar368._16_4_ =
         auVar314._16_4_ * fVar353 +
         fVar207 * (auVar314._16_4_ * fVar208 + auVar130._0_4_ * fVar207);
    auVar368._20_4_ =
         auVar314._20_4_ * fVar262 +
         fVar229 * (auVar314._20_4_ * fVar172 + auVar130._4_4_ * fVar229);
    auVar368._24_4_ =
         auVar314._24_4_ * fVar354 +
         fVar230 * (auVar314._24_4_ * fVar202 + auVar130._8_4_ * fVar230);
    auVar368._28_4_ = fVar369 + auVar110._28_4_ + auVar222._28_4_;
    auVar110 = vperm2f128_avx(local_78,local_78,1);
    auVar110 = vshufps_avx(auVar110,local_78,0x30);
    _local_398 = vshufps_avx(local_78,auVar110,0x29);
    auVar223._0_4_ =
         fVar171 * fVar355 + auVar314._0_4_ * (auVar131._0_4_ * auVar314._0_4_ + fVar171 * fVar146);
    auVar223._4_4_ =
         fVar169 * fVar356 + auVar314._4_4_ * (auVar131._4_4_ * auVar314._4_4_ + fVar169 * fVar201);
    auVar223._8_4_ =
         fVar203 * fVar358 + auVar314._8_4_ * (auVar131._8_4_ * auVar314._8_4_ + fVar203 * fVar226);
    auVar223._12_4_ =
         fVar204 * fVar360 +
         auVar314._12_4_ * (auVar131._12_4_ * auVar314._12_4_ + fVar204 * fVar206);
    auVar223._16_4_ =
         fVar207 * fVar357 +
         auVar314._16_4_ * (auVar131._0_4_ * auVar314._16_4_ + fVar207 * fVar146);
    auVar223._20_4_ =
         fVar229 * fVar359 +
         auVar314._20_4_ * (auVar131._4_4_ * auVar314._20_4_ + fVar229 * fVar201);
    auVar223._24_4_ =
         fVar230 * fVar361 +
         auVar314._24_4_ * (auVar131._8_4_ * auVar314._24_4_ + fVar230 * fVar226);
    auVar223._28_4_ = fVar362 + auVar131._12_4_ + fVar206;
    auVar259._0_4_ =
         fVar171 * fVar342 + auVar314._0_4_ * (auVar34._0_4_ * auVar314._0_4_ + fVar171 * fVar200);
    auVar259._4_4_ =
         fVar169 * fVar260 + auVar314._4_4_ * (auVar34._4_4_ * auVar314._4_4_ + fVar169 * fVar225);
    auVar259._8_4_ =
         fVar203 * fVar343 + auVar314._8_4_ * (auVar34._8_4_ * auVar314._8_4_ + fVar203 * fVar170);
    auVar259._12_4_ =
         fVar204 * fVar261 + auVar314._12_4_ * (fVar369 * auVar314._12_4_ + fVar204 * fVar228);
    auVar259._16_4_ =
         fVar207 * fVar353 + auVar314._16_4_ * (auVar34._0_4_ * auVar314._16_4_ + fVar207 * fVar200)
    ;
    auVar259._20_4_ =
         fVar229 * fVar262 + auVar314._20_4_ * (auVar34._4_4_ * auVar314._20_4_ + fVar229 * fVar225)
    ;
    auVar259._24_4_ =
         fVar230 * fVar354 + auVar314._24_4_ * (auVar34._8_4_ * auVar314._24_4_ + fVar230 * fVar170)
    ;
    auVar259._28_4_ = fVar370 + fVar227 + fVar369 + fVar228;
    auVar279._0_4_ = fVar171 * auVar116._0_4_ + auVar314._0_4_ * auVar223._0_4_;
    auVar279._4_4_ = fVar169 * auVar116._4_4_ + auVar314._4_4_ * auVar223._4_4_;
    auVar279._8_4_ = fVar203 * auVar116._8_4_ + auVar314._8_4_ * auVar223._8_4_;
    auVar279._12_4_ = fVar204 * auVar116._12_4_ + auVar314._12_4_ * auVar223._12_4_;
    auVar279._16_4_ = fVar207 * auVar116._16_4_ + auVar314._16_4_ * auVar223._16_4_;
    auVar279._20_4_ = fVar229 * auVar116._20_4_ + auVar314._20_4_ * auVar223._20_4_;
    auVar279._24_4_ = fVar230 * auVar116._24_4_ + auVar314._24_4_ * auVar223._24_4_;
    auVar279._28_4_ = fVar362 + fVar369 + fVar228;
    auVar299._0_4_ = fVar171 * auVar368._0_4_ + auVar314._0_4_ * auVar259._0_4_;
    auVar299._4_4_ = fVar169 * auVar368._4_4_ + auVar314._4_4_ * auVar259._4_4_;
    auVar299._8_4_ = fVar203 * auVar368._8_4_ + auVar314._8_4_ * auVar259._8_4_;
    auVar299._12_4_ = fVar204 * auVar368._12_4_ + auVar314._12_4_ * auVar259._12_4_;
    auVar299._16_4_ = fVar207 * auVar368._16_4_ + auVar314._16_4_ * auVar259._16_4_;
    auVar299._20_4_ = fVar229 * auVar368._20_4_ + auVar314._20_4_ * auVar259._20_4_;
    auVar299._24_4_ = fVar230 * auVar368._24_4_ + auVar314._24_4_ * auVar259._24_4_;
    auVar299._28_4_ = auVar26._28_4_ + auVar314._28_4_;
    auVar110 = vsubps_avx(auVar223,auVar116);
    auVar26 = vsubps_avx(auVar259,auVar368);
    local_f8 = (float)local_438._0_4_ * auVar110._0_4_ * 3.0;
    fStack_f4 = (float)local_438._4_4_ * auVar110._4_4_ * 3.0;
    auVar39._4_4_ = fStack_f4;
    auVar39._0_4_ = local_f8;
    fStack_f0 = fStack_430 * auVar110._8_4_ * 3.0;
    auVar39._8_4_ = fStack_f0;
    fStack_ec = fStack_42c * auVar110._12_4_ * 3.0;
    auVar39._12_4_ = fStack_ec;
    fStack_e8 = (float)local_438._0_4_ * auVar110._16_4_ * 3.0;
    auVar39._16_4_ = fStack_e8;
    fStack_e4 = (float)local_438._4_4_ * auVar110._20_4_ * 3.0;
    auVar39._20_4_ = fStack_e4;
    fStack_e0 = fStack_430 * auVar110._24_4_ * 3.0;
    auVar39._24_4_ = fStack_e0;
    auVar39._28_4_ = auVar259._28_4_;
    local_118 = (float)local_438._0_4_ * auVar26._0_4_ * 3.0;
    fStack_114 = (float)local_438._4_4_ * auVar26._4_4_ * 3.0;
    auVar40._4_4_ = fStack_114;
    auVar40._0_4_ = local_118;
    fStack_110 = fStack_430 * auVar26._8_4_ * 3.0;
    auVar40._8_4_ = fStack_110;
    fStack_10c = fStack_42c * auVar26._12_4_ * 3.0;
    auVar40._12_4_ = fStack_10c;
    fStack_108 = (float)local_438._0_4_ * auVar26._16_4_ * 3.0;
    auVar40._16_4_ = fStack_108;
    fStack_104 = (float)local_438._4_4_ * auVar26._20_4_ * 3.0;
    auVar40._20_4_ = fStack_104;
    fStack_430 = fStack_430 * auVar26._24_4_ * 3.0;
    auVar40._24_4_ = fStack_430;
    auVar40._28_4_ = fStack_42c;
    auVar110 = vperm2f128_avx(auVar279,auVar279,1);
    auVar110 = vshufps_avx(auVar110,auVar279,0x30);
    auVar30 = vshufps_avx(auVar279,auVar110,0x29);
    auVar26 = vsubps_avx(auVar279,auVar39);
    auVar110 = vperm2f128_avx(auVar26,auVar26,1);
    auVar110 = vshufps_avx(auVar110,auVar26,0x30);
    _local_4b8 = vshufps_avx(auVar26,auVar110,0x29);
    auVar26 = vsubps_avx(auVar299,auVar40);
    auVar110 = vperm2f128_avx(auVar26,auVar26,1);
    auVar110 = vshufps_avx(auVar110,auVar26,0x30);
    auVar31 = vshufps_avx(auVar26,auVar110,0x29);
    auVar28 = vsubps_avx(auVar279,local_78);
    auVar29 = vsubps_avx(auVar30,_local_398);
    fVar171 = auVar29._0_4_ + auVar28._0_4_;
    fVar208 = auVar29._4_4_ + auVar28._4_4_;
    fVar146 = auVar29._8_4_ + auVar28._8_4_;
    fVar200 = auVar29._12_4_ + auVar28._12_4_;
    fVar169 = auVar29._16_4_ + auVar28._16_4_;
    fVar172 = auVar29._20_4_ + auVar28._20_4_;
    fVar201 = auVar29._24_4_ + auVar28._24_4_;
    auVar26 = vperm2f128_avx(local_98,local_98,1);
    auVar26 = vshufps_avx(auVar26,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar26,0x29);
    auVar26 = vperm2f128_avx(auVar299,auVar299,1);
    auVar26 = vshufps_avx(auVar26,auVar299,0x30);
    auVar32 = vshufps_avx(auVar299,auVar26,0x29);
    auVar26 = vsubps_avx(auVar299,local_98);
    auVar33 = vsubps_avx(auVar32,local_b8);
    fVar225 = auVar26._0_4_ + auVar33._0_4_;
    fVar203 = auVar26._4_4_ + auVar33._4_4_;
    fVar202 = auVar26._8_4_ + auVar33._8_4_;
    fVar226 = auVar26._12_4_ + auVar33._12_4_;
    fVar170 = auVar26._16_4_ + auVar33._16_4_;
    fVar204 = auVar26._20_4_ + auVar33._20_4_;
    fVar227 = auVar26._24_4_ + auVar33._24_4_;
    fVar206 = auVar26._28_4_;
    auVar41._4_4_ = local_98._4_4_ * fVar208;
    auVar41._0_4_ = local_98._0_4_ * fVar171;
    auVar41._8_4_ = local_98._8_4_ * fVar146;
    auVar41._12_4_ = local_98._12_4_ * fVar200;
    auVar41._16_4_ = local_98._16_4_ * fVar169;
    auVar41._20_4_ = local_98._20_4_ * fVar172;
    auVar41._24_4_ = local_98._24_4_ * fVar201;
    auVar41._28_4_ = fVar206;
    auVar42._4_4_ = fVar203 * local_78._4_4_;
    auVar42._0_4_ = fVar225 * local_78._0_4_;
    auVar42._8_4_ = fVar202 * local_78._8_4_;
    auVar42._12_4_ = fVar226 * local_78._12_4_;
    auVar42._16_4_ = fVar170 * local_78._16_4_;
    auVar42._20_4_ = fVar204 * local_78._20_4_;
    auVar42._24_4_ = fVar227 * local_78._24_4_;
    auVar42._28_4_ = auVar110._28_4_;
    auVar110 = vsubps_avx(auVar41,auVar42);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar27._28_4_;
    fVar242 = local_98._0_4_ + fVar242;
    fVar243 = local_98._4_4_ + fVar243;
    fVar244 = local_98._8_4_ + fVar244;
    fVar245 = local_98._12_4_ + fVar245;
    fVar246 = local_98._16_4_ + fVar246;
    fVar247 = local_98._20_4_ + fVar247;
    fVar341 = local_98._24_4_ + fVar341;
    auVar43._4_4_ = fVar243 * fVar208;
    auVar43._0_4_ = fVar242 * fVar171;
    auVar43._8_4_ = fVar244 * fVar146;
    auVar43._12_4_ = fVar245 * fVar200;
    auVar43._16_4_ = fVar246 * fVar169;
    auVar43._20_4_ = fVar247 * fVar172;
    auVar43._24_4_ = fVar341 * fVar201;
    auVar43._28_4_ = fVar206;
    auVar44._4_4_ = fVar203 * fStack_d4;
    auVar44._0_4_ = fVar225 * local_d8;
    auVar44._8_4_ = fVar202 * fStack_d0;
    auVar44._12_4_ = fVar226 * fStack_cc;
    auVar44._16_4_ = fVar170 * fStack_c8;
    auVar44._20_4_ = fVar204 * fStack_c4;
    auVar44._24_4_ = fVar227 * fStack_c0;
    auVar44._28_4_ = fStack_bc;
    auVar27 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = local_478._4_4_ * fVar208;
    auVar45._0_4_ = local_478._0_4_ * fVar171;
    auVar45._8_4_ = local_478._8_4_ * fVar146;
    auVar45._12_4_ = local_478._12_4_ * fVar200;
    auVar45._16_4_ = local_478._16_4_ * fVar169;
    auVar45._20_4_ = local_478._20_4_ * fVar172;
    auVar45._24_4_ = local_478._24_4_ * fVar201;
    auVar45._28_4_ = fVar206;
    auVar46._4_4_ = fVar203 * (float)local_498._4_4_;
    auVar46._0_4_ = fVar225 * (float)local_498._0_4_;
    auVar46._8_4_ = fVar202 * fStack_490;
    auVar46._12_4_ = fVar226 * fStack_48c;
    auVar46._16_4_ = fVar170 * fStack_488;
    auVar46._20_4_ = fVar204 * fStack_484;
    auVar46._24_4_ = fVar227 * fStack_480;
    auVar46._28_4_ = 0x40400000;
    auVar35 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = local_b8._4_4_ * fVar208;
    auVar47._0_4_ = local_b8._0_4_ * fVar171;
    auVar47._8_4_ = local_b8._8_4_ * fVar146;
    auVar47._12_4_ = local_b8._12_4_ * fVar200;
    auVar47._16_4_ = local_b8._16_4_ * fVar169;
    auVar47._20_4_ = local_b8._20_4_ * fVar172;
    auVar47._24_4_ = local_b8._24_4_ * fVar201;
    auVar47._28_4_ = fVar206;
    auVar48._4_4_ = local_398._4_4_ * fVar203;
    auVar48._0_4_ = local_398._0_4_ * fVar225;
    auVar48._8_4_ = local_398._8_4_ * fVar202;
    auVar48._12_4_ = local_398._12_4_ * fVar226;
    auVar48._16_4_ = local_398._16_4_ * fVar170;
    auVar48._20_4_ = local_398._20_4_ * fVar204;
    auVar48._24_4_ = local_398._24_4_ * fVar227;
    auVar48._28_4_ = local_b8._28_4_;
    auVar36 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = auVar299._4_4_ * fVar208;
    auVar49._0_4_ = auVar299._0_4_ * fVar171;
    auVar49._8_4_ = auVar299._8_4_ * fVar146;
    auVar49._12_4_ = auVar299._12_4_ * fVar200;
    auVar49._16_4_ = auVar299._16_4_ * fVar169;
    auVar49._20_4_ = auVar299._20_4_ * fVar172;
    auVar49._24_4_ = auVar299._24_4_ * fVar201;
    auVar49._28_4_ = fVar206;
    auVar50._4_4_ = fVar203 * auVar279._4_4_;
    auVar50._0_4_ = fVar225 * auVar279._0_4_;
    auVar50._8_4_ = fVar202 * auVar279._8_4_;
    auVar50._12_4_ = fVar226 * auVar279._12_4_;
    auVar50._16_4_ = fVar170 * auVar279._16_4_;
    auVar50._20_4_ = fVar204 * auVar279._20_4_;
    auVar50._24_4_ = fVar227 * auVar279._24_4_;
    auVar50._28_4_ = local_478._28_4_;
    auVar111 = vsubps_avx(auVar49,auVar50);
    local_f8 = auVar279._0_4_ + local_f8;
    fStack_f4 = auVar279._4_4_ + fStack_f4;
    fStack_f0 = auVar279._8_4_ + fStack_f0;
    fStack_ec = auVar279._12_4_ + fStack_ec;
    fStack_e8 = auVar279._16_4_ + fStack_e8;
    fStack_e4 = auVar279._20_4_ + fStack_e4;
    fStack_e0 = auVar279._24_4_ + fStack_e0;
    fStack_dc = auVar279._28_4_ + auVar259._28_4_;
    local_118 = auVar299._0_4_ + local_118;
    fStack_114 = auVar299._4_4_ + fStack_114;
    fStack_110 = auVar299._8_4_ + fStack_110;
    fStack_10c = auVar299._12_4_ + fStack_10c;
    fStack_108 = auVar299._16_4_ + fStack_108;
    fStack_104 = auVar299._20_4_ + fStack_104;
    fStack_100 = auVar299._24_4_ + fStack_430;
    fStack_fc = auVar299._28_4_ + fStack_42c;
    auVar51._4_4_ = fStack_114 * fVar208;
    auVar51._0_4_ = local_118 * fVar171;
    auVar51._8_4_ = fStack_110 * fVar146;
    auVar51._12_4_ = fStack_10c * fVar200;
    auVar51._16_4_ = fStack_108 * fVar169;
    auVar51._20_4_ = fStack_104 * fVar172;
    auVar51._24_4_ = fStack_100 * fVar201;
    auVar51._28_4_ = auVar299._28_4_ + fStack_42c;
    auVar52._4_4_ = fStack_f4 * fVar203;
    auVar52._0_4_ = local_f8 * fVar225;
    auVar52._8_4_ = fStack_f0 * fVar202;
    auVar52._12_4_ = fStack_ec * fVar226;
    auVar52._16_4_ = fStack_e8 * fVar170;
    auVar52._20_4_ = fStack_e4 * fVar204;
    auVar52._24_4_ = fStack_e0 * fVar227;
    auVar52._28_4_ = fStack_dc;
    auVar112 = vsubps_avx(auVar51,auVar52);
    _local_438 = auVar31;
    auVar53._4_4_ = auVar31._4_4_ * fVar208;
    auVar53._0_4_ = auVar31._0_4_ * fVar171;
    auVar53._8_4_ = auVar31._8_4_ * fVar146;
    auVar53._12_4_ = auVar31._12_4_ * fVar200;
    auVar53._16_4_ = auVar31._16_4_ * fVar169;
    auVar53._20_4_ = auVar31._20_4_ * fVar172;
    auVar53._24_4_ = auVar31._24_4_ * fVar201;
    auVar53._28_4_ = fStack_dc;
    auVar54._4_4_ = fVar203 * local_4b8._4_4_;
    auVar54._0_4_ = fVar225 * local_4b8._0_4_;
    auVar54._8_4_ = fVar202 * local_4b8._8_4_;
    auVar54._12_4_ = fVar226 * local_4b8._12_4_;
    auVar54._16_4_ = fVar170 * local_4b8._16_4_;
    auVar54._20_4_ = fVar204 * local_4b8._20_4_;
    auVar54._24_4_ = fVar227 * local_4b8._24_4_;
    auVar54._28_4_ = local_4b8._28_4_;
    auVar141 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = auVar32._4_4_ * fVar208;
    auVar55._0_4_ = auVar32._0_4_ * fVar171;
    auVar55._8_4_ = auVar32._8_4_ * fVar146;
    auVar55._12_4_ = auVar32._12_4_ * fVar200;
    auVar55._16_4_ = auVar32._16_4_ * fVar169;
    auVar55._20_4_ = auVar32._20_4_ * fVar172;
    auVar55._24_4_ = auVar32._24_4_ * fVar201;
    auVar55._28_4_ = auVar29._28_4_ + auVar28._28_4_;
    auVar56._4_4_ = auVar30._4_4_ * fVar203;
    auVar56._0_4_ = auVar30._0_4_ * fVar225;
    auVar56._8_4_ = auVar30._8_4_ * fVar202;
    auVar56._12_4_ = auVar30._12_4_ * fVar226;
    auVar56._16_4_ = auVar30._16_4_ * fVar170;
    auVar56._20_4_ = auVar30._20_4_ * fVar204;
    auVar56._24_4_ = auVar30._24_4_ * fVar227;
    auVar56._28_4_ = fVar206 + auVar33._28_4_;
    auVar33 = vsubps_avx(auVar55,auVar56);
    auVar26 = vminps_avx(auVar110,auVar27);
    auVar110 = vmaxps_avx(auVar110,auVar27);
    auVar27 = vminps_avx(auVar35,auVar36);
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar35,auVar36);
    auVar110 = vmaxps_avx(auVar110,auVar26);
    auVar28 = vminps_avx(auVar111,auVar112);
    auVar26 = vmaxps_avx(auVar111,auVar112);
    auVar29 = vminps_avx(auVar141,auVar33);
    auVar28 = vminps_avx(auVar28,auVar29);
    auVar28 = vminps_avx(auVar27,auVar28);
    auVar27 = vmaxps_avx(auVar141,auVar33);
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar110,auVar26);
    auVar110 = vcmpps_avx(auVar28,local_138,2);
    auVar26 = vcmpps_avx(auVar26,local_158,5);
    auVar110 = vandps_avx(auVar26,auVar110);
    auVar26 = local_1b8 & auVar110;
    uVar86 = 0;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar26 = vsubps_avx(_local_398,local_78);
      auVar27 = vsubps_avx(auVar30,auVar279);
      fVar208 = auVar26._0_4_ + auVar27._0_4_;
      fVar146 = auVar26._4_4_ + auVar27._4_4_;
      fVar200 = auVar26._8_4_ + auVar27._8_4_;
      fVar169 = auVar26._12_4_ + auVar27._12_4_;
      fVar172 = auVar26._16_4_ + auVar27._16_4_;
      fVar201 = auVar26._20_4_ + auVar27._20_4_;
      fVar225 = auVar26._24_4_ + auVar27._24_4_;
      auVar28 = vsubps_avx(local_b8,local_98);
      auVar29 = vsubps_avx(auVar32,auVar299);
      fVar203 = auVar28._0_4_ + auVar29._0_4_;
      fVar202 = auVar28._4_4_ + auVar29._4_4_;
      fVar226 = auVar28._8_4_ + auVar29._8_4_;
      fVar170 = auVar28._12_4_ + auVar29._12_4_;
      fVar204 = auVar28._16_4_ + auVar29._16_4_;
      fVar227 = auVar28._20_4_ + auVar29._20_4_;
      fVar206 = auVar28._24_4_ + auVar29._24_4_;
      fVar171 = auVar29._28_4_;
      auVar57._4_4_ = local_98._4_4_ * fVar146;
      auVar57._0_4_ = local_98._0_4_ * fVar208;
      auVar57._8_4_ = local_98._8_4_ * fVar200;
      auVar57._12_4_ = local_98._12_4_ * fVar169;
      auVar57._16_4_ = local_98._16_4_ * fVar172;
      auVar57._20_4_ = local_98._20_4_ * fVar201;
      auVar57._24_4_ = local_98._24_4_ * fVar225;
      auVar57._28_4_ = local_98._28_4_;
      auVar58._4_4_ = local_78._4_4_ * fVar202;
      auVar58._0_4_ = local_78._0_4_ * fVar203;
      auVar58._8_4_ = local_78._8_4_ * fVar226;
      auVar58._12_4_ = local_78._12_4_ * fVar170;
      auVar58._16_4_ = local_78._16_4_ * fVar204;
      auVar58._20_4_ = local_78._20_4_ * fVar227;
      auVar58._24_4_ = local_78._24_4_ * fVar206;
      auVar58._28_4_ = local_78._28_4_;
      auVar29 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar243 * fVar146;
      auVar59._0_4_ = fVar242 * fVar208;
      auVar59._8_4_ = fVar244 * fVar200;
      auVar59._12_4_ = fVar245 * fVar169;
      auVar59._16_4_ = fVar246 * fVar172;
      auVar59._20_4_ = fVar247 * fVar201;
      auVar59._24_4_ = fVar341 * fVar225;
      auVar59._28_4_ = local_98._28_4_;
      auVar60._4_4_ = fVar202 * fStack_d4;
      auVar60._0_4_ = fVar203 * local_d8;
      auVar60._8_4_ = fVar226 * fStack_d0;
      auVar60._12_4_ = fVar170 * fStack_cc;
      auVar60._16_4_ = fVar204 * fStack_c8;
      auVar60._20_4_ = fVar227 * fStack_c4;
      auVar60._24_4_ = fVar206 * fStack_c0;
      auVar60._28_4_ = fVar171;
      auVar33 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar146 * local_478._4_4_;
      auVar61._0_4_ = fVar208 * local_478._0_4_;
      auVar61._8_4_ = fVar200 * local_478._8_4_;
      auVar61._12_4_ = fVar169 * local_478._12_4_;
      auVar61._16_4_ = fVar172 * local_478._16_4_;
      auVar61._20_4_ = fVar201 * local_478._20_4_;
      auVar61._24_4_ = fVar225 * local_478._24_4_;
      auVar61._28_4_ = fVar171;
      auVar62._4_4_ = fVar202 * (float)local_498._4_4_;
      auVar62._0_4_ = fVar203 * (float)local_498._0_4_;
      auVar62._8_4_ = fVar226 * fStack_490;
      auVar62._12_4_ = fVar170 * fStack_48c;
      auVar62._16_4_ = fVar204 * fStack_488;
      auVar62._20_4_ = fVar227 * fStack_484;
      auVar62._24_4_ = fVar206 * fStack_480;
      auVar62._28_4_ = local_98._28_4_ + auVar222._28_4_;
      auVar35 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = local_b8._4_4_ * fVar146;
      auVar63._0_4_ = local_b8._0_4_ * fVar208;
      auVar63._8_4_ = local_b8._8_4_ * fVar200;
      auVar63._12_4_ = local_b8._12_4_ * fVar169;
      auVar63._16_4_ = local_b8._16_4_ * fVar172;
      auVar63._20_4_ = local_b8._20_4_ * fVar201;
      auVar63._24_4_ = local_b8._24_4_ * fVar225;
      auVar63._28_4_ = local_98._28_4_ + auVar222._28_4_;
      auVar64._4_4_ = local_398._4_4_ * fVar202;
      auVar64._0_4_ = local_398._0_4_ * fVar203;
      auVar64._8_4_ = local_398._8_4_ * fVar226;
      auVar64._12_4_ = local_398._12_4_ * fVar170;
      auVar64._16_4_ = local_398._16_4_ * fVar204;
      auVar64._20_4_ = local_398._20_4_ * fVar227;
      uVar3 = local_398._28_4_;
      auVar64._24_4_ = local_398._24_4_ * fVar206;
      auVar64._28_4_ = uVar3;
      auVar36 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = auVar299._4_4_ * fVar146;
      auVar65._0_4_ = auVar299._0_4_ * fVar208;
      auVar65._8_4_ = auVar299._8_4_ * fVar200;
      auVar65._12_4_ = auVar299._12_4_ * fVar169;
      auVar65._16_4_ = auVar299._16_4_ * fVar172;
      auVar65._20_4_ = auVar299._20_4_ * fVar201;
      auVar65._24_4_ = auVar299._24_4_ * fVar225;
      auVar65._28_4_ = auVar299._28_4_;
      auVar66._4_4_ = auVar279._4_4_ * fVar202;
      auVar66._0_4_ = auVar279._0_4_ * fVar203;
      auVar66._8_4_ = auVar279._8_4_ * fVar226;
      auVar66._12_4_ = auVar279._12_4_ * fVar170;
      auVar66._16_4_ = auVar279._16_4_ * fVar204;
      auVar66._20_4_ = auVar279._20_4_ * fVar227;
      auVar66._24_4_ = auVar279._24_4_ * fVar206;
      auVar66._28_4_ = auVar279._28_4_;
      auVar111 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = fVar146 * fStack_114;
      auVar67._0_4_ = fVar208 * local_118;
      auVar67._8_4_ = fVar200 * fStack_110;
      auVar67._12_4_ = fVar169 * fStack_10c;
      auVar67._16_4_ = fVar172 * fStack_108;
      auVar67._20_4_ = fVar201 * fStack_104;
      auVar67._24_4_ = fVar225 * fStack_100;
      auVar67._28_4_ = auVar299._28_4_;
      auVar68._4_4_ = fVar202 * fStack_f4;
      auVar68._0_4_ = fVar203 * local_f8;
      auVar68._8_4_ = fVar226 * fStack_f0;
      auVar68._12_4_ = fVar170 * fStack_ec;
      auVar68._16_4_ = fVar204 * fStack_e8;
      auVar68._20_4_ = fVar227 * fStack_e4;
      auVar68._24_4_ = fVar206 * fStack_e0;
      auVar68._28_4_ = uVar3;
      auVar112 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = fVar146 * auVar31._4_4_;
      auVar69._0_4_ = fVar208 * auVar31._0_4_;
      auVar69._8_4_ = fVar200 * auVar31._8_4_;
      auVar69._12_4_ = fVar169 * auVar31._12_4_;
      auVar69._16_4_ = fVar172 * auVar31._16_4_;
      auVar69._20_4_ = fVar201 * auVar31._20_4_;
      auVar69._24_4_ = fVar225 * auVar31._24_4_;
      auVar69._28_4_ = uVar3;
      auVar70._4_4_ = fVar202 * local_4b8._4_4_;
      auVar70._0_4_ = fVar203 * local_4b8._0_4_;
      auVar70._8_4_ = fVar226 * local_4b8._8_4_;
      auVar70._12_4_ = fVar170 * local_4b8._12_4_;
      auVar70._16_4_ = fVar204 * local_4b8._16_4_;
      auVar70._20_4_ = fVar227 * local_4b8._20_4_;
      auVar70._24_4_ = fVar206 * local_4b8._24_4_;
      auVar70._28_4_ = local_b8._28_4_;
      auVar31 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = auVar32._4_4_ * fVar146;
      auVar71._0_4_ = auVar32._0_4_ * fVar208;
      auVar71._8_4_ = auVar32._8_4_ * fVar200;
      auVar71._12_4_ = auVar32._12_4_ * fVar169;
      auVar71._16_4_ = auVar32._16_4_ * fVar172;
      auVar71._20_4_ = auVar32._20_4_ * fVar201;
      auVar71._24_4_ = auVar32._24_4_ * fVar225;
      auVar71._28_4_ = auVar26._28_4_ + auVar27._28_4_;
      auVar72._4_4_ = auVar30._4_4_ * fVar202;
      auVar72._0_4_ = auVar30._0_4_ * fVar203;
      auVar72._8_4_ = auVar30._8_4_ * fVar226;
      auVar72._12_4_ = auVar30._12_4_ * fVar170;
      auVar72._16_4_ = auVar30._16_4_ * fVar204;
      auVar72._20_4_ = auVar30._20_4_ * fVar227;
      auVar72._24_4_ = auVar30._24_4_ * fVar206;
      auVar72._28_4_ = auVar28._28_4_ + fVar171;
      auVar32 = vsubps_avx(auVar71,auVar72);
      auVar27 = vminps_avx(auVar29,auVar33);
      auVar26 = vmaxps_avx(auVar29,auVar33);
      auVar28 = vminps_avx(auVar35,auVar36);
      auVar28 = vminps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar35,auVar36);
      auVar26 = vmaxps_avx(auVar26,auVar27);
      auVar29 = vminps_avx(auVar111,auVar112);
      auVar27 = vmaxps_avx(auVar111,auVar112);
      auVar30 = vminps_avx(auVar31,auVar32);
      auVar29 = vminps_avx(auVar29,auVar30);
      auVar29 = vminps_avx(auVar28,auVar29);
      auVar28 = vmaxps_avx(auVar31,auVar32);
      auVar27 = vmaxps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar26,auVar27);
      auVar26 = vcmpps_avx(auVar29,local_138,2);
      auVar27 = vcmpps_avx(auVar27,local_158,5);
      auVar26 = vandps_avx(auVar27,auVar26);
      auVar110 = vandps_avx(auVar110,local_1b8);
      auVar27 = auVar110 & auVar26;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar26,auVar110);
        uVar86 = vmovmskps_avx(auVar110);
      }
    }
    if (uVar86 != 0) {
      auStack_278[uVar87] = uVar86;
      uVar4 = vmovlps_avx(local_1f8);
      *(undefined8 *)(afStack_198 + uVar87 * 2) = uVar4;
      uVar91 = vmovlps_avx(_local_4d8);
      auStack_58[uVar87] = uVar91;
      uVar87 = (ulong)((int)uVar87 + 1);
    }
    do {
      if ((int)uVar87 == 0) {
        fVar171 = (ray->super_RayK<1>).tfar;
        auVar117._4_4_ = fVar171;
        auVar117._0_4_ = fVar171;
        auVar117._8_4_ = fVar171;
        auVar117._12_4_ = fVar171;
        auVar117._16_4_ = fVar171;
        auVar117._20_4_ = fVar171;
        auVar117._24_4_ = fVar171;
        auVar117._28_4_ = fVar171;
        auVar110 = vcmpps_avx(local_178,auVar117,2);
        uVar86 = vmovmskps_avx(auVar110);
        uVar85 = (uint)local_2e0 & uVar85 + 0xff & uVar86;
        if (uVar85 == 0) {
          return;
        }
        goto LAB_0129a532;
      }
      uVar88 = (int)uVar87 - 1;
      uVar89 = (ulong)uVar88;
      uVar86 = auStack_278[uVar89];
      fVar171 = afStack_198[uVar89 * 2];
      fVar208 = afStack_198[uVar89 * 2 + 1];
      register0x00001588 = 0;
      local_4d8 = (undefined1  [8])auStack_58[uVar89];
      uVar91 = 0;
      if (uVar86 != 0) {
        for (; (uVar86 >> uVar91 & 1) == 0; uVar91 = uVar91 + 1) {
        }
      }
      uVar86 = uVar86 - 1 & uVar86;
      auStack_278[uVar89] = uVar86;
      if (uVar86 == 0) {
        uVar87 = (ulong)uVar88;
      }
      auVar232._8_4_ = 0x3f800000;
      auVar232._0_8_ = &DAT_3f8000003f800000;
      auVar232._12_4_ = 0x3f800000;
      fVar200 = (float)(uVar91 + 1) * 0.14285715;
      fVar146 = (1.0 - (float)uVar91 * 0.14285715) * fVar171 + fVar208 * (float)uVar91 * 0.14285715;
      fVar171 = (1.0 - fVar200) * fVar171 + fVar208 * fVar200;
      fVar208 = fVar171 - fVar146;
      _local_498 = ZEXT432((uint)fVar146);
      auVar110 = _local_498;
      _local_498 = ZEXT416((uint)fVar146);
      auVar318 = _local_498;
      _local_498 = ZEXT416((uint)fVar146);
      auVar131 = _local_498;
      _local_498 = ZEXT416((uint)fVar146);
      _local_4b8 = ZEXT416((uint)fVar171);
      if (0.16666667 <= fVar208) break;
      auVar34 = vshufps_avx(_local_4d8,_local_4d8,0x50);
      auVar130 = vsubps_avx(auVar232,auVar34);
      fVar200 = auVar34._0_4_;
      fVar169 = auVar34._4_4_;
      fVar172 = auVar34._8_4_;
      fVar201 = auVar34._12_4_;
      fVar225 = auVar130._0_4_;
      fVar203 = auVar130._4_4_;
      fVar202 = auVar130._8_4_;
      fVar226 = auVar130._12_4_;
      auVar183._0_4_ = (float)local_308._0_4_ * fVar200 + fVar225 * (float)local_448._0_4_;
      auVar183._4_4_ = (float)local_308._4_4_ * fVar169 + fVar203 * (float)local_448._4_4_;
      auVar183._8_4_ = fStack_300 * fVar172 + fVar202 * fStack_440;
      auVar183._12_4_ = fStack_2fc * fVar201 + fVar226 * fStack_43c;
      auVar214._0_4_ = (float)local_318._0_4_ * fVar200 + fVar225 * (float)local_288._0_4_;
      auVar214._4_4_ = (float)local_318._4_4_ * fVar169 + fVar203 * (float)local_288._4_4_;
      auVar214._8_4_ = fStack_310 * fVar172 + fVar202 * fStack_280;
      auVar214._12_4_ = fStack_30c * fVar201 + fVar226 * fStack_27c;
      auVar233._0_4_ = (float)local_328._0_4_ * fVar200 + fVar225 * (float)local_458._0_4_;
      auVar233._4_4_ = (float)local_328._4_4_ * fVar169 + fVar203 * (float)local_458._4_4_;
      auVar233._8_4_ = fStack_320 * fVar172 + fVar202 * fStack_450;
      auVar233._12_4_ = fStack_31c * fVar201 + fVar226 * fStack_44c;
      auVar126._0_4_ = (float)local_338._0_4_ * fVar200 + (float)local_2f8._0_4_ * fVar225;
      auVar126._4_4_ = (float)local_338._4_4_ * fVar169 + (float)local_2f8._4_4_ * fVar203;
      auVar126._8_4_ = fStack_330 * fVar172 + fStack_2f0 * fVar202;
      auVar126._12_4_ = fStack_32c * fVar201 + fStack_2ec * fVar226;
      auVar166._16_16_ = auVar183;
      auVar166._0_16_ = auVar183;
      auVar197._16_16_ = auVar214;
      auVar197._0_16_ = auVar214;
      auVar224._16_16_ = auVar233;
      auVar224._0_16_ = auVar233;
      auVar26 = vshufps_avx(ZEXT2032(CONCAT416(fVar171,ZEXT416((uint)fVar146))),
                            ZEXT2032(CONCAT416(fVar171,ZEXT416((uint)fVar146))),0);
      auVar27 = vsubps_avx(auVar197,auVar166);
      fVar200 = auVar26._0_4_;
      fVar169 = auVar26._4_4_;
      fVar172 = auVar26._8_4_;
      fVar201 = auVar26._12_4_;
      fVar225 = auVar26._16_4_;
      fVar203 = auVar26._20_4_;
      fVar202 = auVar26._24_4_;
      auVar167._0_4_ = auVar183._0_4_ + auVar27._0_4_ * fVar200;
      auVar167._4_4_ = auVar183._4_4_ + auVar27._4_4_ * fVar169;
      auVar167._8_4_ = auVar183._8_4_ + auVar27._8_4_ * fVar172;
      auVar167._12_4_ = auVar183._12_4_ + auVar27._12_4_ * fVar201;
      auVar167._16_4_ = auVar183._0_4_ + auVar27._16_4_ * fVar225;
      auVar167._20_4_ = auVar183._4_4_ + auVar27._20_4_ * fVar203;
      auVar167._24_4_ = auVar183._8_4_ + auVar27._24_4_ * fVar202;
      auVar167._28_4_ = auVar183._12_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar224,auVar197);
      auVar198._0_4_ = auVar214._0_4_ + auVar27._0_4_ * fVar200;
      auVar198._4_4_ = auVar214._4_4_ + auVar27._4_4_ * fVar169;
      auVar198._8_4_ = auVar214._8_4_ + auVar27._8_4_ * fVar172;
      auVar198._12_4_ = auVar214._12_4_ + auVar27._12_4_ * fVar201;
      auVar198._16_4_ = auVar214._0_4_ + auVar27._16_4_ * fVar225;
      auVar198._20_4_ = auVar214._4_4_ + auVar27._20_4_ * fVar203;
      auVar198._24_4_ = auVar214._8_4_ + auVar27._24_4_ * fVar202;
      auVar198._28_4_ = auVar214._12_4_ + auVar27._28_4_;
      auVar34 = vsubps_avx(auVar126,auVar233);
      auVar144._0_4_ = auVar233._0_4_ + auVar34._0_4_ * fVar200;
      auVar144._4_4_ = auVar233._4_4_ + auVar34._4_4_ * fVar169;
      auVar144._8_4_ = auVar233._8_4_ + auVar34._8_4_ * fVar172;
      auVar144._12_4_ = auVar233._12_4_ + auVar34._12_4_ * fVar201;
      auVar144._16_4_ = auVar233._0_4_ + auVar34._0_4_ * fVar225;
      auVar144._20_4_ = auVar233._4_4_ + auVar34._4_4_ * fVar203;
      auVar144._24_4_ = auVar233._8_4_ + auVar34._8_4_ * fVar202;
      auVar144._28_4_ = auVar233._12_4_ + auVar34._12_4_;
      auVar27 = vsubps_avx(auVar198,auVar167);
      auVar168._0_4_ = auVar167._0_4_ + fVar200 * auVar27._0_4_;
      auVar168._4_4_ = auVar167._4_4_ + fVar169 * auVar27._4_4_;
      auVar168._8_4_ = auVar167._8_4_ + fVar172 * auVar27._8_4_;
      auVar168._12_4_ = auVar167._12_4_ + fVar201 * auVar27._12_4_;
      auVar168._16_4_ = auVar167._16_4_ + fVar225 * auVar27._16_4_;
      auVar168._20_4_ = auVar167._20_4_ + fVar203 * auVar27._20_4_;
      auVar168._24_4_ = auVar167._24_4_ + fVar202 * auVar27._24_4_;
      auVar168._28_4_ = auVar167._28_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar144,auVar198);
      auVar145._0_4_ = auVar198._0_4_ + fVar200 * auVar27._0_4_;
      auVar145._4_4_ = auVar198._4_4_ + fVar169 * auVar27._4_4_;
      auVar145._8_4_ = auVar198._8_4_ + fVar172 * auVar27._8_4_;
      auVar145._12_4_ = auVar198._12_4_ + fVar201 * auVar27._12_4_;
      auVar145._16_4_ = auVar198._16_4_ + fVar225 * auVar27._16_4_;
      auVar145._20_4_ = auVar198._20_4_ + fVar203 * auVar27._20_4_;
      auVar145._24_4_ = auVar198._24_4_ + fVar202 * auVar27._24_4_;
      auVar145._28_4_ = auVar198._28_4_ + auVar27._28_4_;
      auVar27 = vsubps_avx(auVar145,auVar168);
      auVar184._0_4_ = auVar168._0_4_ + fVar200 * auVar27._0_4_;
      auVar184._4_4_ = auVar168._4_4_ + fVar169 * auVar27._4_4_;
      auVar184._8_4_ = auVar168._8_4_ + fVar172 * auVar27._8_4_;
      auVar184._12_4_ = auVar168._12_4_ + fVar201 * auVar27._12_4_;
      auVar199._16_4_ = auVar168._16_4_ + fVar225 * auVar27._16_4_;
      auVar199._0_16_ = auVar184;
      auVar199._20_4_ = auVar168._20_4_ + fVar203 * auVar27._20_4_;
      auVar199._24_4_ = auVar168._24_4_ + fVar202 * auVar27._24_4_;
      auVar199._28_4_ = auVar168._28_4_ + auVar198._28_4_;
      fVar200 = auVar27._4_4_ * 3.0;
      auVar205 = auVar199._16_16_;
      auVar129 = vshufps_avx(ZEXT416((uint)(fVar208 * 0.33333334)),
                             ZEXT416((uint)(fVar208 * 0.33333334)),0);
      auVar302._0_4_ = auVar184._0_4_ + auVar129._0_4_ * auVar27._0_4_ * 3.0;
      auVar302._4_4_ = auVar184._4_4_ + auVar129._4_4_ * fVar200;
      auVar302._8_4_ = auVar184._8_4_ + auVar129._8_4_ * auVar27._8_4_ * 3.0;
      auVar302._12_4_ = auVar184._12_4_ + auVar129._12_4_ * auVar27._12_4_ * 3.0;
      auVar188 = vshufpd_avx(auVar184,auVar184,3);
      auVar138 = vshufpd_avx(auVar205,auVar205,3);
      _local_398 = auVar188;
      auVar28 = _local_398;
      auVar34 = vsubps_avx(auVar188,auVar184);
      _local_478 = auVar138;
      auVar130 = vsubps_avx(auVar138,auVar205);
      auVar127._0_4_ = auVar34._0_4_ + auVar130._0_4_;
      auVar127._4_4_ = auVar34._4_4_ + auVar130._4_4_;
      auVar127._8_4_ = auVar34._8_4_ + auVar130._8_4_;
      auVar127._12_4_ = auVar34._12_4_ + auVar130._12_4_;
      auVar34 = vmovshdup_avx(auVar184);
      auVar130 = vmovshdup_avx(auVar302);
      auVar108 = vshufps_avx(auVar127,auVar127,0);
      auVar374 = vshufps_avx(auVar127,auVar127,0x55);
      fVar203 = auVar374._0_4_;
      fVar202 = auVar374._4_4_;
      fVar226 = auVar374._8_4_;
      fVar170 = auVar374._12_4_;
      fVar169 = auVar108._0_4_;
      fVar172 = auVar108._4_4_;
      fVar201 = auVar108._8_4_;
      fVar225 = auVar108._12_4_;
      auVar287._0_4_ = fVar169 * auVar184._0_4_ + fVar203 * auVar34._0_4_;
      auVar287._4_4_ = fVar172 * auVar184._4_4_ + fVar202 * auVar34._4_4_;
      auVar287._8_4_ = fVar201 * auVar184._8_4_ + fVar226 * auVar34._8_4_;
      auVar287._12_4_ = fVar225 * auVar184._12_4_ + fVar170 * auVar34._12_4_;
      _local_438 = auVar302;
      auVar303._0_4_ = auVar302._0_4_ * fVar169 + fVar203 * auVar130._0_4_;
      auVar303._4_4_ = auVar302._4_4_ * fVar172 + fVar202 * auVar130._4_4_;
      auVar303._8_4_ = auVar302._8_4_ * fVar201 + fVar226 * auVar130._8_4_;
      auVar303._12_4_ = auVar302._12_4_ * fVar225 + fVar170 * auVar130._12_4_;
      auVar130 = vshufps_avx(auVar287,auVar287,0xe8);
      auVar108 = vshufps_avx(auVar303,auVar303,0xe8);
      auVar34 = vcmpps_avx(auVar130,auVar108,1);
      uVar86 = vextractps_avx(auVar34,0);
      auVar374 = auVar303;
      if ((uVar86 & 1) == 0) {
        auVar374 = auVar287;
      }
      auVar128._0_4_ = auVar129._0_4_ * auVar27._16_4_ * 3.0;
      auVar128._4_4_ = auVar129._4_4_ * fVar200;
      auVar128._8_4_ = auVar129._8_4_ * auVar27._24_4_ * 3.0;
      auVar128._12_4_ = auVar129._12_4_ * auVar26._28_4_;
      auVar7 = vsubps_avx(auVar205,auVar128);
      auVar129 = vmovshdup_avx(auVar7);
      auVar205 = vmovshdup_avx(auVar205);
      fVar200 = auVar7._0_4_;
      fVar204 = auVar7._4_4_;
      auVar381._0_4_ = fVar169 * fVar200 + fVar203 * auVar129._0_4_;
      auVar381._4_4_ = fVar172 * fVar204 + fVar202 * auVar129._4_4_;
      auVar381._8_4_ = fVar201 * auVar7._8_4_ + fVar226 * auVar129._8_4_;
      auVar381._12_4_ = fVar225 * auVar7._12_4_ + fVar170 * auVar129._12_4_;
      auVar363._0_4_ = fVar169 * auVar199._16_4_ + fVar203 * auVar205._0_4_;
      auVar363._4_4_ = fVar172 * auVar199._20_4_ + fVar202 * auVar205._4_4_;
      auVar363._8_4_ = fVar201 * auVar199._24_4_ + fVar226 * auVar205._8_4_;
      auVar363._12_4_ = fVar225 * auVar199._28_4_ + fVar170 * auVar205._12_4_;
      auVar205 = vshufps_avx(auVar381,auVar381,0xe8);
      auVar6 = vshufps_avx(auVar363,auVar363,0xe8);
      auVar129 = vcmpps_avx(auVar205,auVar6,1);
      uVar86 = vextractps_avx(auVar129,0);
      auVar270 = auVar363;
      if ((uVar86 & 1) == 0) {
        auVar270 = auVar381;
      }
      auVar374 = vmaxss_avx(auVar270,auVar374);
      auVar130 = vminps_avx(auVar130,auVar108);
      auVar108 = vminps_avx(auVar205,auVar6);
      auVar108 = vminps_avx(auVar130,auVar108);
      auVar34 = vshufps_avx(auVar34,auVar34,0x55);
      auVar34 = vblendps_avx(auVar34,auVar129,2);
      auVar129 = vpslld_avx(auVar34,0x1f);
      auVar34 = vshufpd_avx(auVar303,auVar303,1);
      auVar34 = vinsertps_avx(auVar34,auVar363,0x9c);
      auVar130 = vshufpd_avx(auVar287,auVar287,1);
      auVar130 = vinsertps_avx(auVar130,auVar381,0x9c);
      auVar34 = vblendvps_avx(auVar130,auVar34,auVar129);
      auVar130 = vmovshdup_avx(auVar34);
      auVar34 = vmaxss_avx(auVar130,auVar34);
      fVar201 = auVar108._0_4_;
      auVar130 = vmovshdup_avx(auVar108);
      fVar172 = auVar34._0_4_;
      fVar225 = auVar130._0_4_;
      fVar169 = auVar374._0_4_;
      _local_398 = auVar28;
      _local_498 = auVar131;
      if ((0.0001 <= fVar201) || (fVar172 <= -0.0001)) {
        if ((-0.0001 < fVar169 && fVar225 < 0.0001) ||
           ((fVar201 < 0.0001 && -0.0001 < fVar169 || (fVar225 < 0.0001 && -0.0001 < fVar172))))
        goto LAB_0129bb55;
LAB_0129c5aa:
        bVar73 = true;
      }
      else {
LAB_0129bb55:
        auVar130 = vcmpps_avx(auVar108,ZEXT816(0) << 0x20,1);
        auVar131 = vcmpss_avx(auVar374,ZEXT416(0),1);
        auVar382._8_4_ = 0x3f800000;
        auVar382._0_8_ = &DAT_3f8000003f800000;
        auVar382._12_4_ = 0x3f800000;
        auVar234._8_4_ = 0xbf800000;
        auVar234._0_8_ = 0xbf800000bf800000;
        auVar234._12_4_ = 0xbf800000;
        auVar131 = vblendvps_avx(auVar382,auVar234,auVar131);
        auVar130 = vblendvps_avx(auVar382,auVar234,auVar130);
        auVar129 = vcmpss_avx(auVar131,auVar130,4);
        auVar129 = vpshufd_avx(ZEXT416(auVar129._0_4_ & 1),0x50);
        auVar129 = vpslld_avx(auVar129,0x1f);
        auVar129 = vpsrad_avx(auVar129,0x1f);
        auVar129 = vpandn_avx(auVar129,_DAT_02020eb0);
        auVar205 = vmovshdup_avx(auVar130);
        fVar203 = auVar205._0_4_;
        if ((auVar130._0_4_ != fVar203) || (NAN(auVar130._0_4_) || NAN(fVar203))) {
          if ((fVar225 != fVar201) || (NAN(fVar225) || NAN(fVar201))) {
            fVar201 = -fVar201 / (fVar225 - fVar201);
            auVar130 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar201) * 0.0 + fVar201)));
          }
          else {
            auVar130 = vcmpss_avx(auVar108,ZEXT416(0),0);
            auVar130 = vpshufd_avx(ZEXT416(auVar130._0_4_ & 1),0x50);
            auVar130 = vpslld_avx(auVar130,0x1f);
            auVar130 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar130);
          }
          auVar205 = vcmpps_avx(auVar129,auVar130,1);
          auVar108 = vblendps_avx(auVar129,auVar130,2);
          auVar130 = vblendps_avx(auVar130,auVar129,2);
          auVar129 = vblendvps_avx(auVar130,auVar108,auVar205);
        }
        auVar34 = vcmpss_avx(auVar34,ZEXT416(0),1);
        auVar157._8_4_ = 0xbf800000;
        auVar157._0_8_ = 0xbf800000bf800000;
        auVar157._12_4_ = 0xbf800000;
        auVar34 = vblendvps_avx(auVar382,auVar157,auVar34);
        fVar201 = auVar34._0_4_;
        if ((auVar131._0_4_ != fVar201) || (NAN(auVar131._0_4_) || NAN(fVar201))) {
          if ((fVar172 != fVar169) || (NAN(fVar172) || NAN(fVar169))) {
            fVar169 = -fVar169 / (fVar172 - fVar169);
            auVar131 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar169) * 0.0 + fVar169)));
          }
          else {
            auVar131 = vcmpss_avx(auVar374,ZEXT416(0),0);
            auVar131 = vpshufd_avx(ZEXT416(auVar131._0_4_ & 1),0x50);
            auVar131 = vpslld_avx(auVar131,0x1f);
            auVar131 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar131);
          }
          auVar130 = vcmpps_avx(auVar129,auVar131,1);
          auVar34 = vblendps_avx(auVar129,auVar131,2);
          auVar131 = vblendps_avx(auVar131,auVar129,2);
          auVar129 = vblendvps_avx(auVar131,auVar34,auVar130);
        }
        if ((fVar203 != fVar201) || (NAN(fVar203) || NAN(fVar201))) {
          auVar131 = vcmpps_avx(auVar129,auVar382,1);
          auVar34 = vinsertps_avx(auVar129,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar235._4_12_ = auVar129._4_12_;
          auVar235._0_4_ = 0x3f800000;
          auVar129 = vblendvps_avx(auVar235,auVar34,auVar131);
        }
        auVar131 = vcmpps_avx(auVar129,_DAT_01fec6f0,1);
        auVar74._12_4_ = 0;
        auVar74._0_12_ = auVar129._4_12_;
        auVar34 = vinsertps_avx(auVar129,ZEXT416(0x3f800000),0x10);
        auVar131 = vblendvps_avx(auVar34,auVar74 << 0x20,auVar131);
        auVar34 = vmovshdup_avx(auVar131);
        bVar73 = true;
        if (auVar131._0_4_ <= auVar34._0_4_) {
          auVar132._0_4_ = auVar131._0_4_ + -0.1;
          auVar132._4_4_ = auVar131._4_4_ + 0.1;
          auVar132._8_4_ = auVar131._8_4_ + 0.0;
          auVar132._12_4_ = auVar131._12_4_ + 0.0;
          auVar130 = vshufpd_avx(auVar302,auVar302,3);
          register0x000012c8 = 0x3f80000000000000;
          local_438 = 0x3f80000000000000;
          auVar131 = vcmpps_avx(auVar132,_local_438,1);
          auVar75._12_4_ = 0;
          auVar75._0_12_ = auVar132._4_12_;
          auVar34 = vinsertps_avx(auVar132,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar131 = vblendvps_avx(auVar34,auVar75 << 0x20,auVar131);
          auVar34 = vshufpd_avx(auVar7,auVar7,3);
          auVar129 = vshufps_avx(auVar131,auVar131,0x50);
          auVar108 = vsubps_avx(auVar382,auVar129);
          local_398._0_4_ = auVar188._0_4_;
          local_398._4_4_ = auVar188._4_4_;
          fStack_390 = auVar188._8_4_;
          fStack_38c = auVar188._12_4_;
          fVar169 = auVar129._0_4_;
          fVar172 = auVar129._4_4_;
          fVar201 = auVar129._8_4_;
          fVar225 = auVar129._12_4_;
          local_478._0_4_ = auVar138._0_4_;
          local_478._4_4_ = auVar138._4_4_;
          fStack_470 = auVar138._8_4_;
          fStack_46c = auVar138._12_4_;
          fVar203 = auVar108._0_4_;
          fVar202 = auVar108._4_4_;
          fVar226 = auVar108._8_4_;
          fVar170 = auVar108._12_4_;
          auVar158._0_4_ = fVar169 * (float)local_398._0_4_ + fVar203 * auVar184._0_4_;
          auVar158._4_4_ = fVar172 * (float)local_398._4_4_ + fVar202 * auVar184._4_4_;
          auVar158._8_4_ = fVar201 * fStack_390 + fVar226 * auVar184._0_4_;
          auVar158._12_4_ = fVar225 * fStack_38c + fVar170 * auVar184._4_4_;
          auVar215._0_4_ = fVar169 * auVar130._0_4_ + fVar203 * auVar302._0_4_;
          auVar215._4_4_ = fVar172 * auVar130._4_4_ + fVar202 * auVar302._4_4_;
          auVar215._8_4_ = fVar201 * auVar130._8_4_ + fVar226 * auVar302._0_4_;
          auVar215._12_4_ = fVar225 * auVar130._12_4_ + fVar170 * auVar302._4_4_;
          auVar271._0_4_ = fVar169 * auVar34._0_4_ + fVar203 * fVar200;
          auVar271._4_4_ = fVar172 * auVar34._4_4_ + fVar202 * fVar204;
          auVar271._8_4_ = fVar201 * auVar34._8_4_ + fVar226 * fVar200;
          auVar271._12_4_ = fVar225 * auVar34._12_4_ + fVar170 * fVar204;
          auVar288._0_4_ = fVar169 * (float)local_478._0_4_ + fVar203 * auVar199._16_4_;
          auVar288._4_4_ = fVar172 * (float)local_478._4_4_ + fVar202 * auVar199._20_4_;
          auVar288._8_4_ = fVar201 * fStack_470 + fVar226 * auVar199._16_4_;
          auVar288._12_4_ = fVar225 * fStack_46c + fVar170 * auVar199._20_4_;
          auVar188 = vsubps_avx(auVar382,auVar131);
          auVar34 = vmovshdup_avx(_local_4d8);
          auVar130 = vmovsldup_avx(_local_4d8);
          local_4d8._0_4_ = auVar188._0_4_ * auVar130._0_4_ + auVar34._0_4_ * auVar131._0_4_;
          local_4d8._4_4_ = auVar188._4_4_ * auVar130._4_4_ + auVar34._4_4_ * auVar131._4_4_;
          fStack_4d0 = auVar188._8_4_ * auVar130._8_4_ + auVar34._8_4_ * auVar131._8_4_;
          fStack_4cc = auVar188._12_4_ * auVar130._12_4_ + auVar34._12_4_ * auVar131._12_4_;
          _local_478 = vmovshdup_avx(_local_4d8);
          auVar131 = vsubps_avx(auVar215,auVar158);
          auVar236._0_4_ = auVar131._0_4_ * 3.0;
          auVar236._4_4_ = auVar131._4_4_ * 3.0;
          auVar236._8_4_ = auVar131._8_4_ * 3.0;
          auVar236._12_4_ = auVar131._12_4_ * 3.0;
          auVar131 = vsubps_avx(auVar271,auVar215);
          auVar254._0_4_ = auVar131._0_4_ * 3.0;
          auVar254._4_4_ = auVar131._4_4_ * 3.0;
          auVar254._8_4_ = auVar131._8_4_ * 3.0;
          auVar254._12_4_ = auVar131._12_4_ * 3.0;
          auVar131 = vsubps_avx(auVar288,auVar271);
          auVar304._0_4_ = auVar131._0_4_ * 3.0;
          auVar304._4_4_ = auVar131._4_4_ * 3.0;
          auVar304._8_4_ = auVar131._8_4_ * 3.0;
          auVar304._12_4_ = auVar131._12_4_ * 3.0;
          auVar34 = vminps_avx(auVar254,auVar304);
          auVar131 = vmaxps_avx(auVar254,auVar304);
          auVar34 = vminps_avx(auVar236,auVar34);
          auVar131 = vmaxps_avx(auVar236,auVar131);
          auVar130 = vshufpd_avx(auVar34,auVar34,3);
          auVar188 = vshufpd_avx(auVar131,auVar131,3);
          auVar34 = vminps_avx(auVar34,auVar130);
          auVar131 = vmaxps_avx(auVar131,auVar188);
          auVar130 = vshufps_avx(ZEXT416((uint)(1.0 / fVar208)),ZEXT416((uint)(1.0 / fVar208)),0);
          auVar237._0_4_ = auVar130._0_4_ * auVar34._0_4_;
          auVar237._4_4_ = auVar130._4_4_ * auVar34._4_4_;
          auVar237._8_4_ = auVar130._8_4_ * auVar34._8_4_;
          auVar237._12_4_ = auVar130._12_4_ * auVar34._12_4_;
          auVar255._0_4_ = auVar131._0_4_ * auVar130._0_4_;
          auVar255._4_4_ = auVar131._4_4_ * auVar130._4_4_;
          auVar255._8_4_ = auVar131._8_4_ * auVar130._8_4_;
          auVar255._12_4_ = auVar131._12_4_ * auVar130._12_4_;
          auVar108 = ZEXT416((uint)(1.0 / (local_478._0_4_ - (float)local_4d8._0_4_)));
          auVar131 = vshufpd_avx(auVar158,auVar158,3);
          auVar34 = vshufpd_avx(auVar215,auVar215,3);
          auVar130 = vshufpd_avx(auVar271,auVar271,3);
          auVar188 = vshufpd_avx(auVar288,auVar288,3);
          auVar131 = vsubps_avx(auVar131,auVar158);
          auVar138 = vsubps_avx(auVar34,auVar215);
          auVar129 = vsubps_avx(auVar130,auVar271);
          auVar188 = vsubps_avx(auVar188,auVar288);
          auVar34 = vminps_avx(auVar131,auVar138);
          auVar131 = vmaxps_avx(auVar131,auVar138);
          auVar130 = vminps_avx(auVar129,auVar188);
          auVar130 = vminps_avx(auVar34,auVar130);
          auVar34 = vmaxps_avx(auVar129,auVar188);
          auVar131 = vmaxps_avx(auVar131,auVar34);
          auVar34 = vshufps_avx(auVar108,auVar108,0);
          auVar321._0_4_ = auVar34._0_4_ * auVar130._0_4_;
          auVar321._4_4_ = auVar34._4_4_ * auVar130._4_4_;
          auVar321._8_4_ = auVar34._8_4_ * auVar130._8_4_;
          auVar321._12_4_ = auVar34._12_4_ * auVar130._12_4_;
          auVar331._0_4_ = auVar34._0_4_ * auVar131._0_4_;
          auVar331._4_4_ = auVar34._4_4_ * auVar131._4_4_;
          auVar331._8_4_ = auVar34._8_4_ * auVar131._8_4_;
          auVar331._12_4_ = auVar34._12_4_ * auVar131._12_4_;
          auVar131 = vmovsldup_avx(_local_4d8);
          auVar272._4_12_ = auVar131._4_12_;
          auVar272._0_4_ = fVar146;
          auVar289._4_12_ = local_4d8._4_12_;
          auVar289._0_4_ = fVar171;
          auVar109._0_4_ = (fVar171 + fVar146) * 0.5;
          auVar109._4_4_ = ((float)local_4d8._4_4_ + auVar131._4_4_) * 0.5;
          auVar109._8_4_ = (fStack_4d0 + auVar131._8_4_) * 0.5;
          auVar109._12_4_ = (fStack_4cc + auVar131._12_4_) * 0.5;
          auVar131 = vshufps_avx(auVar109,auVar109,0);
          fVar200 = auVar131._0_4_;
          fVar169 = auVar131._4_4_;
          fVar172 = auVar131._8_4_;
          fVar201 = auVar131._12_4_;
          auVar216._0_4_ = fVar200 * (float)local_1c8._0_4_ + (float)local_3f8._0_4_;
          auVar216._4_4_ = fVar169 * (float)local_1c8._4_4_ + (float)local_3f8._4_4_;
          auVar216._8_4_ = fVar172 * fStack_1c0 + fStack_3f0;
          auVar216._12_4_ = fVar201 * fStack_1bc + fStack_3ec;
          auVar305._0_4_ = fVar200 * (float)local_1d8._0_4_ + (float)local_408._0_4_;
          auVar305._4_4_ = fVar169 * (float)local_1d8._4_4_ + (float)local_408._4_4_;
          auVar305._8_4_ = fVar172 * fStack_1d0 + fStack_400;
          auVar305._12_4_ = fVar201 * fStack_1cc + fStack_3fc;
          auVar348._0_4_ = fVar200 * (float)local_1e8._0_4_ + (float)local_418._0_4_;
          auVar348._4_4_ = fVar169 * (float)local_1e8._4_4_ + (float)local_418._4_4_;
          auVar348._8_4_ = fVar172 * fStack_1e0 + fStack_410;
          auVar348._12_4_ = fVar201 * fStack_1dc + fStack_40c;
          auVar131 = vsubps_avx(auVar305,auVar216);
          auVar217._0_4_ = auVar131._0_4_ * fVar200 + auVar216._0_4_;
          auVar217._4_4_ = auVar131._4_4_ * fVar169 + auVar216._4_4_;
          auVar217._8_4_ = auVar131._8_4_ * fVar172 + auVar216._8_4_;
          auVar217._12_4_ = auVar131._12_4_ * fVar201 + auVar216._12_4_;
          auVar131 = vsubps_avx(auVar348,auVar305);
          auVar306._0_4_ = auVar305._0_4_ + auVar131._0_4_ * fVar200;
          auVar306._4_4_ = auVar305._4_4_ + auVar131._4_4_ * fVar169;
          auVar306._8_4_ = auVar305._8_4_ + auVar131._8_4_ * fVar172;
          auVar306._12_4_ = auVar305._12_4_ + auVar131._12_4_ * fVar201;
          auVar131 = vsubps_avx(auVar306,auVar217);
          fVar200 = auVar217._0_4_ + auVar131._0_4_ * fVar200;
          fVar169 = auVar217._4_4_ + auVar131._4_4_ * fVar169;
          auVar159._0_8_ = CONCAT44(fVar169,fVar200);
          auVar159._8_4_ = auVar217._8_4_ + auVar131._8_4_ * fVar172;
          auVar159._12_4_ = auVar217._12_4_ + auVar131._12_4_ * fVar201;
          fVar172 = auVar131._0_4_ * 3.0;
          fVar201 = auVar131._4_4_ * 3.0;
          auVar218._0_8_ = CONCAT44(fVar201,fVar172);
          auVar218._8_4_ = auVar131._8_4_ * 3.0;
          auVar218._12_4_ = auVar131._12_4_ * 3.0;
          auVar307._8_8_ = auVar159._0_8_;
          auVar307._0_8_ = auVar159._0_8_;
          auVar131 = vshufpd_avx(auVar159,auVar159,3);
          auVar34 = vshufps_avx(auVar109,auVar109,0x55);
          auVar129 = vsubps_avx(auVar131,auVar307);
          auVar308._0_4_ = auVar34._0_4_ * auVar129._0_4_ + fVar200;
          auVar308._4_4_ = auVar34._4_4_ * auVar129._4_4_ + fVar169;
          auVar308._8_4_ = auVar34._8_4_ * auVar129._8_4_ + fVar200;
          auVar308._12_4_ = auVar34._12_4_ * auVar129._12_4_ + fVar169;
          auVar364._8_8_ = auVar218._0_8_;
          auVar364._0_8_ = auVar218._0_8_;
          auVar131 = vshufpd_avx(auVar218,auVar218,1);
          auVar131 = vsubps_avx(auVar131,auVar364);
          auVar219._0_4_ = fVar172 + auVar34._0_4_ * auVar131._0_4_;
          auVar219._4_4_ = fVar201 + auVar34._4_4_ * auVar131._4_4_;
          auVar219._8_4_ = fVar172 + auVar34._8_4_ * auVar131._8_4_;
          auVar219._12_4_ = fVar201 + auVar34._12_4_ * auVar131._12_4_;
          auVar34 = vmovshdup_avx(auVar219);
          auVar365._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
          auVar365._8_4_ = auVar34._8_4_ ^ 0x80000000;
          auVar365._12_4_ = auVar34._12_4_ ^ 0x80000000;
          auVar130 = vmovshdup_avx(auVar129);
          auVar131 = vunpcklps_avx(auVar130,auVar365);
          auVar188 = vshufps_avx(auVar131,auVar365,4);
          auVar160._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
          auVar160._8_4_ = -auVar129._8_4_;
          auVar160._12_4_ = -auVar129._12_4_;
          auVar131 = vmovlhps_avx(auVar160,auVar219);
          auVar138 = vshufps_avx(auVar131,auVar219,8);
          auVar131 = ZEXT416((uint)(auVar130._0_4_ * auVar219._0_4_ - auVar34._0_4_ * auVar129._0_4_
                                   ));
          auVar34 = vshufps_avx(auVar131,auVar131,0);
          auVar131 = vdivps_avx(auVar188,auVar34);
          auVar34 = vdivps_avx(auVar138,auVar34);
          auVar138 = vinsertps_avx(auVar237,auVar321,0x1c);
          auVar129 = vinsertps_avx(auVar255,auVar331,0x1c);
          auVar108 = vinsertps_avx(auVar321,auVar237,0x4c);
          auVar374 = vinsertps_avx(auVar331,auVar255,0x4c);
          auVar130 = vmovsldup_avx(auVar131);
          auVar332._0_4_ = auVar130._0_4_ * auVar138._0_4_;
          auVar332._4_4_ = auVar130._4_4_ * auVar138._4_4_;
          auVar332._8_4_ = auVar130._8_4_ * auVar138._8_4_;
          auVar332._12_4_ = auVar130._12_4_ * auVar138._12_4_;
          auVar322._0_4_ = auVar130._0_4_ * auVar129._0_4_;
          auVar322._4_4_ = auVar130._4_4_ * auVar129._4_4_;
          auVar322._8_4_ = auVar130._8_4_ * auVar129._8_4_;
          auVar322._12_4_ = auVar130._12_4_ * auVar129._12_4_;
          auVar188 = vminps_avx(auVar332,auVar322);
          auVar130 = vmaxps_avx(auVar322,auVar332);
          auVar205 = vmovsldup_avx(auVar34);
          auVar383._0_4_ = auVar205._0_4_ * auVar108._0_4_;
          auVar383._4_4_ = auVar205._4_4_ * auVar108._4_4_;
          auVar383._8_4_ = auVar205._8_4_ * auVar108._8_4_;
          auVar383._12_4_ = auVar205._12_4_ * auVar108._12_4_;
          auVar323._0_4_ = auVar205._0_4_ * auVar374._0_4_;
          auVar323._4_4_ = auVar205._4_4_ * auVar374._4_4_;
          auVar323._8_4_ = auVar205._8_4_ * auVar374._8_4_;
          auVar323._12_4_ = auVar205._12_4_ * auVar374._12_4_;
          auVar205 = vminps_avx(auVar383,auVar323);
          auVar133._0_4_ = auVar188._0_4_ + auVar205._0_4_;
          auVar133._4_4_ = auVar188._4_4_ + auVar205._4_4_;
          auVar133._8_4_ = auVar188._8_4_ + auVar205._8_4_;
          auVar133._12_4_ = auVar188._12_4_ + auVar205._12_4_;
          auVar188 = vmaxps_avx(auVar323,auVar383);
          auVar205 = vsubps_avx(auVar272,auVar109);
          auVar6 = vsubps_avx(auVar289,auVar109);
          auVar290._0_4_ = auVar130._0_4_ + auVar188._0_4_;
          auVar290._4_4_ = auVar130._4_4_ + auVar188._4_4_;
          auVar290._8_4_ = auVar130._8_4_ + auVar188._8_4_;
          auVar290._12_4_ = auVar130._12_4_ + auVar188._12_4_;
          auVar333._8_8_ = 0x3f800000;
          auVar333._0_8_ = 0x3f800000;
          auVar130 = vsubps_avx(auVar333,auVar290);
          auVar188 = vsubps_avx(auVar333,auVar133);
          fVar202 = auVar205._0_4_;
          auVar334._0_4_ = fVar202 * auVar130._0_4_;
          fVar226 = auVar205._4_4_;
          auVar334._4_4_ = fVar226 * auVar130._4_4_;
          fVar170 = auVar205._8_4_;
          auVar334._8_4_ = fVar170 * auVar130._8_4_;
          fVar204 = auVar205._12_4_;
          auVar334._12_4_ = fVar204 * auVar130._12_4_;
          fVar172 = auVar6._0_4_;
          auVar291._0_4_ = auVar130._0_4_ * fVar172;
          fVar201 = auVar6._4_4_;
          auVar291._4_4_ = auVar130._4_4_ * fVar201;
          fVar225 = auVar6._8_4_;
          auVar291._8_4_ = auVar130._8_4_ * fVar225;
          fVar203 = auVar6._12_4_;
          auVar291._12_4_ = auVar130._12_4_ * fVar203;
          auVar375._0_4_ = fVar202 * auVar188._0_4_;
          auVar375._4_4_ = fVar226 * auVar188._4_4_;
          auVar375._8_4_ = fVar170 * auVar188._8_4_;
          auVar375._12_4_ = fVar204 * auVar188._12_4_;
          auVar134._0_4_ = fVar172 * auVar188._0_4_;
          auVar134._4_4_ = fVar201 * auVar188._4_4_;
          auVar134._8_4_ = fVar225 * auVar188._8_4_;
          auVar134._12_4_ = fVar203 * auVar188._12_4_;
          auVar130 = vminps_avx(auVar334,auVar375);
          auVar188 = vminps_avx(auVar291,auVar134);
          auVar205 = vminps_avx(auVar130,auVar188);
          auVar130 = vmaxps_avx(auVar375,auVar334);
          auVar188 = vmaxps_avx(auVar134,auVar291);
          auVar6 = vshufps_avx(auVar109,auVar109,0x54);
          auVar188 = vmaxps_avx(auVar188,auVar130);
          auVar7 = vshufps_avx(auVar308,auVar308,0);
          auVar270 = vshufps_avx(auVar308,auVar308,0x55);
          auVar130 = vhaddps_avx(auVar205,auVar205);
          auVar188 = vhaddps_avx(auVar188,auVar188);
          auVar292._0_4_ = auVar7._0_4_ * auVar131._0_4_ + auVar270._0_4_ * auVar34._0_4_;
          auVar292._4_4_ = auVar7._4_4_ * auVar131._4_4_ + auVar270._4_4_ * auVar34._4_4_;
          auVar292._8_4_ = auVar7._8_4_ * auVar131._8_4_ + auVar270._8_4_ * auVar34._8_4_;
          auVar292._12_4_ = auVar7._12_4_ * auVar131._12_4_ + auVar270._12_4_ * auVar34._12_4_;
          auVar205 = vsubps_avx(auVar6,auVar292);
          fVar200 = auVar205._0_4_ + auVar130._0_4_;
          fVar169 = auVar205._0_4_ + auVar188._0_4_;
          auVar130 = vmaxss_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar200));
          auVar188 = vminss_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar171));
          if (auVar130._0_4_ <= auVar188._0_4_) {
            auVar130 = vmovshdup_avx(auVar131);
            auVar185._0_4_ = auVar138._0_4_ * auVar130._0_4_;
            auVar185._4_4_ = auVar138._4_4_ * auVar130._4_4_;
            auVar185._8_4_ = auVar138._8_4_ * auVar130._8_4_;
            auVar185._12_4_ = auVar138._12_4_ * auVar130._12_4_;
            auVar135._0_4_ = auVar129._0_4_ * auVar130._0_4_;
            auVar135._4_4_ = auVar129._4_4_ * auVar130._4_4_;
            auVar135._8_4_ = auVar129._8_4_ * auVar130._8_4_;
            auVar135._12_4_ = auVar129._12_4_ * auVar130._12_4_;
            auVar188 = vminps_avx(auVar185,auVar135);
            auVar130 = vmaxps_avx(auVar135,auVar185);
            auVar138 = vmovshdup_avx(auVar34);
            auVar238._0_4_ = auVar138._0_4_ * auVar108._0_4_;
            auVar238._4_4_ = auVar138._4_4_ * auVar108._4_4_;
            auVar238._8_4_ = auVar138._8_4_ * auVar108._8_4_;
            auVar238._12_4_ = auVar138._12_4_ * auVar108._12_4_;
            auVar186._0_4_ = auVar138._0_4_ * auVar374._0_4_;
            auVar186._4_4_ = auVar138._4_4_ * auVar374._4_4_;
            auVar186._8_4_ = auVar138._8_4_ * auVar374._8_4_;
            auVar186._12_4_ = auVar138._12_4_ * auVar374._12_4_;
            auVar138 = vminps_avx(auVar238,auVar186);
            auVar256._0_4_ = auVar188._0_4_ + auVar138._0_4_;
            auVar256._4_4_ = auVar188._4_4_ + auVar138._4_4_;
            auVar256._8_4_ = auVar188._8_4_ + auVar138._8_4_;
            auVar256._12_4_ = auVar188._12_4_ + auVar138._12_4_;
            auVar188 = vmaxps_avx(auVar186,auVar238);
            auVar136._0_4_ = auVar130._0_4_ + auVar188._0_4_;
            auVar136._4_4_ = auVar130._4_4_ + auVar188._4_4_;
            auVar136._8_4_ = auVar130._8_4_ + auVar188._8_4_;
            auVar136._12_4_ = auVar130._12_4_ + auVar188._12_4_;
            auVar130 = vsubps_avx(_local_438,auVar136);
            auVar188 = vsubps_avx(_local_438,auVar256);
            auVar239._0_4_ = fVar202 * auVar130._0_4_;
            auVar239._4_4_ = fVar226 * auVar130._4_4_;
            auVar239._8_4_ = fVar170 * auVar130._8_4_;
            auVar239._12_4_ = fVar204 * auVar130._12_4_;
            auVar257._0_4_ = fVar202 * auVar188._0_4_;
            auVar257._4_4_ = fVar226 * auVar188._4_4_;
            auVar257._8_4_ = fVar170 * auVar188._8_4_;
            auVar257._12_4_ = fVar204 * auVar188._12_4_;
            auVar137._0_4_ = fVar172 * auVar130._0_4_;
            auVar137._4_4_ = fVar201 * auVar130._4_4_;
            auVar137._8_4_ = fVar225 * auVar130._8_4_;
            auVar137._12_4_ = fVar203 * auVar130._12_4_;
            auVar187._0_4_ = fVar172 * auVar188._0_4_;
            auVar187._4_4_ = fVar201 * auVar188._4_4_;
            auVar187._8_4_ = fVar225 * auVar188._8_4_;
            auVar187._12_4_ = fVar203 * auVar188._12_4_;
            auVar130 = vminps_avx(auVar239,auVar257);
            auVar188 = vminps_avx(auVar137,auVar187);
            auVar130 = vminps_avx(auVar130,auVar188);
            auVar188 = vmaxps_avx(auVar257,auVar239);
            auVar138 = vmaxps_avx(auVar187,auVar137);
            auVar130 = vhaddps_avx(auVar130,auVar130);
            auVar188 = vmaxps_avx(auVar138,auVar188);
            auVar188 = vhaddps_avx(auVar188,auVar188);
            auVar138 = vmovshdup_avx(auVar205);
            auVar129 = ZEXT416((uint)(auVar138._0_4_ + auVar130._0_4_));
            auVar130 = vmaxss_avx(_local_4d8,auVar129);
            auVar138 = ZEXT416((uint)(auVar138._0_4_ + auVar188._0_4_));
            auVar188 = vminss_avx(auVar138,_local_478);
            auVar384._8_4_ = 0x7fffffff;
            auVar384._0_8_ = 0x7fffffff7fffffff;
            auVar384._12_4_ = 0x7fffffff;
            if (auVar130._0_4_ <= auVar188._0_4_) {
              uVar86 = 0;
              if ((fVar146 < fVar200) && (fVar169 < fVar171)) {
                auVar130 = vcmpps_avx(auVar138,_local_478,1);
                auVar188 = vcmpps_avx(_local_4d8,auVar129,1);
                auVar130 = vandps_avx(auVar188,auVar130);
                uVar86 = auVar130._0_4_;
              }
              if (((uint)uVar87 < 4 && 0.001 <= fVar208) && (uVar86 & 1) == 0) {
                bVar73 = false;
              }
              else {
                lVar90 = 200;
                do {
                  fVar208 = auVar205._0_4_;
                  fVar171 = 1.0 - fVar208;
                  auVar130 = ZEXT416((uint)(fVar171 * fVar171 * fVar171));
                  auVar130 = vshufps_avx(auVar130,auVar130,0);
                  auVar188 = ZEXT416((uint)(fVar208 * 3.0 * fVar171 * fVar171));
                  auVar188 = vshufps_avx(auVar188,auVar188,0);
                  auVar138 = ZEXT416((uint)(fVar171 * fVar208 * fVar208 * 3.0));
                  auVar138 = vshufps_avx(auVar138,auVar138,0);
                  auVar129 = ZEXT416((uint)(fVar208 * fVar208 * fVar208));
                  auVar129 = vshufps_avx(auVar129,auVar129,0);
                  fVar171 = (float)local_3f8._0_4_ * auVar130._0_4_ +
                            (float)local_408._0_4_ * auVar188._0_4_ +
                            (float)local_298._0_4_ * auVar129._0_4_ +
                            (float)local_418._0_4_ * auVar138._0_4_;
                  fVar208 = (float)local_3f8._4_4_ * auVar130._4_4_ +
                            (float)local_408._4_4_ * auVar188._4_4_ +
                            (float)local_298._4_4_ * auVar129._4_4_ +
                            (float)local_418._4_4_ * auVar138._4_4_;
                  auVar139._0_8_ = CONCAT44(fVar208,fVar171);
                  auVar139._8_4_ =
                       fStack_3f0 * auVar130._8_4_ +
                       fStack_400 * auVar188._8_4_ +
                       fStack_290 * auVar129._8_4_ + fStack_410 * auVar138._8_4_;
                  auVar139._12_4_ =
                       fStack_3ec * auVar130._12_4_ +
                       fStack_3fc * auVar188._12_4_ +
                       fStack_28c * auVar129._12_4_ + fStack_40c * auVar138._12_4_;
                  auVar189._8_8_ = auVar139._0_8_;
                  auVar189._0_8_ = auVar139._0_8_;
                  auVar188 = vshufpd_avx(auVar139,auVar139,1);
                  auVar130 = vmovshdup_avx(auVar205);
                  auVar188 = vsubps_avx(auVar188,auVar189);
                  auVar140._0_4_ = auVar130._0_4_ * auVar188._0_4_ + fVar171;
                  auVar140._4_4_ = auVar130._4_4_ * auVar188._4_4_ + fVar208;
                  auVar140._8_4_ = auVar130._8_4_ * auVar188._8_4_ + fVar171;
                  auVar140._12_4_ = auVar130._12_4_ * auVar188._12_4_ + fVar208;
                  auVar130 = vshufps_avx(auVar140,auVar140,0);
                  auVar188 = vshufps_avx(auVar140,auVar140,0x55);
                  auVar190._0_4_ = auVar131._0_4_ * auVar130._0_4_ + auVar34._0_4_ * auVar188._0_4_;
                  auVar190._4_4_ = auVar131._4_4_ * auVar130._4_4_ + auVar34._4_4_ * auVar188._4_4_;
                  auVar190._8_4_ = auVar131._8_4_ * auVar130._8_4_ + auVar34._8_4_ * auVar188._8_4_;
                  auVar190._12_4_ =
                       auVar131._12_4_ * auVar130._12_4_ + auVar34._12_4_ * auVar188._12_4_;
                  auVar205 = vsubps_avx(auVar205,auVar190);
                  auVar130 = vandps_avx(auVar384,auVar140);
                  auVar188 = vshufps_avx(auVar130,auVar130,0xf5);
                  auVar130 = vmaxss_avx(auVar188,auVar130);
                  if (auVar130._0_4_ < (float)local_3e8._0_4_) {
                    fVar171 = auVar205._0_4_;
                    if ((0.0 <= fVar171) && (fVar171 <= 1.0)) {
                      auVar131 = vmovshdup_avx(auVar205);
                      fVar208 = auVar131._0_4_;
                      if ((0.0 <= fVar208) && (fVar208 <= 1.0)) {
                        auVar131 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                 ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                 0x1c);
                        auVar374 = vinsertps_avx(auVar131,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                        m128[2]),0x28);
                        aVar5 = (ray->super_RayK<1>).org.field_0;
                        auVar131 = vsubps_avx(_local_348,(undefined1  [16])aVar5);
                        auVar131 = vdpps_avx(auVar131,auVar374,0x7f);
                        auVar84._4_4_ = fStack_3a4;
                        auVar84._0_4_ = local_3a8;
                        auVar84._8_4_ = fStack_3a0;
                        auVar84._12_4_ = fStack_39c;
                        auVar34 = vsubps_avx(auVar84,(undefined1  [16])aVar5);
                        auVar34 = vdpps_avx(auVar34,auVar374,0x7f);
                        auVar130 = vsubps_avx(_local_358,(undefined1  [16])aVar5);
                        auVar130 = vdpps_avx(auVar130,auVar374,0x7f);
                        auVar81._4_4_ = fStack_3b4;
                        auVar81._0_4_ = local_3b8;
                        auVar81._8_4_ = fStack_3b0;
                        auVar81._12_4_ = fStack_3ac;
                        auVar188 = vsubps_avx(auVar81,(undefined1  [16])aVar5);
                        auVar188 = vdpps_avx(auVar188,auVar374,0x7f);
                        auVar138 = vsubps_avx(_local_368,(undefined1  [16])aVar5);
                        auVar138 = vdpps_avx(auVar138,auVar374,0x7f);
                        auVar129 = vsubps_avx(_local_378,(undefined1  [16])aVar5);
                        auVar129 = vdpps_avx(auVar129,auVar374,0x7f);
                        auVar78._4_4_ = fStack_3c4;
                        auVar78._0_4_ = local_3c8;
                        auVar78._8_4_ = fStack_3c0;
                        auVar78._12_4_ = fStack_3bc;
                        auVar108 = vsubps_avx(auVar78,(undefined1  [16])aVar5);
                        auVar108 = vdpps_avx(auVar108,auVar374,0x7f);
                        auVar6 = vsubps_avx(_local_2a8,(undefined1  [16])aVar5);
                        auVar374 = vdpps_avx(auVar6,auVar374,0x7f);
                        fVar201 = 1.0 - fVar208;
                        fVar225 = 1.0 - fVar171;
                        fVar146 = auVar205._4_4_;
                        fVar200 = auVar205._8_4_;
                        fVar169 = auVar205._12_4_;
                        fVar172 = fVar225 * fVar171 * fVar171 * 3.0;
                        auVar240._0_4_ = fVar171 * fVar171 * fVar171;
                        auVar240._4_4_ = fVar146 * fVar146 * fVar146;
                        auVar240._8_4_ = fVar200 * fVar200 * fVar200;
                        auVar240._12_4_ = fVar169 * fVar169 * fVar169;
                        fVar146 = fVar171 * 3.0 * fVar225 * fVar225;
                        fVar200 = fVar225 * fVar225 * fVar225;
                        fVar171 = (fVar201 * auVar131._0_4_ + auVar138._0_4_ * fVar208) * fVar200 +
                                  fVar146 * (auVar129._0_4_ * fVar208 + fVar201 * auVar34._0_4_) +
                                  fVar172 * (auVar108._0_4_ * fVar208 + fVar201 * auVar130._0_4_) +
                                  auVar240._0_4_ *
                                  (fVar201 * auVar188._0_4_ + fVar208 * auVar374._0_4_);
                        if ((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar171) &&
                            (fVar208 = (ray->super_RayK<1>).tfar, fVar171 <= fVar208)) &&
                           (pGVar20 = (context->scene->geometries).items[(long)auVar93].ptr,
                           _local_498 = auVar318, (pGVar20->mask & (ray->super_RayK<1>).mask) != 0))
                        {
                          auVar131 = vshufps_avx(auVar205,auVar205,0x55);
                          auVar293._8_4_ = 0x3f800000;
                          auVar293._0_8_ = &DAT_3f8000003f800000;
                          auVar293._12_4_ = 0x3f800000;
                          auVar318 = vsubps_avx(auVar293,auVar131);
                          fVar169 = auVar131._0_4_;
                          fVar201 = auVar131._4_4_;
                          fVar203 = auVar131._8_4_;
                          fVar202 = auVar131._12_4_;
                          fVar226 = auVar318._0_4_;
                          fVar170 = auVar318._4_4_;
                          fVar204 = auVar318._8_4_;
                          fVar227 = auVar318._12_4_;
                          auVar309._0_4_ =
                               fVar169 * (float)local_368._0_4_ + fVar226 * (float)local_348._0_4_;
                          auVar309._4_4_ =
                               fVar201 * (float)local_368._4_4_ + fVar170 * (float)local_348._4_4_;
                          auVar309._8_4_ = fVar203 * fStack_360 + fVar204 * fStack_340;
                          auVar309._12_4_ = fVar202 * fStack_35c + fVar227 * fStack_33c;
                          auVar324._0_4_ = fVar169 * (float)local_378._0_4_ + fVar226 * local_3a8;
                          auVar324._4_4_ = fVar201 * (float)local_378._4_4_ + fVar170 * fStack_3a4;
                          auVar324._8_4_ = fVar203 * fStack_370 + fVar204 * fStack_3a0;
                          auVar324._12_4_ = fVar202 * fStack_36c + fVar227 * fStack_39c;
                          auVar335._0_4_ = fVar169 * local_3c8 + fVar226 * (float)local_358._0_4_;
                          auVar335._4_4_ = fVar201 * fStack_3c4 + fVar170 * (float)local_358._4_4_;
                          auVar335._8_4_ = fVar203 * fStack_3c0 + fVar204 * fStack_350;
                          auVar335._12_4_ = fVar202 * fStack_3bc + fVar227 * fStack_34c;
                          auVar273._0_4_ = fVar226 * local_3b8 + fVar169 * (float)local_2a8._0_4_;
                          auVar273._4_4_ = fVar170 * fStack_3b4 + fVar201 * (float)local_2a8._4_4_;
                          auVar273._8_4_ = fVar204 * fStack_3b0 + fVar203 * fStack_2a0;
                          auVar273._12_4_ = fVar227 * fStack_3ac + fVar202 * fStack_29c;
                          auVar130 = vsubps_avx(auVar324,auVar309);
                          auVar188 = vsubps_avx(auVar335,auVar324);
                          auVar138 = vsubps_avx(auVar273,auVar335);
                          auVar131 = vshufps_avx(auVar205,auVar205,0);
                          fVar202 = auVar131._0_4_;
                          fVar226 = auVar131._4_4_;
                          fVar170 = auVar131._8_4_;
                          fVar204 = auVar131._12_4_;
                          auVar131 = vshufps_avx(ZEXT416((uint)fVar225),ZEXT416((uint)fVar225),0);
                          fVar169 = auVar131._0_4_;
                          fVar201 = auVar131._4_4_;
                          fVar225 = auVar131._8_4_;
                          fVar203 = auVar131._12_4_;
                          auVar131 = vshufps_avx(auVar240,auVar240,0);
                          auVar318 = vshufps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar172),0);
                          auVar34 = vshufps_avx(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),0);
                          auVar220._0_4_ =
                               ((auVar130._0_4_ * fVar169 + fVar202 * auVar188._0_4_) * fVar169 +
                               fVar202 * (auVar188._0_4_ * fVar169 + fVar202 * auVar138._0_4_)) *
                               3.0;
                          auVar220._4_4_ =
                               ((auVar130._4_4_ * fVar201 + fVar226 * auVar188._4_4_) * fVar201 +
                               fVar226 * (auVar188._4_4_ * fVar201 + fVar226 * auVar138._4_4_)) *
                               3.0;
                          auVar220._8_4_ =
                               ((auVar130._8_4_ * fVar225 + fVar170 * auVar188._8_4_) * fVar225 +
                               fVar170 * (auVar188._8_4_ * fVar225 + fVar170 * auVar138._8_4_)) *
                               3.0;
                          auVar220._12_4_ =
                               ((auVar130._12_4_ * fVar203 + fVar204 * auVar188._12_4_) * fVar203 +
                               fVar204 * (auVar188._12_4_ * fVar203 + fVar204 * auVar138._12_4_)) *
                               3.0;
                          auVar130 = vshufps_avx(ZEXT416((uint)fVar200),ZEXT416((uint)fVar200),0);
                          auVar161._0_4_ =
                               auVar130._0_4_ * (float)local_208._0_4_ +
                               auVar34._0_4_ * (float)local_218._0_4_ +
                               auVar131._0_4_ * (float)local_238._0_4_ +
                               auVar318._0_4_ * (float)local_228._0_4_;
                          auVar161._4_4_ =
                               auVar130._4_4_ * (float)local_208._4_4_ +
                               auVar34._4_4_ * (float)local_218._4_4_ +
                               auVar131._4_4_ * (float)local_238._4_4_ +
                               auVar318._4_4_ * (float)local_228._4_4_;
                          auVar161._8_4_ =
                               auVar130._8_4_ * fStack_200 +
                               auVar34._8_4_ * fStack_210 +
                               auVar131._8_4_ * fStack_230 + auVar318._8_4_ * fStack_220;
                          auVar161._12_4_ =
                               auVar130._12_4_ * fStack_1fc +
                               auVar34._12_4_ * fStack_20c +
                               auVar131._12_4_ * fStack_22c + auVar318._12_4_ * fStack_21c;
                          auVar131 = vshufps_avx(auVar220,auVar220,0xc9);
                          auVar191._0_4_ = auVar161._0_4_ * auVar131._0_4_;
                          auVar191._4_4_ = auVar161._4_4_ * auVar131._4_4_;
                          auVar191._8_4_ = auVar161._8_4_ * auVar131._8_4_;
                          auVar191._12_4_ = auVar161._12_4_ * auVar131._12_4_;
                          auVar131 = vshufps_avx(auVar161,auVar161,0xc9);
                          auVar162._0_4_ = auVar220._0_4_ * auVar131._0_4_;
                          auVar162._4_4_ = auVar220._4_4_ * auVar131._4_4_;
                          auVar162._8_4_ = auVar220._8_4_ * auVar131._8_4_;
                          auVar162._12_4_ = auVar220._12_4_ * auVar131._12_4_;
                          auVar131 = vsubps_avx(auVar162,auVar191);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar171;
                            auVar318 = vshufps_avx(auVar131,auVar131,0xe9);
                            uVar4 = vmovlps_avx(auVar318);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar4;
                            (ray->Ng).field_0.field_0.z = auVar131._0_4_;
                            uVar4 = vmovlps_avx(auVar205);
                            ray->u = (float)(int)uVar4;
                            ray->v = (float)(int)((ulong)uVar4 >> 0x20);
                            ray->primID = (uint)local_3d0;
                            ray->geomID = SUB84(auVar93,0);
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            auVar318 = vshufps_avx(auVar131,auVar131,0xe9);
                            local_268 = vmovlps_avx(auVar318);
                            local_260 = auVar131._0_4_;
                            local_25c = vmovlps_avx(auVar205);
                            local_254 = (uint)local_3d0;
                            local_250 = SUB84(auVar93,0);
                            local_24c = context->user->instID[0];
                            local_248 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar171;
                            local_4bc = -1;
                            local_2d8.valid = &local_4bc;
                            local_2d8.geometryUserPtr = pGVar20->userPtr;
                            local_2d8.context = context->user;
                            local_2d8.ray = (RTCRayN *)ray;
                            local_2d8.hit = (RTCHitN *)&local_268;
                            local_2d8.N = 1;
                            local_478._0_4_ = fVar208;
                            _local_498 = auVar110;
                            if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0129c6b2:
                              p_Var25 = context->args->filter;
                              if (p_Var25 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar20->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var25)(&local_2d8);
                                  fVar208 = (float)local_478._0_4_;
                                }
                                if (*local_2d8.valid == 0) goto LAB_0129c760;
                              }
                              (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_2d8.hit;
                              (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_2d8.hit + 4);
                              (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_2d8.hit + 8);
                              *(float *)((long)local_2d8.ray + 0x3c) =
                                   *(float *)(local_2d8.hit + 0xc);
                              *(float *)((long)local_2d8.ray + 0x40) =
                                   *(float *)(local_2d8.hit + 0x10);
                              *(float *)((long)local_2d8.ray + 0x44) =
                                   *(float *)(local_2d8.hit + 0x14);
                              *(float *)((long)local_2d8.ray + 0x48) =
                                   *(float *)(local_2d8.hit + 0x18);
                              *(float *)((long)local_2d8.ray + 0x4c) =
                                   *(float *)(local_2d8.hit + 0x1c);
                              *(float *)((long)local_2d8.ray + 0x50) =
                                   *(float *)(local_2d8.hit + 0x20);
                            }
                            else {
                              _fStack_390 = auVar28._8_24_;
                              local_398 = auVar93;
                              (*pGVar20->intersectionFilterN)(&local_2d8);
                              auVar93 = local_398;
                              fVar208 = (float)local_478._0_4_;
                              if (*local_2d8.valid != 0) goto LAB_0129c6b2;
LAB_0129c760:
                              (ray->super_RayK<1>).tfar = fVar208;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar90 = lVar90 + -1;
                } while (lVar90 != 0);
              }
              goto LAB_0129c594;
            }
          }
          goto LAB_0129c5aa;
        }
      }
LAB_0129c594:
    } while (bVar73);
    local_1f8 = vinsertps_avx(_local_498,ZEXT416((uint)local_4b8._0_4_),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }